

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  uint uVar16;
  undefined4 uVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  bool bVar112;
  bool bVar113;
  bool bVar114;
  bool bVar115;
  bool bVar116;
  bool bVar117;
  bool bVar118;
  bool bVar119;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [12];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [24];
  uint uVar141;
  uint uVar142;
  uint uVar143;
  Geometry *pGVar144;
  uint uVar145;
  long lVar146;
  ulong uVar147;
  float fVar210;
  float fVar212;
  float fVar213;
  undefined1 auVar191 [32];
  undefined1 auVar211 [16];
  long lVar148;
  ulong uVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar171;
  float fVar174;
  float fVar180;
  float fVar182;
  float fVar184;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar172;
  float fVar175;
  float fVar177;
  float fVar178;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar173;
  float fVar176;
  float fVar179;
  float fVar181;
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar187;
  float fVar207;
  float fVar208;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar209;
  float fVar214;
  float fVar215;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar216;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar231;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar217;
  undefined1 auVar224 [16];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar234;
  float fVar251;
  undefined1 auVar235 [16];
  float fVar253;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar247;
  float fVar249;
  float fVar254;
  float fVar256;
  float fVar258;
  float fVar259;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar248;
  float fVar250;
  float fVar252;
  float fVar255;
  float fVar257;
  float fVar260;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  float fVar261;
  float fVar262;
  undefined1 auVar264 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar263 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  float fVar278;
  float fVar279;
  float fVar290;
  float fVar292;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar283 [32];
  float fVar294;
  undefined1 auVar284 [32];
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar301 [16];
  float fVar300;
  float fVar311;
  float fVar312;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar313;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar314;
  undefined1 auVar310 [32];
  float fVar315;
  float fVar324;
  float fVar325;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar326 [16];
  float fVar332;
  float fVar333;
  float fVar334;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  float fVar335;
  float fVar336;
  float fVar337;
  undefined4 uVar338;
  float fVar346;
  float fVar348;
  float fVar350;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar347;
  float fVar349;
  float fVar351;
  float fVar352;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  float fVar353;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [64];
  float in_register_0000151c;
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  float fVar381;
  float fVar382;
  undefined1 auVar383 [16];
  float fVar387;
  float fVar389;
  undefined1 auVar384 [32];
  float fVar388;
  float fVar390;
  float fVar391;
  float fVar392;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  float fVar393;
  float fVar397;
  float fVar398;
  float fVar399;
  float in_register_0000159c;
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float fVar400;
  float fVar404;
  float fVar405;
  float fVar406;
  float in_register_000015dc;
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  uint local_920;
  undefined8 local_900;
  undefined8 uStack_8f8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  RTCFilterFunctionNArguments local_8b0;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  undefined8 uStack_858;
  undefined1 auStack_850 [8];
  undefined8 uStack_848;
  undefined1 local_840 [8];
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined1 auStack_810 [16];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 *local_7b8;
  undefined1 (*local_7b0) [16];
  undefined1 (*local_7a8) [32];
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [16];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  LinearSpace3fa *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint local_49c;
  undefined8 local_490;
  undefined8 uStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined1 local_440 [32];
  float local_420 [4];
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  RTCHitN local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar15 = prim[1];
  uVar149 = (ulong)(byte)PVar15;
  lVar146 = uVar149 * 5;
  auVar237 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar237 = vinsertps_avx(auVar237,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar27 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar27 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar234 = *(float *)(prim + uVar149 * 0x19 + 0x12);
  auVar237 = vsubps_avx(auVar237,*(undefined1 (*) [16])(prim + uVar149 * 0x19 + 6));
  auVar188._0_4_ = fVar234 * auVar237._0_4_;
  auVar188._4_4_ = fVar234 * auVar237._4_4_;
  auVar188._8_4_ = fVar234 * auVar237._8_4_;
  auVar188._12_4_ = fVar234 * auVar237._12_4_;
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 4 + 6)));
  auVar211 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 4 + 10)));
  auVar280._0_4_ = fVar234 * auVar27._0_4_;
  auVar280._4_4_ = fVar234 * auVar27._4_4_;
  auVar280._8_4_ = fVar234 * auVar27._8_4_;
  auVar280._12_4_ = fVar234 * auVar27._12_4_;
  auVar154._16_16_ = auVar211;
  auVar154._0_16_ = auVar237;
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar146 + 6)));
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar146 + 10)));
  auVar225._16_16_ = auVar27;
  auVar225._0_16_ = auVar237;
  auVar340 = vcvtdq2ps_avx(auVar225);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 6 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 6 + 10)));
  auVar238._16_16_ = auVar27;
  auVar238._0_16_ = auVar237;
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0xb + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar149 * 0xb + 10)));
  auVar20 = vcvtdq2ps_avx(auVar238);
  auVar239._16_16_ = auVar27;
  auVar239._0_16_ = auVar237;
  auVar21 = vcvtdq2ps_avx(auVar239);
  uVar147 = (ulong)((uint)(byte)PVar15 * 0xc);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 10)));
  auVar302._16_16_ = auVar27;
  auVar302._0_16_ = auVar237;
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar149 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar302);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar149 + 10)));
  auVar316._16_16_ = auVar27;
  auVar316._0_16_ = auVar237;
  lVar148 = uVar149 * 9;
  uVar147 = (ulong)(uint)((int)lVar148 * 2);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar316);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 10)));
  auVar317._16_16_ = auVar27;
  auVar317._0_16_ = auVar237;
  auVar24 = vcvtdq2ps_avx(auVar317);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar149 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + uVar149 + 10)));
  auVar339._16_16_ = auVar27;
  auVar339._0_16_ = auVar237;
  uVar147 = (ulong)(uint)((int)lVar146 << 2);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar147 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar339);
  auVar354._16_16_ = auVar27;
  auVar354._0_16_ = auVar237;
  auVar26 = vcvtdq2ps_avx(auVar354);
  auVar237 = vshufps_avx(auVar280,auVar280,0);
  auVar27 = vshufps_avx(auVar280,auVar280,0x55);
  auVar211 = vshufps_avx(auVar280,auVar280,0xaa);
  fVar234 = auVar211._0_4_;
  fVar247 = auVar211._4_4_;
  fVar249 = auVar211._8_4_;
  fVar251 = auVar211._12_4_;
  fVar254 = auVar27._0_4_;
  fVar256 = auVar27._4_4_;
  fVar259 = auVar27._8_4_;
  fVar261 = auVar27._12_4_;
  fVar271 = auVar237._0_4_;
  fVar272 = auVar237._4_4_;
  fVar273 = auVar237._8_4_;
  fVar275 = auVar237._12_4_;
  auVar374._0_4_ = fVar271 * auVar154._0_4_ + fVar254 * auVar340._0_4_ + fVar234 * auVar20._0_4_;
  auVar374._4_4_ = fVar272 * auVar154._4_4_ + fVar256 * auVar340._4_4_ + fVar247 * auVar20._4_4_;
  auVar374._8_4_ = fVar273 * auVar154._8_4_ + fVar259 * auVar340._8_4_ + fVar249 * auVar20._8_4_;
  auVar374._12_4_ = fVar275 * auVar154._12_4_ + fVar261 * auVar340._12_4_ + fVar251 * auVar20._12_4_
  ;
  auVar374._16_4_ = fVar271 * auVar154._16_4_ + fVar254 * auVar340._16_4_ + fVar234 * auVar20._16_4_
  ;
  auVar374._20_4_ = fVar272 * auVar154._20_4_ + fVar256 * auVar340._20_4_ + fVar247 * auVar20._20_4_
  ;
  auVar374._24_4_ = fVar273 * auVar154._24_4_ + fVar259 * auVar340._24_4_ + fVar249 * auVar20._24_4_
  ;
  auVar374._28_4_ = fVar261 + in_register_000015dc + in_register_0000151c;
  auVar363._0_4_ = fVar271 * auVar21._0_4_ + fVar254 * auVar22._0_4_ + auVar23._0_4_ * fVar234;
  auVar363._4_4_ = fVar272 * auVar21._4_4_ + fVar256 * auVar22._4_4_ + auVar23._4_4_ * fVar247;
  auVar363._8_4_ = fVar273 * auVar21._8_4_ + fVar259 * auVar22._8_4_ + auVar23._8_4_ * fVar249;
  auVar363._12_4_ = fVar275 * auVar21._12_4_ + fVar261 * auVar22._12_4_ + auVar23._12_4_ * fVar251;
  auVar363._16_4_ = fVar271 * auVar21._16_4_ + fVar254 * auVar22._16_4_ + auVar23._16_4_ * fVar234;
  auVar363._20_4_ = fVar272 * auVar21._20_4_ + fVar256 * auVar22._20_4_ + auVar23._20_4_ * fVar247;
  auVar363._24_4_ = fVar273 * auVar21._24_4_ + fVar259 * auVar22._24_4_ + auVar23._24_4_ * fVar249;
  auVar363._28_4_ = fVar261 + in_register_000015dc + in_register_0000159c;
  auVar283._0_4_ = fVar271 * auVar24._0_4_ + fVar254 * auVar25._0_4_ + auVar26._0_4_ * fVar234;
  auVar283._4_4_ = fVar272 * auVar24._4_4_ + fVar256 * auVar25._4_4_ + auVar26._4_4_ * fVar247;
  auVar283._8_4_ = fVar273 * auVar24._8_4_ + fVar259 * auVar25._8_4_ + auVar26._8_4_ * fVar249;
  auVar283._12_4_ = fVar275 * auVar24._12_4_ + fVar261 * auVar25._12_4_ + auVar26._12_4_ * fVar251;
  auVar283._16_4_ = fVar271 * auVar24._16_4_ + fVar254 * auVar25._16_4_ + auVar26._16_4_ * fVar234;
  auVar283._20_4_ = fVar272 * auVar24._20_4_ + fVar256 * auVar25._20_4_ + auVar26._20_4_ * fVar247;
  auVar283._24_4_ = fVar273 * auVar24._24_4_ + fVar259 * auVar25._24_4_ + auVar26._24_4_ * fVar249;
  auVar283._28_4_ = fVar275 + fVar261 + fVar251;
  auVar237 = vshufps_avx(auVar188,auVar188,0);
  auVar27 = vshufps_avx(auVar188,auVar188,0x55);
  auVar211 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar247 = auVar211._0_4_;
  fVar249 = auVar211._4_4_;
  fVar251 = auVar211._8_4_;
  fVar254 = auVar211._12_4_;
  fVar272 = auVar27._0_4_;
  fVar273 = auVar27._4_4_;
  fVar275 = auVar27._8_4_;
  fVar276 = auVar27._12_4_;
  fVar256 = auVar237._0_4_;
  fVar259 = auVar237._4_4_;
  fVar261 = auVar237._8_4_;
  fVar271 = auVar237._12_4_;
  fVar234 = auVar154._28_4_;
  auVar303._0_4_ = fVar256 * auVar154._0_4_ + fVar272 * auVar340._0_4_ + fVar247 * auVar20._0_4_;
  auVar303._4_4_ = fVar259 * auVar154._4_4_ + fVar273 * auVar340._4_4_ + fVar249 * auVar20._4_4_;
  auVar303._8_4_ = fVar261 * auVar154._8_4_ + fVar275 * auVar340._8_4_ + fVar251 * auVar20._8_4_;
  auVar303._12_4_ = fVar271 * auVar154._12_4_ + fVar276 * auVar340._12_4_ + fVar254 * auVar20._12_4_
  ;
  auVar303._16_4_ = fVar256 * auVar154._16_4_ + fVar272 * auVar340._16_4_ + fVar247 * auVar20._16_4_
  ;
  auVar303._20_4_ = fVar259 * auVar154._20_4_ + fVar273 * auVar340._20_4_ + fVar249 * auVar20._20_4_
  ;
  auVar303._24_4_ = fVar261 * auVar154._24_4_ + fVar275 * auVar340._24_4_ + fVar251 * auVar20._24_4_
  ;
  auVar303._28_4_ = fVar234 + auVar340._28_4_ + auVar20._28_4_;
  auVar191._0_4_ = fVar256 * auVar21._0_4_ + auVar23._0_4_ * fVar247 + fVar272 * auVar22._0_4_;
  auVar191._4_4_ = fVar259 * auVar21._4_4_ + auVar23._4_4_ * fVar249 + fVar273 * auVar22._4_4_;
  auVar191._8_4_ = fVar261 * auVar21._8_4_ + auVar23._8_4_ * fVar251 + fVar275 * auVar22._8_4_;
  auVar191._12_4_ = fVar271 * auVar21._12_4_ + auVar23._12_4_ * fVar254 + fVar276 * auVar22._12_4_;
  auVar191._16_4_ = fVar256 * auVar21._16_4_ + auVar23._16_4_ * fVar247 + fVar272 * auVar22._16_4_;
  auVar191._20_4_ = fVar259 * auVar21._20_4_ + auVar23._20_4_ * fVar249 + fVar273 * auVar22._20_4_;
  auVar191._24_4_ = fVar261 * auVar21._24_4_ + auVar23._24_4_ * fVar251 + fVar275 * auVar22._24_4_;
  auVar191._28_4_ = fVar234 + auVar23._28_4_ + auVar20._28_4_;
  auVar318._8_4_ = 0x7fffffff;
  auVar318._0_8_ = 0x7fffffff7fffffff;
  auVar318._12_4_ = 0x7fffffff;
  auVar318._16_4_ = 0x7fffffff;
  auVar318._20_4_ = 0x7fffffff;
  auVar318._24_4_ = 0x7fffffff;
  auVar318._28_4_ = 0x7fffffff;
  auVar226._8_4_ = 0x219392ef;
  auVar226._0_8_ = 0x219392ef219392ef;
  auVar226._12_4_ = 0x219392ef;
  auVar226._16_4_ = 0x219392ef;
  auVar226._20_4_ = 0x219392ef;
  auVar226._24_4_ = 0x219392ef;
  auVar226._28_4_ = 0x219392ef;
  auVar154 = vandps_avx(auVar374,auVar318);
  auVar154 = vcmpps_avx(auVar154,auVar226,1);
  auVar340 = vblendvps_avx(auVar374,auVar226,auVar154);
  auVar154 = vandps_avx(auVar363,auVar318);
  auVar154 = vcmpps_avx(auVar154,auVar226,1);
  auVar20 = vblendvps_avx(auVar363,auVar226,auVar154);
  auVar154 = vandps_avx(auVar283,auVar318);
  auVar154 = vcmpps_avx(auVar154,auVar226,1);
  auVar154 = vblendvps_avx(auVar283,auVar226,auVar154);
  auVar227._0_4_ = fVar272 * auVar25._0_4_ + auVar26._0_4_ * fVar247 + fVar256 * auVar24._0_4_;
  auVar227._4_4_ = fVar273 * auVar25._4_4_ + auVar26._4_4_ * fVar249 + fVar259 * auVar24._4_4_;
  auVar227._8_4_ = fVar275 * auVar25._8_4_ + auVar26._8_4_ * fVar251 + fVar261 * auVar24._8_4_;
  auVar227._12_4_ = fVar276 * auVar25._12_4_ + auVar26._12_4_ * fVar254 + fVar271 * auVar24._12_4_;
  auVar227._16_4_ = fVar272 * auVar25._16_4_ + auVar26._16_4_ * fVar247 + fVar256 * auVar24._16_4_;
  auVar227._20_4_ = fVar273 * auVar25._20_4_ + auVar26._20_4_ * fVar249 + fVar259 * auVar24._20_4_;
  auVar227._24_4_ = fVar275 * auVar25._24_4_ + auVar26._24_4_ * fVar251 + fVar261 * auVar24._24_4_;
  auVar227._28_4_ = auVar22._28_4_ + fVar254 + fVar234;
  auVar21 = vrcpps_avx(auVar340);
  fVar234 = auVar21._0_4_;
  fVar247 = auVar21._4_4_;
  auVar22._4_4_ = auVar340._4_4_ * fVar247;
  auVar22._0_4_ = auVar340._0_4_ * fVar234;
  fVar249 = auVar21._8_4_;
  auVar22._8_4_ = auVar340._8_4_ * fVar249;
  fVar251 = auVar21._12_4_;
  auVar22._12_4_ = auVar340._12_4_ * fVar251;
  fVar254 = auVar21._16_4_;
  auVar22._16_4_ = auVar340._16_4_ * fVar254;
  fVar256 = auVar21._20_4_;
  auVar22._20_4_ = auVar340._20_4_ * fVar256;
  fVar259 = auVar21._24_4_;
  auVar22._24_4_ = auVar340._24_4_ * fVar259;
  auVar22._28_4_ = auVar340._28_4_;
  auVar327._8_4_ = 0x3f800000;
  auVar327._0_8_ = &DAT_3f8000003f800000;
  auVar327._12_4_ = 0x3f800000;
  auVar327._16_4_ = 0x3f800000;
  auVar327._20_4_ = 0x3f800000;
  auVar327._24_4_ = 0x3f800000;
  auVar327._28_4_ = 0x3f800000;
  auVar22 = vsubps_avx(auVar327,auVar22);
  auVar340 = vrcpps_avx(auVar20);
  fVar234 = fVar234 + fVar234 * auVar22._0_4_;
  fVar247 = fVar247 + fVar247 * auVar22._4_4_;
  fVar249 = fVar249 + fVar249 * auVar22._8_4_;
  fVar251 = fVar251 + fVar251 * auVar22._12_4_;
  fVar254 = fVar254 + fVar254 * auVar22._16_4_;
  fVar256 = fVar256 + fVar256 * auVar22._20_4_;
  fVar259 = fVar259 + fVar259 * auVar22._24_4_;
  fVar278 = auVar340._0_4_;
  fVar290 = auVar340._4_4_;
  auVar23._4_4_ = fVar290 * auVar20._4_4_;
  auVar23._0_4_ = fVar278 * auVar20._0_4_;
  fVar292 = auVar340._8_4_;
  auVar23._8_4_ = fVar292 * auVar20._8_4_;
  fVar294 = auVar340._12_4_;
  auVar23._12_4_ = fVar294 * auVar20._12_4_;
  fVar296 = auVar340._16_4_;
  auVar23._16_4_ = fVar296 * auVar20._16_4_;
  fVar297 = auVar340._20_4_;
  auVar23._20_4_ = fVar297 * auVar20._20_4_;
  fVar299 = auVar340._24_4_;
  auVar23._24_4_ = fVar299 * auVar20._24_4_;
  auVar23._28_4_ = auVar21._28_4_;
  auVar340 = vsubps_avx(auVar327,auVar23);
  fVar278 = fVar278 + fVar278 * auVar340._0_4_;
  fVar290 = fVar290 + fVar290 * auVar340._4_4_;
  fVar292 = fVar292 + fVar292 * auVar340._8_4_;
  fVar294 = fVar294 + fVar294 * auVar340._12_4_;
  fVar296 = fVar296 + fVar296 * auVar340._16_4_;
  fVar297 = fVar297 + fVar297 * auVar340._20_4_;
  fVar299 = fVar299 + fVar299 * auVar340._24_4_;
  auVar340 = vrcpps_avx(auVar154);
  fVar261 = auVar340._0_4_;
  fVar271 = auVar340._4_4_;
  auVar24._4_4_ = fVar271 * auVar154._4_4_;
  auVar24._0_4_ = fVar261 * auVar154._0_4_;
  fVar272 = auVar340._8_4_;
  auVar24._8_4_ = fVar272 * auVar154._8_4_;
  fVar273 = auVar340._12_4_;
  auVar24._12_4_ = fVar273 * auVar154._12_4_;
  fVar275 = auVar340._16_4_;
  auVar24._16_4_ = fVar275 * auVar154._16_4_;
  fVar276 = auVar340._20_4_;
  auVar24._20_4_ = fVar276 * auVar154._20_4_;
  fVar277 = auVar340._24_4_;
  auVar24._24_4_ = fVar277 * auVar154._24_4_;
  auVar24._28_4_ = auVar20._28_4_;
  auVar154 = vsubps_avx(auVar327,auVar24);
  fVar261 = fVar261 + fVar261 * auVar154._0_4_;
  fVar271 = fVar271 + fVar271 * auVar154._4_4_;
  fVar272 = fVar272 + fVar272 * auVar154._8_4_;
  fVar273 = fVar273 + fVar273 * auVar154._12_4_;
  fVar275 = fVar275 + fVar275 * auVar154._16_4_;
  fVar276 = fVar276 + fVar276 * auVar154._20_4_;
  fVar277 = fVar277 + fVar277 * auVar154._24_4_;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + uVar149 * 7 + 6);
  auVar237 = vpmovsxwd_avx(auVar237);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar149 * 7 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar27);
  auVar155._16_16_ = auVar27;
  auVar155._0_16_ = auVar237;
  auVar154 = vcvtdq2ps_avx(auVar155);
  auVar154 = vsubps_avx(auVar154,auVar303);
  auVar152._0_4_ = fVar234 * auVar154._0_4_;
  auVar152._4_4_ = fVar247 * auVar154._4_4_;
  auVar152._8_4_ = fVar249 * auVar154._8_4_;
  auVar152._12_4_ = fVar251 * auVar154._12_4_;
  auVar20._16_4_ = fVar254 * auVar154._16_4_;
  auVar20._0_16_ = auVar152;
  auVar20._20_4_ = fVar256 * auVar154._20_4_;
  auVar20._24_4_ = fVar259 * auVar154._24_4_;
  auVar20._28_4_ = auVar154._28_4_;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *(ulong *)(prim + lVar148 + 6);
  auVar237 = vpmovsxwd_avx(auVar211);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + lVar148 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar236);
  auVar319._16_16_ = auVar27;
  auVar319._0_16_ = auVar237;
  auVar154 = vcvtdq2ps_avx(auVar319);
  auVar154 = vsubps_avx(auVar154,auVar303);
  auVar235._0_4_ = fVar234 * auVar154._0_4_;
  auVar235._4_4_ = fVar247 * auVar154._4_4_;
  auVar235._8_4_ = fVar249 * auVar154._8_4_;
  auVar235._12_4_ = fVar251 * auVar154._12_4_;
  auVar25._16_4_ = fVar254 * auVar154._16_4_;
  auVar25._0_16_ = auVar235;
  auVar25._20_4_ = fVar256 * auVar154._20_4_;
  auVar25._24_4_ = fVar259 * auVar154._24_4_;
  auVar25._28_4_ = auVar21._28_4_ + auVar22._28_4_;
  lVar146 = (ulong)(byte)PVar15 * 0x10;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + lVar146 + 6);
  auVar237 = vpmovsxwd_avx(auVar223);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + lVar146 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar8);
  lVar146 = lVar146 + uVar149 * -2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar146 + 6);
  auVar211 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar146 + 0xe);
  auVar236 = vpmovsxwd_avx(auVar10);
  auVar304._16_16_ = auVar236;
  auVar304._0_16_ = auVar211;
  auVar154 = vcvtdq2ps_avx(auVar304);
  auVar154 = vsubps_avx(auVar154,auVar191);
  auVar301._0_4_ = fVar278 * auVar154._0_4_;
  auVar301._4_4_ = fVar290 * auVar154._4_4_;
  auVar301._8_4_ = fVar292 * auVar154._8_4_;
  auVar301._12_4_ = fVar294 * auVar154._12_4_;
  auVar21._16_4_ = fVar296 * auVar154._16_4_;
  auVar21._0_16_ = auVar301;
  auVar21._20_4_ = fVar297 * auVar154._20_4_;
  auVar21._24_4_ = fVar299 * auVar154._24_4_;
  auVar21._28_4_ = auVar154._28_4_;
  auVar320._16_16_ = auVar27;
  auVar320._0_16_ = auVar237;
  auVar154 = vcvtdq2ps_avx(auVar320);
  auVar154 = vsubps_avx(auVar154,auVar191);
  auVar189._0_4_ = fVar278 * auVar154._0_4_;
  auVar189._4_4_ = fVar290 * auVar154._4_4_;
  auVar189._8_4_ = fVar292 * auVar154._8_4_;
  auVar189._12_4_ = fVar294 * auVar154._12_4_;
  auVar340._16_4_ = fVar296 * auVar154._16_4_;
  auVar340._0_16_ = auVar189;
  auVar340._20_4_ = fVar297 * auVar154._20_4_;
  auVar340._24_4_ = fVar299 * auVar154._24_4_;
  auVar340._28_4_ = auVar154._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar147 + uVar149 + 6);
  auVar237 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar147 + uVar149 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar12);
  auVar284._16_16_ = auVar27;
  auVar284._0_16_ = auVar237;
  auVar154 = vcvtdq2ps_avx(auVar284);
  auVar154 = vsubps_avx(auVar154,auVar227);
  auVar281._0_4_ = fVar261 * auVar154._0_4_;
  auVar281._4_4_ = fVar271 * auVar154._4_4_;
  auVar281._8_4_ = fVar272 * auVar154._8_4_;
  auVar281._12_4_ = fVar273 * auVar154._12_4_;
  auVar26._16_4_ = fVar275 * auVar154._16_4_;
  auVar26._0_16_ = auVar281;
  auVar26._20_4_ = fVar276 * auVar154._20_4_;
  auVar26._24_4_ = fVar277 * auVar154._24_4_;
  auVar26._28_4_ = auVar154._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar149 * 0x17 + 6);
  auVar237 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar149 * 0x17 + 0xe);
  auVar27 = vpmovsxwd_avx(auVar14);
  auVar321._16_16_ = auVar27;
  auVar321._0_16_ = auVar237;
  auVar154 = vcvtdq2ps_avx(auVar321);
  auVar154 = vsubps_avx(auVar154,auVar227);
  auVar218._0_4_ = fVar261 * auVar154._0_4_;
  auVar218._4_4_ = fVar271 * auVar154._4_4_;
  auVar218._8_4_ = fVar272 * auVar154._8_4_;
  auVar218._12_4_ = fVar273 * auVar154._12_4_;
  auVar28._16_4_ = fVar275 * auVar154._16_4_;
  auVar28._0_16_ = auVar218;
  auVar28._20_4_ = fVar276 * auVar154._20_4_;
  auVar28._24_4_ = fVar277 * auVar154._24_4_;
  auVar28._28_4_ = auVar154._28_4_;
  auVar237 = vpminsd_avx(auVar20._16_16_,auVar25._16_16_);
  auVar27 = vpminsd_avx(auVar152,auVar235);
  auVar328._16_16_ = auVar237;
  auVar328._0_16_ = auVar27;
  auVar211 = auVar340._16_16_;
  auVar345 = ZEXT1664(auVar211);
  auVar237 = vpminsd_avx(auVar21._16_16_,auVar211);
  auVar27 = vpminsd_avx(auVar301,auVar189);
  auVar364._16_16_ = auVar237;
  auVar364._0_16_ = auVar27;
  auVar154 = vmaxps_avx(auVar328,auVar364);
  auVar237 = vpminsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar27 = vpminsd_avx(auVar281,auVar218);
  auVar384._16_16_ = auVar237;
  auVar384._0_16_ = auVar27;
  uVar338 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar394._4_4_ = uVar338;
  auVar394._0_4_ = uVar338;
  auVar394._8_4_ = uVar338;
  auVar394._12_4_ = uVar338;
  auVar394._16_4_ = uVar338;
  auVar394._20_4_ = uVar338;
  auVar394._24_4_ = uVar338;
  auVar394._28_4_ = uVar338;
  auVar340 = vmaxps_avx(auVar384,auVar394);
  auVar154 = vmaxps_avx(auVar154,auVar340);
  local_80._4_4_ = auVar154._4_4_ * 0.99999964;
  local_80._0_4_ = auVar154._0_4_ * 0.99999964;
  local_80._8_4_ = auVar154._8_4_ * 0.99999964;
  local_80._12_4_ = auVar154._12_4_ * 0.99999964;
  local_80._16_4_ = auVar154._16_4_ * 0.99999964;
  local_80._20_4_ = auVar154._20_4_ * 0.99999964;
  local_80._24_4_ = auVar154._24_4_ * 0.99999964;
  local_80._28_4_ = auVar154._28_4_;
  auVar331 = ZEXT3264(local_80);
  auVar237 = vpmaxsd_avx(auVar20._16_16_,auVar25._16_16_);
  auVar27 = vpmaxsd_avx(auVar152,auVar235);
  auVar156._16_16_ = auVar237;
  auVar156._0_16_ = auVar27;
  auVar237 = vpmaxsd_avx(auVar21._16_16_,auVar211);
  auVar27 = vpmaxsd_avx(auVar301,auVar189);
  auVar192._16_16_ = auVar237;
  auVar192._0_16_ = auVar27;
  auVar154 = vminps_avx(auVar156,auVar192);
  auVar237 = vpmaxsd_avx(auVar26._16_16_,auVar28._16_16_);
  auVar27 = vpmaxsd_avx(auVar281,auVar218);
  uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar240._4_4_ = uVar338;
  auVar240._0_4_ = uVar338;
  auVar240._8_4_ = uVar338;
  auVar240._12_4_ = uVar338;
  auVar240._16_4_ = uVar338;
  auVar240._20_4_ = uVar338;
  auVar240._24_4_ = uVar338;
  auVar240._28_4_ = uVar338;
  auVar193._16_16_ = auVar237;
  auVar193._0_16_ = auVar27;
  auVar340 = vminps_avx(auVar193,auVar240);
  auVar154 = vminps_avx(auVar154,auVar340);
  auVar19._4_4_ = auVar154._4_4_ * 1.0000004;
  auVar19._0_4_ = auVar154._0_4_ * 1.0000004;
  auVar19._8_4_ = auVar154._8_4_ * 1.0000004;
  auVar19._12_4_ = auVar154._12_4_ * 1.0000004;
  auVar19._16_4_ = auVar154._16_4_ * 1.0000004;
  auVar19._20_4_ = auVar154._20_4_ * 1.0000004;
  auVar19._24_4_ = auVar154._24_4_ * 1.0000004;
  auVar19._28_4_ = auVar154._28_4_;
  auVar154 = vcmpps_avx(local_80,auVar19,2);
  auVar237 = vpshufd_avx(ZEXT116((byte)PVar15),0);
  auVar194._16_16_ = auVar237;
  auVar194._0_16_ = auVar237;
  auVar340 = vcvtdq2ps_avx(auVar194);
  auVar340 = vcmpps_avx(_DAT_02020f40,auVar340,1);
  auVar154 = vandps_avx(auVar154,auVar340);
  uVar141 = vmovmskps_avx(auVar154);
  if (uVar141 != 0) {
    uVar141 = uVar141 & 0xff;
    local_5a8 = pre->ray_space + k;
    local_5a0 = mm_lookupmask_ps._16_8_;
    uStack_598 = mm_lookupmask_ps._24_8_;
    uStack_590 = mm_lookupmask_ps._16_8_;
    uStack_588 = mm_lookupmask_ps._24_8_;
    uVar145 = 1 << ((byte)k & 0x1f);
    local_7a8 = (undefined1 (*) [32])&local_160;
    local_7b0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar145 & 0xf) << 4));
    local_7b8 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar145 >> 4) * 0x10);
    do {
      uVar149 = (ulong)uVar141;
      auVar340 = auVar345._0_32_;
      auVar154 = auVar331._0_32_;
      lVar146 = 0;
      if (uVar149 != 0) {
        for (; (uVar141 >> lVar146 & 1) == 0; lVar146 = lVar146 + 1) {
        }
      }
      uVar149 = uVar149 - 1 & uVar149;
      uVar141 = *(uint *)(prim + 2);
      uVar145 = *(uint *)(prim + lVar146 * 4 + 6);
      pGVar144 = (context->scene->geometries).items[uVar141].ptr;
      uVar147 = (ulong)*(uint *)(*(long *)&pGVar144->field_0x58 +
                                pGVar144[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar145);
      p_Var18 = pGVar144[1].intersectionFilterN;
      lVar146 = *(long *)&pGVar144[1].time_range.upper;
      auVar237 = *(undefined1 (*) [16])(lVar146 + (long)p_Var18 * uVar147);
      auVar27 = *(undefined1 (*) [16])(lVar146 + (uVar147 + 1) * (long)p_Var18);
      _local_6f0 = *(undefined1 (*) [16])(lVar146 + (uVar147 + 2) * (long)p_Var18);
      lVar148 = 0;
      if (uVar149 != 0) {
        for (; (uVar149 >> lVar148 & 1) == 0; lVar148 = lVar148 + 1) {
        }
      }
      _local_700 = *(undefined1 (*) [16])(lVar146 + (uVar147 + 3) * (long)p_Var18);
      if (((uVar149 != 0) && (uVar147 = uVar149 - 1 & uVar149, uVar147 != 0)) &&
         (lVar146 = 0, uVar147 != 0)) {
        for (; (uVar147 >> lVar146 & 1) == 0; lVar146 = lVar146 + 1) {
        }
      }
      uVar16 = (uint)pGVar144[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar211 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar8 = vinsertps_avx(auVar211,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar223 = vsubps_avx(auVar237,auVar8);
      auVar211 = vshufps_avx(auVar223,auVar223,0);
      auVar236 = vshufps_avx(auVar223,auVar223,0x55);
      auVar223 = vshufps_avx(auVar223,auVar223,0xaa);
      fVar234 = (local_5a8->vx).field_0.m128[0];
      fVar247 = (local_5a8->vx).field_0.m128[1];
      fVar249 = (local_5a8->vx).field_0.m128[2];
      fVar251 = (local_5a8->vx).field_0.m128[3];
      fVar254 = (local_5a8->vy).field_0.m128[0];
      fVar256 = (local_5a8->vy).field_0.m128[1];
      fVar259 = (local_5a8->vy).field_0.m128[2];
      fVar261 = (local_5a8->vy).field_0.m128[3];
      fVar271 = (local_5a8->vz).field_0.m128[0];
      fVar272 = (local_5a8->vz).field_0.m128[1];
      fVar273 = (local_5a8->vz).field_0.m128[2];
      fVar275 = (local_5a8->vz).field_0.m128[3];
      auVar190._0_4_ =
           auVar211._0_4_ * fVar234 + auVar236._0_4_ * fVar254 + fVar271 * auVar223._0_4_;
      auVar190._4_4_ =
           auVar211._4_4_ * fVar247 + auVar236._4_4_ * fVar256 + fVar272 * auVar223._4_4_;
      auVar190._8_4_ =
           auVar211._8_4_ * fVar249 + auVar236._8_4_ * fVar259 + fVar273 * auVar223._8_4_;
      auVar190._12_4_ =
           auVar211._12_4_ * fVar251 + auVar236._12_4_ * fVar261 + fVar275 * auVar223._12_4_;
      auVar211 = vblendps_avx(auVar190,auVar237,8);
      auVar9 = vsubps_avx(auVar27,auVar8);
      auVar236 = vshufps_avx(auVar9,auVar9,0);
      auVar223 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar383._0_4_ = auVar236._0_4_ * fVar234 + auVar223._0_4_ * fVar254 + fVar271 * auVar9._0_4_;
      auVar383._4_4_ = auVar236._4_4_ * fVar247 + auVar223._4_4_ * fVar256 + fVar272 * auVar9._4_4_;
      auVar383._8_4_ = auVar236._8_4_ * fVar249 + auVar223._8_4_ * fVar259 + fVar273 * auVar9._8_4_;
      auVar383._12_4_ =
           auVar236._12_4_ * fVar251 + auVar223._12_4_ * fVar261 + fVar275 * auVar9._12_4_;
      auVar236 = vblendps_avx(auVar383,auVar27,8);
      auVar10 = vsubps_avx(_local_6f0,auVar8);
      auVar223 = vshufps_avx(auVar10,auVar10,0);
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar282._0_4_ = auVar223._0_4_ * fVar234 + auVar9._0_4_ * fVar254 + fVar271 * auVar10._0_4_;
      auVar282._4_4_ = auVar223._4_4_ * fVar247 + auVar9._4_4_ * fVar256 + fVar272 * auVar10._4_4_;
      auVar282._8_4_ = auVar223._8_4_ * fVar249 + auVar9._8_4_ * fVar259 + fVar273 * auVar10._8_4_;
      auVar282._12_4_ =
           auVar223._12_4_ * fVar251 + auVar9._12_4_ * fVar261 + fVar275 * auVar10._12_4_;
      auVar10 = vshufps_avx(_local_6f0,_local_6f0,0xff);
      auVar223 = vblendps_avx(auVar282,_local_6f0,8);
      auVar11 = vsubps_avx(_local_700,auVar8);
      auVar8 = vshufps_avx(auVar11,auVar11,0);
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar326._0_4_ = auVar8._0_4_ * fVar234 + auVar9._0_4_ * fVar254 + fVar271 * auVar11._0_4_;
      auVar326._4_4_ = auVar8._4_4_ * fVar247 + auVar9._4_4_ * fVar256 + fVar272 * auVar11._4_4_;
      auVar326._8_4_ = auVar8._8_4_ * fVar249 + auVar9._8_4_ * fVar259 + fVar273 * auVar11._8_4_;
      auVar326._12_4_ = auVar8._12_4_ * fVar251 + auVar9._12_4_ * fVar261 + fVar275 * auVar11._12_4_
      ;
      auVar11 = vshufps_avx(_local_700,_local_700,0xff);
      auVar8 = vblendps_avx(auVar326,_local_700,8);
      auVar263._8_4_ = 0x7fffffff;
      auVar263._0_8_ = 0x7fffffff7fffffff;
      auVar263._12_4_ = 0x7fffffff;
      auVar211 = vandps_avx(auVar211,auVar263);
      auVar236 = vandps_avx(auVar236,auVar263);
      auVar9 = vmaxps_avx(auVar211,auVar236);
      auVar211 = vandps_avx(auVar223,auVar263);
      auVar236 = vandps_avx(auVar8,auVar263);
      auVar211 = vmaxps_avx(auVar211,auVar236);
      auVar211 = vmaxps_avx(auVar9,auVar211);
      auVar236 = vmovshdup_avx(auVar211);
      auVar236 = vmaxss_avx(auVar236,auVar211);
      auVar211 = vshufpd_avx(auVar211,auVar211,1);
      auVar211 = vmaxss_avx(auVar211,auVar236);
      lVar146 = (long)(int)uVar16 * 0x44;
      fVar296 = *(float *)(bezier_basis0 + lVar146 + 0x908);
      fVar297 = *(float *)(bezier_basis0 + lVar146 + 0x90c);
      fVar299 = *(float *)(bezier_basis0 + lVar146 + 0x910);
      fVar366 = *(float *)(bezier_basis0 + lVar146 + 0x914);
      fVar253 = *(float *)(bezier_basis0 + lVar146 + 0x918);
      fVar367 = *(float *)(bezier_basis0 + lVar146 + 0x91c);
      fVar258 = *(float *)(bezier_basis0 + lVar146 + 0x920);
      auVar236 = vshufps_avx(auVar282,auVar282,0);
      local_660._16_16_ = auVar236;
      local_660._0_16_ = auVar236;
      auVar223 = vshufps_avx(auVar282,auVar282,0x55);
      register0x00001390 = auVar223;
      _local_720 = auVar223;
      register0x00001490 = auVar10;
      _local_2c0 = auVar10;
      fVar368 = *(float *)(bezier_basis0 + lVar146 + 0xd8c);
      fVar298 = *(float *)(bezier_basis0 + lVar146 + 0xd90);
      fVar369 = *(float *)(bezier_basis0 + lVar146 + 0xd94);
      fVar361 = *(float *)(bezier_basis0 + lVar146 + 0xd98);
      fVar371 = *(float *)(bezier_basis0 + lVar146 + 0xd9c);
      fVar370 = *(float *)(bezier_basis0 + lVar146 + 0xda0);
      fVar373 = *(float *)(bezier_basis0 + lVar146 + 0xda4);
      auVar8 = vshufps_avx(auVar326,auVar326,0);
      register0x00001310 = auVar8;
      _local_540 = auVar8;
      auVar9 = vshufps_avx(auVar326,auVar326,0x55);
      register0x000015d0 = auVar9;
      _local_680 = auVar9;
      register0x000013d0 = auVar11;
      _local_a0 = auVar11;
      fVar262 = auVar8._0_4_;
      fVar216 = auVar8._4_4_;
      fVar314 = auVar8._8_4_;
      fVar274 = auVar8._12_4_;
      fVar400 = auVar9._0_4_;
      fVar404 = auVar9._4_4_;
      fVar405 = auVar9._8_4_;
      fVar406 = auVar9._12_4_;
      fVar335 = auVar236._0_4_;
      fVar346 = auVar236._4_4_;
      fVar348 = auVar236._8_4_;
      fVar350 = auVar236._12_4_;
      fVar300 = auVar223._0_4_;
      fVar311 = auVar223._4_4_;
      fVar312 = auVar223._8_4_;
      fVar313 = auVar223._12_4_;
      fVar271 = auVar11._0_4_;
      fVar273 = auVar11._4_4_;
      fVar275 = auVar11._8_4_;
      fVar276 = auVar11._12_4_;
      fVar292 = auVar10._0_4_;
      fVar294 = auVar10._4_4_;
      fVar150 = auVar10._8_4_;
      auVar236 = vshufps_avx(auVar383,auVar383,0);
      register0x00001490 = auVar236;
      _local_2e0 = auVar236;
      fVar372 = *(float *)(bezier_basis0 + lVar146 + 0x484);
      fVar362 = *(float *)(bezier_basis0 + lVar146 + 0x488);
      fVar172 = *(float *)(bezier_basis0 + lVar146 + 0x48c);
      fVar175 = *(float *)(bezier_basis0 + lVar146 + 0x490);
      fVar178 = *(float *)(bezier_basis0 + lVar146 + 0x494);
      fVar180 = *(float *)(bezier_basis0 + lVar146 + 0x498);
      fVar182 = *(float *)(bezier_basis0 + lVar146 + 0x49c);
      fVar247 = *(float *)(bezier_basis0 + lVar146 + 0x4a0);
      fVar353 = auVar236._0_4_;
      fVar358 = auVar236._4_4_;
      fVar359 = auVar236._8_4_;
      fVar360 = auVar236._12_4_;
      auVar236 = vshufps_avx(auVar383,auVar383,0x55);
      register0x00001350 = auVar236;
      _local_640 = auVar236;
      fVar279 = auVar236._0_4_;
      fVar291 = auVar236._4_4_;
      fVar293 = auVar236._8_4_;
      fVar295 = auVar236._12_4_;
      auVar236 = vshufps_avx(auVar27,auVar27,0xff);
      register0x00001590 = auVar236;
      _local_260 = auVar236;
      fVar171 = auVar236._0_4_;
      fVar174 = auVar236._4_4_;
      fVar177 = auVar236._8_4_;
      fVar336 = auVar236._12_4_;
      fVar261 = *(float *)(bezier_basis0 + lVar146 + 0x924) + 0.0 + 0.0;
      auVar236 = vshufps_avx(auVar190,auVar190,0);
      register0x00001550 = auVar236;
      _local_2a0 = auVar236;
      pauVar1 = (undefined1 (*) [16])(bezier_basis0 + lVar146);
      fVar249 = *(float *)*pauVar1;
      fVar254 = *(float *)(bezier_basis0 + lVar146 + 4);
      fVar256 = *(float *)(bezier_basis0 + lVar146 + 8);
      auVar136 = *(undefined1 (*) [12])*pauVar1;
      fVar184 = *(float *)(bezier_basis0 + lVar146 + 0xc);
      fStack_310 = *(float *)(bezier_basis0 + lVar146 + 0x10);
      fStack_30c = *(float *)(bezier_basis0 + lVar146 + 0x14);
      fStack_308 = *(float *)(bezier_basis0 + lVar146 + 0x18);
      fVar381 = auVar236._0_4_;
      fVar387 = auVar236._4_4_;
      fVar389 = auVar236._8_4_;
      fVar391 = auVar236._12_4_;
      auVar375._0_4_ = fVar381 * fVar249 + fVar353 * fVar372 + fVar335 * fVar296 + fVar262 * fVar368
      ;
      auVar375._4_4_ = fVar387 * fVar254 + fVar358 * fVar362 + fVar346 * fVar297 + fVar216 * fVar298
      ;
      auVar375._8_4_ = fVar389 * fVar256 + fVar359 * fVar172 + fVar348 * fVar299 + fVar314 * fVar369
      ;
      auVar375._12_4_ =
           fVar391 * fVar184 + fVar360 * fVar175 + fVar350 * fVar366 + fVar274 * fVar361;
      auVar375._16_4_ =
           fVar381 * fStack_310 + fVar353 * fVar178 + fVar335 * fVar253 + fVar262 * fVar371;
      auVar375._20_4_ =
           fVar387 * fStack_30c + fVar358 * fVar180 + fVar346 * fVar367 + fVar216 * fVar370;
      auVar375._24_4_ =
           fVar389 * fStack_308 + fVar359 * fVar182 + fVar348 * fVar258 + fVar314 * fVar373;
      auVar375._28_4_ = fVar247 + 0.0;
      auVar236 = vshufps_avx(auVar190,auVar190,0x55);
      local_300._16_16_ = auVar236;
      local_300._0_16_ = auVar236;
      fVar234 = auVar236._0_4_;
      fVar251 = auVar236._4_4_;
      fVar259 = auVar236._8_4_;
      fVar272 = auVar236._12_4_;
      auVar329._0_4_ = fVar249 * fVar234 + fVar279 * fVar372 + fVar300 * fVar296 + fVar400 * fVar368
      ;
      auVar329._4_4_ = fVar254 * fVar251 + fVar291 * fVar362 + fVar311 * fVar297 + fVar404 * fVar298
      ;
      auVar329._8_4_ = fVar256 * fVar259 + fVar293 * fVar172 + fVar312 * fVar299 + fVar405 * fVar369
      ;
      auVar329._12_4_ =
           fVar184 * fVar272 + fVar295 * fVar175 + fVar313 * fVar366 + fVar406 * fVar361;
      auVar329._16_4_ =
           fStack_310 * fVar234 + fVar279 * fVar178 + fVar300 * fVar253 + fVar400 * fVar371;
      auVar329._20_4_ =
           fStack_30c * fVar251 + fVar291 * fVar180 + fVar311 * fVar367 + fVar404 * fVar370;
      auVar329._24_4_ =
           fStack_308 * fVar259 + fVar293 * fVar182 + fVar312 * fVar258 + fVar405 * fVar373;
      auVar329._28_4_ = 0;
      auVar236 = vpermilps_avx(auVar237,0xff);
      register0x00001450 = auVar236;
      _local_280 = auVar236;
      _local_320 = *pauVar1;
      auVar11 = _local_320;
      uStack_304 = *(undefined4 *)(bezier_basis0 + lVar146 + 0x1c);
      fVar277 = auVar236._0_4_;
      fVar278 = auVar236._4_4_;
      fVar290 = auVar236._8_4_;
      fVar187 = fVar277 * fVar249 + fVar171 * fVar372 + fVar292 * fVar296 + fVar271 * fVar368;
      fVar207 = fVar278 * fVar254 + fVar174 * fVar362 + fVar294 * fVar297 + fVar273 * fVar298;
      fVar208 = fVar290 * fVar256 + fVar177 * fVar172 + fVar150 * fVar299 + fVar275 * fVar369;
      fVar209 = auVar236._12_4_ * fVar184 +
                fVar336 * fVar175 + auVar10._12_4_ * fVar366 + fVar276 * fVar361;
      fVar210 = fVar277 * fStack_310 + fVar171 * fVar178 + fVar292 * fVar253 + fVar271 * fVar371;
      fVar212 = fVar278 * fStack_30c + fVar174 * fVar180 + fVar294 * fVar367 + fVar273 * fVar370;
      fVar213 = fVar290 * fStack_308 + fVar177 * fVar182 + fVar150 * fVar258 + fVar275 * fVar373;
      fVar214 = fVar261 + 0.0;
      fVar215 = *(float *)(bezier_basis1 + lVar146 + 0x908);
      fVar248 = *(float *)(bezier_basis1 + lVar146 + 0x90c);
      fVar250 = *(float *)(bezier_basis1 + lVar146 + 0x910);
      fVar252 = *(float *)(bezier_basis1 + lVar146 + 0x914);
      fVar255 = *(float *)(bezier_basis1 + lVar146 + 0x918);
      fVar257 = *(float *)(bezier_basis1 + lVar146 + 0x91c);
      fVar260 = *(float *)(bezier_basis1 + lVar146 + 0x920);
      fVar315 = *(float *)(bezier_basis1 + lVar146 + 0xd8c);
      fVar324 = *(float *)(bezier_basis1 + lVar146 + 0xd90);
      fVar325 = *(float *)(bezier_basis1 + lVar146 + 0xd94);
      fVar332 = *(float *)(bezier_basis1 + lVar146 + 0xd98);
      fVar333 = *(float *)(bezier_basis1 + lVar146 + 0xd9c);
      fVar334 = *(float *)(bezier_basis1 + lVar146 + 0xda0);
      fVar337 = *(float *)(bezier_basis1 + lVar146 + 0xda4);
      fVar151 = *(float *)(bezier_basis1 + lVar146 + 0x484);
      fVar173 = *(float *)(bezier_basis1 + lVar146 + 0x488);
      fVar176 = *(float *)(bezier_basis1 + lVar146 + 0x48c);
      fVar179 = *(float *)(bezier_basis1 + lVar146 + 0x490);
      fVar181 = *(float *)(bezier_basis1 + lVar146 + 0x494);
      fVar183 = *(float *)(bezier_basis1 + lVar146 + 0x498);
      fVar185 = *(float *)(bezier_basis1 + lVar146 + 0x49c);
      fVar249 = fVar391 + fVar261 + 0.0;
      fVar186 = *(float *)(bezier_basis1 + lVar146);
      fVar217 = *(float *)(bezier_basis1 + lVar146 + 4);
      fVar229 = *(float *)(bezier_basis1 + lVar146 + 8);
      fVar230 = *(float *)(bezier_basis1 + lVar146 + 0xc);
      fVar231 = *(float *)(bezier_basis1 + lVar146 + 0x10);
      fVar232 = *(float *)(bezier_basis1 + lVar146 + 0x14);
      fVar233 = *(float *)(bezier_basis1 + lVar146 + 0x18);
      auVar265._0_4_ = fVar381 * fVar186 + fVar353 * fVar151 + fVar215 * fVar335 + fVar315 * fVar262
      ;
      auVar265._4_4_ = fVar387 * fVar217 + fVar358 * fVar173 + fVar248 * fVar346 + fVar324 * fVar216
      ;
      auVar265._8_4_ = fVar389 * fVar229 + fVar359 * fVar176 + fVar250 * fVar348 + fVar325 * fVar314
      ;
      auVar265._12_4_ =
           fVar391 * fVar230 + fVar360 * fVar179 + fVar252 * fVar350 + fVar332 * fVar274;
      auVar265._16_4_ =
           fVar381 * fVar231 + fVar353 * fVar181 + fVar255 * fVar335 + fVar333 * fVar262;
      auVar265._20_4_ =
           fVar387 * fVar232 + fVar358 * fVar183 + fVar257 * fVar346 + fVar334 * fVar216;
      auVar265._24_4_ =
           fVar389 * fVar233 + fVar359 * fVar185 + fVar260 * fVar348 + fVar337 * fVar314;
      auVar265._28_4_ = fVar336 + fVar249;
      auVar241._0_4_ = fVar234 * fVar186 + fVar279 * fVar151 + fVar215 * fVar300 + fVar400 * fVar315
      ;
      auVar241._4_4_ = fVar251 * fVar217 + fVar291 * fVar173 + fVar248 * fVar311 + fVar404 * fVar324
      ;
      auVar241._8_4_ = fVar259 * fVar229 + fVar293 * fVar176 + fVar250 * fVar312 + fVar405 * fVar325
      ;
      auVar241._12_4_ =
           fVar272 * fVar230 + fVar295 * fVar179 + fVar252 * fVar313 + fVar406 * fVar332;
      auVar241._16_4_ =
           fVar234 * fVar231 + fVar279 * fVar181 + fVar255 * fVar300 + fVar400 * fVar333;
      auVar241._20_4_ =
           fVar251 * fVar232 + fVar291 * fVar183 + fVar257 * fVar311 + fVar404 * fVar334;
      auVar241._24_4_ =
           fVar259 * fVar233 + fVar293 * fVar185 + fVar260 * fVar312 + fVar405 * fVar337;
      auVar241._28_4_ = fVar249 + fVar391 + fVar247 + 0.0;
      auVar285._0_4_ = fVar171 * fVar151 + fVar215 * fVar292 + fVar315 * fVar271 + fVar277 * fVar186
      ;
      auVar285._4_4_ = fVar174 * fVar173 + fVar248 * fVar294 + fVar324 * fVar273 + fVar278 * fVar217
      ;
      auVar285._8_4_ = fVar177 * fVar176 + fVar250 * fVar150 + fVar325 * fVar275 + fVar290 * fVar229
      ;
      auVar285._12_4_ =
           fVar336 * fVar179 + fVar252 * auVar10._12_4_ + fVar332 * fVar276 +
           auVar236._12_4_ * fVar230;
      auVar285._16_4_ =
           fVar171 * fVar181 + fVar255 * fVar292 + fVar333 * fVar271 + fVar277 * fVar231;
      auVar285._20_4_ =
           fVar174 * fVar183 + fVar257 * fVar294 + fVar334 * fVar273 + fVar278 * fVar232;
      auVar285._24_4_ =
           fVar177 * fVar185 + fVar260 * fVar150 + fVar337 * fVar275 + fVar290 * fVar233;
      auVar285._28_4_ = fVar391 + fVar276 + fVar247 + fVar249;
      _local_380 = vsubps_avx(auVar265,auVar375);
      auVar22 = vsubps_avx(auVar241,auVar329);
      fVar247 = local_380._0_4_;
      fVar254 = local_380._4_4_;
      auVar29._4_4_ = auVar329._4_4_ * fVar254;
      auVar29._0_4_ = auVar329._0_4_ * fVar247;
      fVar261 = local_380._8_4_;
      auVar29._8_4_ = auVar329._8_4_ * fVar261;
      fVar273 = local_380._12_4_;
      auVar29._12_4_ = auVar329._12_4_ * fVar273;
      fVar276 = local_380._16_4_;
      auVar29._16_4_ = auVar329._16_4_ * fVar276;
      fVar278 = local_380._20_4_;
      auVar29._20_4_ = auVar329._20_4_ * fVar278;
      fVar292 = local_380._24_4_;
      auVar29._24_4_ = auVar329._24_4_ * fVar292;
      auVar29._28_4_ = fVar249;
      fVar249 = auVar22._0_4_;
      fVar256 = auVar22._4_4_;
      auVar30._4_4_ = auVar375._4_4_ * fVar256;
      auVar30._0_4_ = auVar375._0_4_ * fVar249;
      fVar271 = auVar22._8_4_;
      auVar30._8_4_ = auVar375._8_4_ * fVar271;
      fVar275 = auVar22._12_4_;
      auVar30._12_4_ = auVar375._12_4_ * fVar275;
      fVar277 = auVar22._16_4_;
      auVar30._16_4_ = auVar375._16_4_ * fVar277;
      fVar290 = auVar22._20_4_;
      auVar30._20_4_ = auVar375._20_4_ * fVar290;
      fVar294 = auVar22._24_4_;
      auVar30._24_4_ = auVar375._24_4_ * fVar294;
      auVar30._28_4_ = auVar241._28_4_;
      auVar21 = vsubps_avx(auVar29,auVar30);
      auVar120._4_4_ = fVar207;
      auVar120._0_4_ = fVar187;
      auVar120._8_4_ = fVar208;
      auVar120._12_4_ = fVar209;
      auVar120._16_4_ = fVar210;
      auVar120._20_4_ = fVar212;
      auVar120._24_4_ = fVar213;
      auVar120._28_4_ = fVar214;
      auVar20 = vmaxps_avx(auVar120,auVar285);
      auVar31._4_4_ = auVar20._4_4_ * auVar20._4_4_ * (fVar254 * fVar254 + fVar256 * fVar256);
      auVar31._0_4_ = auVar20._0_4_ * auVar20._0_4_ * (fVar247 * fVar247 + fVar249 * fVar249);
      auVar31._8_4_ = auVar20._8_4_ * auVar20._8_4_ * (fVar261 * fVar261 + fVar271 * fVar271);
      auVar31._12_4_ = auVar20._12_4_ * auVar20._12_4_ * (fVar273 * fVar273 + fVar275 * fVar275);
      auVar31._16_4_ = auVar20._16_4_ * auVar20._16_4_ * (fVar276 * fVar276 + fVar277 * fVar277);
      auVar31._20_4_ = auVar20._20_4_ * auVar20._20_4_ * (fVar278 * fVar278 + fVar290 * fVar290);
      auVar31._24_4_ = auVar20._24_4_ * auVar20._24_4_ * (fVar292 * fVar292 + fVar294 * fVar294);
      auVar31._28_4_ = auVar22._28_4_ + auVar241._28_4_;
      auVar32._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar32._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar32._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar32._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar32._16_4_ = auVar21._16_4_ * auVar21._16_4_;
      auVar32._20_4_ = auVar21._20_4_ * auVar21._20_4_;
      auVar32._24_4_ = auVar21._24_4_ * auVar21._24_4_;
      auVar32._28_4_ = auVar21._28_4_;
      auVar20 = vcmpps_avx(auVar32,auVar31,2);
      auVar236 = ZEXT416((uint)(float)(int)uVar16);
      local_560._0_16_ = auVar236;
      auVar236 = vshufps_avx(auVar236,auVar236,0);
      auVar242._16_16_ = auVar236;
      auVar242._0_16_ = auVar236;
      auVar21 = vcmpps_avx(_DAT_02020f40,auVar242,1);
      auVar246 = ZEXT3264(auVar21);
      auVar236 = vpermilps_avx(auVar190,0xaa);
      register0x00001450 = auVar236;
      _local_600 = auVar236;
      auVar223 = vpermilps_avx(auVar383,0xaa);
      register0x00001550 = auVar223;
      _local_520 = auVar223;
      auVar8 = vpermilps_avx(auVar282,0xaa);
      register0x00001590 = auVar8;
      _local_c0 = auVar8;
      auVar9 = vpermilps_avx(auVar326,0xaa);
      register0x00001310 = auVar9;
      _local_6e0 = auVar9;
      auVar270 = ZEXT3264(_local_6e0);
      auVar23 = auVar21 & auVar20;
      local_880._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x60));
      auVar211 = ZEXT416((uint)(auVar211._0_4_ * 4.7683716e-07));
      local_800._0_16_ = auVar211;
      local_900._0_4_ = auVar237._0_4_;
      fVar247 = (float)local_900;
      local_900._4_4_ = auVar237._4_4_;
      fVar249 = local_900._4_4_;
      uStack_8f8._0_4_ = auVar237._8_4_;
      fVar254 = (float)uStack_8f8;
      uStack_8f8._4_4_ = auVar237._12_4_;
      fVar256 = uStack_8f8._4_4_;
      local_900 = auVar237._0_8_;
      uStack_8f8 = auVar237._8_8_;
      local_8c0 = auVar27._0_4_;
      fStack_8bc = auVar27._4_4_;
      fStack_8b8 = auVar27._8_4_;
      fStack_8b4 = auVar27._12_4_;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar23 >> 0x7f,0) == '\0') &&
            (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0xbf,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f])
      {
        auVar331 = ZEXT3264(auVar154);
        auVar345 = ZEXT3264(auVar340);
      }
      else {
        local_340 = vandps_avx(auVar20,auVar21);
        fVar336 = auVar236._0_4_;
        fVar347 = auVar236._4_4_;
        fVar349 = auVar236._8_4_;
        fVar351 = auVar236._12_4_;
        fVar382 = auVar223._0_4_;
        fVar388 = auVar223._4_4_;
        fVar390 = auVar223._8_4_;
        fVar392 = auVar223._12_4_;
        fVar393 = auVar8._0_4_;
        fVar397 = auVar8._4_4_;
        fVar398 = auVar8._8_4_;
        fVar399 = auVar8._12_4_;
        fVar261 = auVar9._0_4_;
        fVar271 = auVar9._4_4_;
        fVar273 = auVar9._8_4_;
        fVar275 = auVar9._12_4_;
        fVar276 = auVar21._28_4_ + *(float *)(bezier_basis1 + lVar146 + 0x924) + 0.0;
        local_360._0_4_ =
             fVar336 * fVar186 + fVar382 * fVar151 + fVar393 * fVar215 + fVar315 * fVar261;
        local_360._4_4_ =
             fVar347 * fVar217 + fVar388 * fVar173 + fVar397 * fVar248 + fVar324 * fVar271;
        fStack_358 = fVar349 * fVar229 + fVar390 * fVar176 + fVar398 * fVar250 + fVar325 * fVar273;
        fStack_354 = fVar351 * fVar230 + fVar392 * fVar179 + fVar399 * fVar252 + fVar332 * fVar275;
        fStack_350 = fVar336 * fVar231 + fVar382 * fVar181 + fVar393 * fVar255 + fVar333 * fVar261;
        fStack_34c = fVar347 * fVar232 + fVar388 * fVar183 + fVar397 * fVar257 + fVar334 * fVar271;
        fStack_348 = fVar349 * fVar233 + fVar390 * fVar185 + fVar398 * fVar260 + fVar337 * fVar273;
        fStack_344 = local_340._28_4_ + fVar276;
        local_320._0_4_ = auVar136._0_4_;
        local_320._4_4_ = auVar136._4_4_;
        fStack_318 = auVar136._8_4_;
        fVar150 = fVar336 * (float)local_320._0_4_ +
                  fVar382 * fVar372 + fVar393 * fVar296 + fVar261 * fVar368;
        fVar171 = fVar347 * (float)local_320._4_4_ +
                  fVar388 * fVar362 + fVar397 * fVar297 + fVar271 * fVar298;
        fVar174 = fVar349 * fStack_318 + fVar390 * fVar172 + fVar398 * fVar299 + fVar273 * fVar369;
        fVar177 = fVar351 * fVar184 + fVar392 * fVar175 + fVar399 * fVar366 + fVar275 * fVar361;
        fStack_750 = fVar336 * fStack_310 +
                     fVar382 * fVar178 + fVar393 * fVar253 + fVar261 * fVar371;
        fStack_74c = fVar347 * fStack_30c +
                     fVar388 * fVar180 + fVar397 * fVar367 + fVar271 * fVar370;
        fStack_748 = fVar349 * fStack_308 +
                     fVar390 * fVar182 + fVar398 * fVar258 + fVar273 * fVar373;
        fStack_744 = fStack_344 + fVar276 + local_340._28_4_ + auVar21._28_4_;
        fVar276 = *(float *)(bezier_basis0 + lVar146 + 0x1210);
        fVar277 = *(float *)(bezier_basis0 + lVar146 + 0x1214);
        fVar278 = *(float *)(bezier_basis0 + lVar146 + 0x1218);
        fVar290 = *(float *)(bezier_basis0 + lVar146 + 0x121c);
        fVar292 = *(float *)(bezier_basis0 + lVar146 + 0x1220);
        fVar294 = *(float *)(bezier_basis0 + lVar146 + 0x1224);
        fVar296 = *(float *)(bezier_basis0 + lVar146 + 0x1228);
        fVar297 = *(float *)(bezier_basis0 + lVar146 + 0x1694);
        fVar299 = *(float *)(bezier_basis0 + lVar146 + 0x1698);
        fVar366 = *(float *)(bezier_basis0 + lVar146 + 0x169c);
        fVar253 = *(float *)(bezier_basis0 + lVar146 + 0x16a0);
        fVar367 = *(float *)(bezier_basis0 + lVar146 + 0x16a4);
        fVar258 = *(float *)(bezier_basis0 + lVar146 + 0x16a8);
        fVar368 = *(float *)(bezier_basis0 + lVar146 + 0x16ac);
        fVar298 = *(float *)(bezier_basis0 + lVar146 + 0x1b18);
        fVar369 = *(float *)(bezier_basis0 + lVar146 + 0x1b1c);
        fVar361 = *(float *)(bezier_basis0 + lVar146 + 0x1b20);
        fVar371 = *(float *)(bezier_basis0 + lVar146 + 0x1b24);
        fVar370 = *(float *)(bezier_basis0 + lVar146 + 0x1b28);
        fVar373 = *(float *)(bezier_basis0 + lVar146 + 0x1b2c);
        fVar372 = *(float *)(bezier_basis0 + lVar146 + 0x1b30);
        fVar362 = *(float *)(bezier_basis0 + lVar146 + 0x1f9c);
        fVar172 = *(float *)(bezier_basis0 + lVar146 + 0x1fa0);
        fVar175 = *(float *)(bezier_basis0 + lVar146 + 0x1fa4);
        fVar178 = *(float *)(bezier_basis0 + lVar146 + 0x1fa8);
        fVar180 = *(float *)(bezier_basis0 + lVar146 + 0x1fac);
        fVar182 = *(float *)(bezier_basis0 + lVar146 + 0x1fb0);
        fVar184 = *(float *)(bezier_basis0 + lVar146 + 0x1fb4);
        fVar215 = *(float *)(bezier_basis0 + lVar146 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar146 + 0x1fb8);
        fVar352 = *(float *)(bezier_basis0 + lVar146 + 0x16b0) + fVar215;
        auVar305._0_4_ =
             fVar234 * fVar276 + fVar300 * fVar298 + fVar400 * fVar362 + fVar279 * fVar297;
        auVar305._4_4_ =
             fVar251 * fVar277 + fVar311 * fVar369 + fVar404 * fVar172 + fVar291 * fVar299;
        auVar305._8_4_ =
             fVar259 * fVar278 + fVar312 * fVar361 + fVar405 * fVar175 + fVar293 * fVar366;
        auVar305._12_4_ =
             fVar272 * fVar290 + fVar313 * fVar371 + fVar406 * fVar178 + fVar295 * fVar253;
        auVar305._16_4_ =
             fVar234 * fVar292 + fVar300 * fVar370 + fVar400 * fVar180 + fVar279 * fVar367;
        auVar305._20_4_ =
             fVar251 * fVar294 + fVar311 * fVar373 + fVar404 * fVar182 + fVar291 * fVar258;
        auVar305._24_4_ =
             fVar259 * fVar296 + fVar312 * fVar372 + fVar405 * fVar184 + fVar293 * fVar368;
        auVar305._28_4_ =
             fVar215 + fVar351 + *(float *)(bezier_basis1 + lVar146 + 0x1c) +
                       fVar351 + *(float *)(bezier_basis1 + lVar146 + 0x4a0);
        local_620 = fVar382 * fVar297 + fVar393 * fVar298 + fVar261 * fVar362 + fVar336 * fVar276;
        fStack_61c = fVar388 * fVar299 + fVar397 * fVar369 + fVar271 * fVar172 + fVar347 * fVar277;
        fStack_618 = fVar390 * fVar366 + fVar398 * fVar361 + fVar273 * fVar175 + fVar349 * fVar278;
        fStack_614 = fVar392 * fVar253 + fVar399 * fVar371 + fVar275 * fVar178 + fVar351 * fVar290;
        fStack_610 = fVar382 * fVar367 + fVar393 * fVar370 + fVar261 * fVar180 + fVar336 * fVar292;
        fStack_60c = fVar388 * fVar258 + fVar397 * fVar373 + fVar271 * fVar182 + fVar347 * fVar294;
        fStack_608 = fVar390 * fVar368 + fVar398 * fVar372 + fVar273 * fVar184 + fVar349 * fVar296;
        fStack_604 = fVar352 + *(float *)(bezier_basis0 + lVar146 + 0x122c);
        fVar215 = *(float *)(bezier_basis1 + lVar146 + 0x1b18);
        fVar248 = *(float *)(bezier_basis1 + lVar146 + 0x1b1c);
        fVar250 = *(float *)(bezier_basis1 + lVar146 + 0x1b20);
        fVar252 = *(float *)(bezier_basis1 + lVar146 + 0x1b24);
        fVar255 = *(float *)(bezier_basis1 + lVar146 + 0x1b28);
        fVar257 = *(float *)(bezier_basis1 + lVar146 + 0x1b2c);
        fVar260 = *(float *)(bezier_basis1 + lVar146 + 0x1b30);
        fVar315 = *(float *)(bezier_basis1 + lVar146 + 0x1f9c);
        fVar324 = *(float *)(bezier_basis1 + lVar146 + 0x1fa0);
        fVar325 = *(float *)(bezier_basis1 + lVar146 + 0x1fa4);
        fVar332 = *(float *)(bezier_basis1 + lVar146 + 0x1fa8);
        fVar333 = *(float *)(bezier_basis1 + lVar146 + 0x1fac);
        fVar334 = *(float *)(bezier_basis1 + lVar146 + 0x1fb0);
        fVar337 = *(float *)(bezier_basis1 + lVar146 + 0x1fb4);
        fVar151 = *(float *)(bezier_basis1 + lVar146 + 0x1694);
        fVar173 = *(float *)(bezier_basis1 + lVar146 + 0x1698);
        fVar176 = *(float *)(bezier_basis1 + lVar146 + 0x169c);
        fVar179 = *(float *)(bezier_basis1 + lVar146 + 0x16a0);
        fVar181 = *(float *)(bezier_basis1 + lVar146 + 0x16a4);
        fVar183 = *(float *)(bezier_basis1 + lVar146 + 0x16a8);
        fVar185 = *(float *)(bezier_basis1 + lVar146 + 0x16ac);
        fVar186 = *(float *)(bezier_basis1 + lVar146 + 0x1210);
        fVar217 = *(float *)(bezier_basis1 + lVar146 + 0x1214);
        fVar229 = *(float *)(bezier_basis1 + lVar146 + 0x1218);
        fVar230 = *(float *)(bezier_basis1 + lVar146 + 0x121c);
        fVar231 = *(float *)(bezier_basis1 + lVar146 + 0x1220);
        fVar232 = *(float *)(bezier_basis1 + lVar146 + 0x1224);
        fVar233 = *(float *)(bezier_basis1 + lVar146 + 0x1228);
        auVar322._0_4_ =
             fVar381 * fVar186 + fVar353 * fVar151 + fVar335 * fVar215 + fVar262 * fVar315;
        auVar322._4_4_ =
             fVar387 * fVar217 + fVar358 * fVar173 + fVar346 * fVar248 + fVar216 * fVar324;
        auVar322._8_4_ =
             fVar389 * fVar229 + fVar359 * fVar176 + fVar348 * fVar250 + fVar314 * fVar325;
        auVar322._12_4_ =
             fVar391 * fVar230 + fVar360 * fVar179 + fVar350 * fVar252 + fVar274 * fVar332;
        auVar322._16_4_ =
             fVar381 * fVar231 + fVar353 * fVar181 + fVar335 * fVar255 + fVar262 * fVar333;
        auVar322._20_4_ =
             fVar387 * fVar232 + fVar358 * fVar183 + fVar346 * fVar257 + fVar216 * fVar334;
        auVar322._24_4_ =
             fVar389 * fVar233 + fVar359 * fVar185 + fVar348 * fVar260 + fVar314 * fVar337;
        auVar322._28_4_ = fVar350 + fVar350 + fVar352 + fVar274;
        auVar341._0_4_ =
             fVar234 * fVar186 + fVar279 * fVar151 + fVar300 * fVar215 + fVar400 * fVar315;
        auVar341._4_4_ =
             fVar251 * fVar217 + fVar291 * fVar173 + fVar311 * fVar248 + fVar404 * fVar324;
        auVar341._8_4_ =
             fVar259 * fVar229 + fVar293 * fVar176 + fVar312 * fVar250 + fVar405 * fVar325;
        auVar341._12_4_ =
             fVar272 * fVar230 + fVar295 * fVar179 + fVar313 * fVar252 + fVar406 * fVar332;
        auVar341._16_4_ =
             fVar234 * fVar231 + fVar279 * fVar181 + fVar300 * fVar255 + fVar400 * fVar333;
        auVar341._20_4_ =
             fVar251 * fVar232 + fVar291 * fVar183 + fVar311 * fVar257 + fVar404 * fVar334;
        auVar341._24_4_ =
             fVar259 * fVar233 + fVar293 * fVar185 + fVar312 * fVar260 + fVar405 * fVar337;
        auVar341._28_4_ = fVar350 + fVar350 + fVar350 + fVar352;
        auVar228._0_4_ =
             fVar336 * fVar186 + fVar382 * fVar151 + fVar393 * fVar215 + fVar261 * fVar315;
        auVar228._4_4_ =
             fVar347 * fVar217 + fVar388 * fVar173 + fVar397 * fVar248 + fVar271 * fVar324;
        auVar228._8_4_ =
             fVar349 * fVar229 + fVar390 * fVar176 + fVar398 * fVar250 + fVar273 * fVar325;
        auVar228._12_4_ =
             fVar351 * fVar230 + fVar392 * fVar179 + fVar399 * fVar252 + fVar275 * fVar332;
        auVar228._16_4_ =
             fVar336 * fVar231 + fVar382 * fVar181 + fVar393 * fVar255 + fVar261 * fVar333;
        auVar228._20_4_ =
             fVar347 * fVar232 + fVar388 * fVar183 + fVar397 * fVar257 + fVar271 * fVar334;
        auVar228._24_4_ =
             fVar349 * fVar233 + fVar390 * fVar185 + fVar398 * fVar260 + fVar273 * fVar337;
        auVar228._28_4_ =
             *(float *)(bezier_basis1 + lVar146 + 0x122c) +
             *(float *)(bezier_basis1 + lVar146 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar146 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar146 + 0x1fb8);
        auVar266._8_4_ = 0x7fffffff;
        auVar266._0_8_ = 0x7fffffff7fffffff;
        auVar266._12_4_ = 0x7fffffff;
        auVar266._16_4_ = 0x7fffffff;
        auVar266._20_4_ = 0x7fffffff;
        auVar266._24_4_ = 0x7fffffff;
        auVar266._28_4_ = 0x7fffffff;
        auVar130._4_4_ =
             fVar387 * fVar277 + fVar358 * fVar299 + fVar346 * fVar369 + fVar216 * fVar172;
        auVar130._0_4_ =
             fVar381 * fVar276 + fVar353 * fVar297 + fVar335 * fVar298 + fVar262 * fVar362;
        auVar130._8_4_ =
             fVar389 * fVar278 + fVar359 * fVar366 + fVar348 * fVar361 + fVar314 * fVar175;
        auVar130._12_4_ =
             fVar391 * fVar290 + fVar360 * fVar253 + fVar350 * fVar371 + fVar274 * fVar178;
        auVar130._16_4_ =
             fVar381 * fVar292 + fVar353 * fVar367 + fVar335 * fVar370 + fVar262 * fVar180;
        auVar130._20_4_ =
             fVar387 * fVar294 + fVar358 * fVar258 + fVar346 * fVar373 + fVar216 * fVar182;
        auVar130._24_4_ =
             fVar389 * fVar296 + fVar359 * fVar368 + fVar348 * fVar372 + fVar314 * fVar184;
        auVar130._28_4_ =
             *(float *)(bezier_basis0 + lVar146 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar146 + 0x1fb8) +
             fVar351 + *(float *)(bezier_basis1 + lVar146 + 0x4a0);
        auVar20 = vandps_avx(auVar130,auVar266);
        auVar21 = vandps_avx(auVar305,auVar266);
        auVar21 = vmaxps_avx(auVar20,auVar21);
        auVar134._4_4_ = fStack_61c;
        auVar134._0_4_ = local_620;
        auVar134._8_4_ = fStack_618;
        auVar134._12_4_ = fStack_614;
        auVar134._16_4_ = fStack_610;
        auVar134._20_4_ = fStack_60c;
        auVar134._24_4_ = fStack_608;
        auVar134._28_4_ = fStack_604;
        auVar20 = vandps_avx(auVar266,auVar134);
        auVar20 = vmaxps_avx(auVar21,auVar20);
        auVar237 = vpermilps_avx(auVar211,0);
        auVar306._16_16_ = auVar237;
        auVar306._0_16_ = auVar237;
        auVar20 = vcmpps_avx(auVar20,auVar306,1);
        auVar23 = vblendvps_avx(auVar130,_local_380,auVar20);
        auVar24 = vblendvps_avx(auVar305,auVar22,auVar20);
        auVar20 = vandps_avx(auVar322,auVar266);
        auVar21 = vandps_avx(auVar341,auVar266);
        auVar25 = vmaxps_avx(auVar20,auVar21);
        auVar20 = vandps_avx(auVar228,auVar266);
        auVar20 = vmaxps_avx(auVar25,auVar20);
        auVar25 = vcmpps_avx(auVar20,auVar306,1);
        auVar20 = vblendvps_avx(auVar322,_local_380,auVar25);
        auVar22 = vblendvps_avx(auVar341,auVar22,auVar25);
        fVar362 = auVar23._0_4_;
        fVar172 = auVar23._4_4_;
        fVar175 = auVar23._8_4_;
        fVar178 = auVar23._12_4_;
        fVar180 = auVar23._16_4_;
        fVar182 = auVar23._20_4_;
        fVar184 = auVar23._24_4_;
        fVar215 = auVar20._0_4_;
        fVar248 = auVar20._4_4_;
        fVar250 = auVar20._8_4_;
        fVar252 = auVar20._12_4_;
        fVar255 = auVar20._16_4_;
        fVar257 = auVar20._20_4_;
        fVar260 = auVar20._24_4_;
        fStack_764 = -auVar20._28_4_;
        fVar234 = auVar24._0_4_;
        fVar271 = auVar24._4_4_;
        fVar276 = auVar24._8_4_;
        fVar292 = auVar24._12_4_;
        fVar299 = auVar24._16_4_;
        fVar258 = auVar24._20_4_;
        fVar361 = auVar24._24_4_;
        auVar157._0_4_ = fVar234 * fVar234 + fVar362 * fVar362;
        auVar157._4_4_ = fVar271 * fVar271 + fVar172 * fVar172;
        auVar157._8_4_ = fVar276 * fVar276 + fVar175 * fVar175;
        auVar157._12_4_ = fVar292 * fVar292 + fVar178 * fVar178;
        auVar157._16_4_ = fVar299 * fVar299 + fVar180 * fVar180;
        auVar157._20_4_ = fVar258 * fVar258 + fVar182 * fVar182;
        auVar157._24_4_ = fVar361 * fVar361 + fVar184 * fVar184;
        auVar157._28_4_ = auVar341._28_4_ + auVar23._28_4_;
        auVar23 = vrsqrtps_avx(auVar157);
        fVar251 = auVar23._0_4_;
        fVar259 = auVar23._4_4_;
        auVar33._4_4_ = fVar259 * 1.5;
        auVar33._0_4_ = fVar251 * 1.5;
        fVar261 = auVar23._8_4_;
        auVar33._8_4_ = fVar261 * 1.5;
        fVar272 = auVar23._12_4_;
        auVar33._12_4_ = fVar272 * 1.5;
        fVar273 = auVar23._16_4_;
        auVar33._16_4_ = fVar273 * 1.5;
        fVar275 = auVar23._20_4_;
        auVar33._20_4_ = fVar275 * 1.5;
        fVar277 = auVar23._24_4_;
        fVar372 = auVar21._28_4_;
        auVar33._24_4_ = fVar277 * 1.5;
        auVar33._28_4_ = fVar372;
        auVar34._4_4_ = fVar259 * fVar259 * fVar259 * auVar157._4_4_ * 0.5;
        auVar34._0_4_ = fVar251 * fVar251 * fVar251 * auVar157._0_4_ * 0.5;
        auVar34._8_4_ = fVar261 * fVar261 * fVar261 * auVar157._8_4_ * 0.5;
        auVar34._12_4_ = fVar272 * fVar272 * fVar272 * auVar157._12_4_ * 0.5;
        auVar34._16_4_ = fVar273 * fVar273 * fVar273 * auVar157._16_4_ * 0.5;
        auVar34._20_4_ = fVar275 * fVar275 * fVar275 * auVar157._20_4_ * 0.5;
        auVar34._24_4_ = fVar277 * fVar277 * fVar277 * auVar157._24_4_ * 0.5;
        auVar34._28_4_ = auVar157._28_4_;
        auVar21 = vsubps_avx(auVar33,auVar34);
        fVar251 = auVar21._0_4_;
        fVar272 = auVar21._4_4_;
        fVar277 = auVar21._8_4_;
        fVar294 = auVar21._12_4_;
        fVar366 = auVar21._16_4_;
        fVar368 = auVar21._20_4_;
        fVar371 = auVar21._24_4_;
        fVar259 = auVar22._0_4_;
        fVar273 = auVar22._4_4_;
        fVar278 = auVar22._8_4_;
        fVar296 = auVar22._12_4_;
        fVar253 = auVar22._16_4_;
        fVar298 = auVar22._20_4_;
        fVar370 = auVar22._24_4_;
        auVar158._0_4_ = fVar259 * fVar259 + fVar215 * fVar215;
        auVar158._4_4_ = fVar273 * fVar273 + fVar248 * fVar248;
        auVar158._8_4_ = fVar278 * fVar278 + fVar250 * fVar250;
        auVar158._12_4_ = fVar296 * fVar296 + fVar252 * fVar252;
        auVar158._16_4_ = fVar253 * fVar253 + fVar255 * fVar255;
        auVar158._20_4_ = fVar298 * fVar298 + fVar257 * fVar257;
        auVar158._24_4_ = fVar370 * fVar370 + fVar260 * fVar260;
        auVar158._28_4_ = auVar20._28_4_ + auVar21._28_4_;
        auVar20 = vrsqrtps_avx(auVar158);
        fVar261 = auVar20._0_4_;
        fVar275 = auVar20._4_4_;
        auVar35._4_4_ = fVar275 * 1.5;
        auVar35._0_4_ = fVar261 * 1.5;
        fVar290 = auVar20._8_4_;
        auVar35._8_4_ = fVar290 * 1.5;
        fVar297 = auVar20._12_4_;
        auVar35._12_4_ = fVar297 * 1.5;
        fVar367 = auVar20._16_4_;
        auVar35._16_4_ = fVar367 * 1.5;
        fVar369 = auVar20._20_4_;
        auVar35._20_4_ = fVar369 * 1.5;
        fVar373 = auVar20._24_4_;
        auVar35._24_4_ = fVar373 * 1.5;
        auVar35._28_4_ = fVar372;
        auVar36._4_4_ = fVar275 * fVar275 * fVar275 * auVar158._4_4_ * 0.5;
        auVar36._0_4_ = fVar261 * fVar261 * fVar261 * auVar158._0_4_ * 0.5;
        auVar36._8_4_ = fVar290 * fVar290 * fVar290 * auVar158._8_4_ * 0.5;
        auVar36._12_4_ = fVar297 * fVar297 * fVar297 * auVar158._12_4_ * 0.5;
        auVar36._16_4_ = fVar367 * fVar367 * fVar367 * auVar158._16_4_ * 0.5;
        auVar36._20_4_ = fVar369 * fVar369 * fVar369 * auVar158._20_4_ * 0.5;
        auVar36._24_4_ = fVar373 * fVar373 * fVar373 * auVar158._24_4_ * 0.5;
        auVar36._28_4_ = auVar158._28_4_;
        auVar20 = vsubps_avx(auVar35,auVar36);
        fVar261 = auVar20._0_4_;
        fVar275 = auVar20._4_4_;
        fVar290 = auVar20._8_4_;
        fVar297 = auVar20._12_4_;
        fVar367 = auVar20._16_4_;
        fVar369 = auVar20._20_4_;
        fVar373 = auVar20._24_4_;
        fVar315 = fVar187 * fVar234 * fVar251;
        fVar324 = fVar207 * fVar271 * fVar272;
        auVar37._4_4_ = fVar324;
        auVar37._0_4_ = fVar315;
        fVar325 = fVar208 * fVar276 * fVar277;
        auVar37._8_4_ = fVar325;
        fVar292 = fVar209 * fVar292 * fVar294;
        auVar37._12_4_ = fVar292;
        fStack_770 = fVar210 * fVar299 * fVar366;
        auVar37._16_4_ = fStack_770;
        fStack_76c = fVar212 * fVar258 * fVar368;
        auVar37._20_4_ = fStack_76c;
        fStack_768 = fVar213 * fVar361 * fVar371;
        auVar37._24_4_ = fStack_768;
        auVar37._28_4_ = fStack_764;
        fStack_770 = auVar375._16_4_ + fStack_770;
        fStack_76c = auVar375._20_4_ + fStack_76c;
        fStack_768 = auVar375._24_4_ + fStack_768;
        fStack_764 = auVar375._28_4_ + fStack_764;
        fVar234 = fVar187 * fVar251 * -fVar362;
        fVar271 = fVar207 * fVar272 * -fVar172;
        auVar38._4_4_ = fVar271;
        auVar38._0_4_ = fVar234;
        fVar276 = fVar208 * fVar277 * -fVar175;
        auVar38._8_4_ = fVar276;
        fVar299 = fVar209 * fVar294 * -fVar178;
        auVar38._12_4_ = fVar299;
        fVar258 = fVar210 * fVar366 * -fVar180;
        auVar38._16_4_ = fVar258;
        fVar361 = fVar212 * fVar368 * -fVar182;
        auVar38._20_4_ = fVar361;
        fVar362 = fVar213 * fVar371 * -fVar184;
        auVar38._24_4_ = fVar362;
        auVar38._28_4_ = fVar372;
        local_7a0._4_4_ = fVar271 + auVar329._4_4_;
        local_7a0._0_4_ = fVar234 + auVar329._0_4_;
        uStack_798._0_4_ = fVar276 + auVar329._8_4_;
        uStack_798._4_4_ = fVar299 + auVar329._12_4_;
        uStack_790._0_4_ = fVar258 + auVar329._16_4_;
        uStack_790._4_4_ = fVar361 + auVar329._20_4_;
        uStack_788._0_4_ = fVar362 + auVar329._24_4_;
        uStack_788._4_4_ = fVar372 + 0.0;
        fVar234 = fVar251 * 0.0 * fVar187;
        fVar251 = fVar272 * 0.0 * fVar207;
        auVar39._4_4_ = fVar251;
        auVar39._0_4_ = fVar234;
        fVar271 = fVar277 * 0.0 * fVar208;
        auVar39._8_4_ = fVar271;
        fVar272 = fVar294 * 0.0 * fVar209;
        auVar39._12_4_ = fVar272;
        fVar276 = fVar366 * 0.0 * fVar210;
        auVar39._16_4_ = fVar276;
        fVar277 = fVar368 * 0.0 * fVar212;
        auVar39._20_4_ = fVar277;
        fVar294 = fVar371 * 0.0 * fVar213;
        auVar39._24_4_ = fVar294;
        auVar39._28_4_ = fVar391;
        auVar132._4_4_ = fVar171;
        auVar132._0_4_ = fVar150;
        auVar132._8_4_ = fVar174;
        auVar132._12_4_ = fVar177;
        auVar132._16_4_ = fStack_750;
        auVar132._20_4_ = fStack_74c;
        auVar132._24_4_ = fStack_748;
        auVar132._28_4_ = fStack_744;
        auVar307._0_4_ = fVar234 + fVar150;
        auVar307._4_4_ = fVar251 + fVar171;
        auVar307._8_4_ = fVar271 + fVar174;
        auVar307._12_4_ = fVar272 + fVar177;
        auVar307._16_4_ = fVar276 + fStack_750;
        auVar307._20_4_ = fVar277 + fStack_74c;
        auVar307._24_4_ = fVar294 + fStack_748;
        auVar307._28_4_ = fVar391 + fStack_744;
        fVar234 = auVar285._0_4_ * fVar259 * fVar261;
        fVar251 = auVar285._4_4_ * fVar273 * fVar275;
        auVar40._4_4_ = fVar251;
        auVar40._0_4_ = fVar234;
        fVar259 = auVar285._8_4_ * fVar278 * fVar290;
        auVar40._8_4_ = fVar259;
        fVar271 = auVar285._12_4_ * fVar296 * fVar297;
        auVar40._12_4_ = fVar271;
        fVar272 = auVar285._16_4_ * fVar253 * fVar367;
        auVar40._16_4_ = fVar272;
        fVar273 = auVar285._20_4_ * fVar298 * fVar369;
        auVar40._20_4_ = fVar273;
        fVar276 = auVar285._24_4_ * fVar370 * fVar373;
        auVar40._24_4_ = fVar276;
        auVar40._28_4_ = auVar22._28_4_;
        auVar26 = vsubps_avx(auVar375,auVar37);
        auVar342._0_4_ = auVar265._0_4_ + fVar234;
        auVar342._4_4_ = auVar265._4_4_ + fVar251;
        auVar342._8_4_ = auVar265._8_4_ + fVar259;
        auVar342._12_4_ = auVar265._12_4_ + fVar271;
        auVar342._16_4_ = auVar265._16_4_ + fVar272;
        auVar342._20_4_ = auVar265._20_4_ + fVar273;
        auVar342._24_4_ = auVar265._24_4_ + fVar276;
        auVar342._28_4_ = auVar265._28_4_ + auVar22._28_4_;
        fVar234 = auVar285._0_4_ * fVar261 * -fVar215;
        fVar251 = auVar285._4_4_ * fVar275 * -fVar248;
        auVar41._4_4_ = fVar251;
        auVar41._0_4_ = fVar234;
        fVar259 = auVar285._8_4_ * fVar290 * -fVar250;
        auVar41._8_4_ = fVar259;
        fVar271 = auVar285._12_4_ * fVar297 * -fVar252;
        auVar41._12_4_ = fVar271;
        fVar272 = auVar285._16_4_ * fVar367 * -fVar255;
        auVar41._16_4_ = fVar272;
        fVar273 = auVar285._20_4_ * fVar369 * -fVar257;
        auVar41._20_4_ = fVar273;
        fVar276 = auVar285._24_4_ * fVar373 * -fVar260;
        auVar41._24_4_ = fVar276;
        auVar41._28_4_ = fVar392;
        auVar28 = vsubps_avx(auVar329,auVar38);
        auVar355._0_4_ = fVar234 + auVar241._0_4_;
        auVar355._4_4_ = fVar251 + auVar241._4_4_;
        auVar355._8_4_ = fVar259 + auVar241._8_4_;
        auVar355._12_4_ = fVar271 + auVar241._12_4_;
        auVar355._16_4_ = fVar272 + auVar241._16_4_;
        auVar355._20_4_ = fVar273 + auVar241._20_4_;
        auVar355._24_4_ = fVar276 + auVar241._24_4_;
        auVar355._28_4_ = fVar392 + auVar241._28_4_;
        fVar234 = auVar285._0_4_ * fVar261 * 0.0;
        fVar251 = auVar285._4_4_ * fVar275 * 0.0;
        auVar42._4_4_ = fVar251;
        auVar42._0_4_ = fVar234;
        fVar259 = auVar285._8_4_ * fVar290 * 0.0;
        auVar42._8_4_ = fVar259;
        fVar261 = auVar285._12_4_ * fVar297 * 0.0;
        auVar42._12_4_ = fVar261;
        fVar271 = auVar285._16_4_ * fVar367 * 0.0;
        auVar42._16_4_ = fVar271;
        fVar272 = auVar285._20_4_ * fVar369 * 0.0;
        auVar42._20_4_ = fVar272;
        fVar273 = auVar285._24_4_ * fVar373 * 0.0;
        auVar42._24_4_ = fVar273;
        auVar42._28_4_ = 0x3f000000;
        auVar19 = vsubps_avx(auVar132,auVar39);
        auVar395._0_4_ = fVar234 + (float)local_360._0_4_;
        auVar395._4_4_ = fVar251 + (float)local_360._4_4_;
        auVar395._8_4_ = fVar259 + fStack_358;
        auVar395._12_4_ = fVar261 + fStack_354;
        auVar395._16_4_ = fVar271 + fStack_350;
        auVar395._20_4_ = fVar272 + fStack_34c;
        auVar395._24_4_ = fVar273 + fStack_348;
        auVar395._28_4_ = fStack_344 + 0.5;
        auVar20 = vsubps_avx(auVar265,auVar40);
        auVar21 = vsubps_avx(auVar241,auVar41);
        auVar156 = vsubps_avx(_local_360,auVar42);
        auVar22 = vsubps_avx(auVar355,auVar28);
        auVar23 = vsubps_avx(auVar395,auVar19);
        auVar43._4_4_ = auVar19._4_4_ * auVar22._4_4_;
        auVar43._0_4_ = auVar19._0_4_ * auVar22._0_4_;
        auVar43._8_4_ = auVar19._8_4_ * auVar22._8_4_;
        auVar43._12_4_ = auVar19._12_4_ * auVar22._12_4_;
        auVar43._16_4_ = auVar19._16_4_ * auVar22._16_4_;
        auVar43._20_4_ = auVar19._20_4_ * auVar22._20_4_;
        auVar43._24_4_ = auVar19._24_4_ * auVar22._24_4_;
        auVar43._28_4_ = fVar313;
        auVar44._4_4_ = auVar28._4_4_ * auVar23._4_4_;
        auVar44._0_4_ = auVar28._0_4_ * auVar23._0_4_;
        auVar44._8_4_ = auVar28._8_4_ * auVar23._8_4_;
        auVar44._12_4_ = auVar28._12_4_ * auVar23._12_4_;
        auVar44._16_4_ = auVar28._16_4_ * auVar23._16_4_;
        auVar44._20_4_ = auVar28._20_4_ * auVar23._20_4_;
        auVar44._24_4_ = auVar28._24_4_ * auVar23._24_4_;
        auVar44._28_4_ = auVar241._28_4_;
        auVar24 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar26._4_4_ * auVar23._4_4_;
        auVar45._0_4_ = auVar26._0_4_ * auVar23._0_4_;
        auVar45._8_4_ = auVar26._8_4_ * auVar23._8_4_;
        auVar45._12_4_ = auVar26._12_4_ * auVar23._12_4_;
        auVar45._16_4_ = auVar26._16_4_ * auVar23._16_4_;
        auVar45._20_4_ = auVar26._20_4_ * auVar23._20_4_;
        auVar45._24_4_ = auVar26._24_4_ * auVar23._24_4_;
        auVar45._28_4_ = auVar23._28_4_;
        auVar25 = vsubps_avx(auVar342,auVar26);
        auVar46._4_4_ = auVar19._4_4_ * auVar25._4_4_;
        auVar46._0_4_ = auVar19._0_4_ * auVar25._0_4_;
        auVar46._8_4_ = auVar19._8_4_ * auVar25._8_4_;
        auVar46._12_4_ = auVar19._12_4_ * auVar25._12_4_;
        auVar46._16_4_ = auVar19._16_4_ * auVar25._16_4_;
        auVar46._20_4_ = auVar19._20_4_ * auVar25._20_4_;
        auVar46._24_4_ = auVar19._24_4_ * auVar25._24_4_;
        auVar46._28_4_ = auVar265._28_4_;
        auVar155 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar25._4_4_ * auVar28._4_4_;
        auVar47._0_4_ = auVar25._0_4_ * auVar28._0_4_;
        auVar47._8_4_ = auVar25._8_4_ * auVar28._8_4_;
        auVar47._12_4_ = auVar25._12_4_ * auVar28._12_4_;
        auVar47._16_4_ = auVar25._16_4_ * auVar28._16_4_;
        auVar47._20_4_ = auVar25._20_4_ * auVar28._20_4_;
        auVar47._24_4_ = auVar25._24_4_ * auVar28._24_4_;
        auVar47._28_4_ = auVar23._28_4_;
        auVar48._4_4_ = auVar26._4_4_ * auVar22._4_4_;
        auVar48._0_4_ = auVar26._0_4_ * auVar22._0_4_;
        auVar48._8_4_ = auVar26._8_4_ * auVar22._8_4_;
        auVar48._12_4_ = auVar26._12_4_ * auVar22._12_4_;
        auVar48._16_4_ = auVar26._16_4_ * auVar22._16_4_;
        auVar48._20_4_ = auVar26._20_4_ * auVar22._20_4_;
        auVar48._24_4_ = auVar26._24_4_ * auVar22._24_4_;
        auVar48._28_4_ = auVar22._28_4_;
        auVar22 = vsubps_avx(auVar48,auVar47);
        auVar159._0_4_ = auVar24._0_4_ * 0.0 + auVar22._0_4_ + auVar155._0_4_ * 0.0;
        auVar159._4_4_ = auVar24._4_4_ * 0.0 + auVar22._4_4_ + auVar155._4_4_ * 0.0;
        auVar159._8_4_ = auVar24._8_4_ * 0.0 + auVar22._8_4_ + auVar155._8_4_ * 0.0;
        auVar159._12_4_ = auVar24._12_4_ * 0.0 + auVar22._12_4_ + auVar155._12_4_ * 0.0;
        auVar159._16_4_ = auVar24._16_4_ * 0.0 + auVar22._16_4_ + auVar155._16_4_ * 0.0;
        auVar159._20_4_ = auVar24._20_4_ * 0.0 + auVar22._20_4_ + auVar155._20_4_ * 0.0;
        auVar159._24_4_ = auVar24._24_4_ * 0.0 + auVar22._24_4_ + auVar155._24_4_ * 0.0;
        auVar159._28_4_ = auVar22._28_4_ + auVar22._28_4_ + auVar155._28_4_;
        auVar155 = vcmpps_avx(auVar159,ZEXT432(0) << 0x20,2);
        auVar131._4_4_ = auVar375._4_4_ + fVar324;
        auVar131._0_4_ = auVar375._0_4_ + fVar315;
        auVar131._8_4_ = auVar375._8_4_ + fVar325;
        auVar131._12_4_ = auVar375._12_4_ + fVar292;
        auVar131._16_4_ = fStack_770;
        auVar131._20_4_ = fStack_76c;
        auVar131._24_4_ = fStack_768;
        auVar131._28_4_ = fStack_764;
        auVar20 = vblendvps_avx(auVar20,auVar131,auVar155);
        auVar21 = vblendvps_avx(auVar21,_local_7a0,auVar155);
        auVar22 = vblendvps_avx(auVar156,auVar307,auVar155);
        auVar23 = vblendvps_avx(auVar26,auVar342,auVar155);
        auVar24 = vblendvps_avx(auVar28,auVar355,auVar155);
        auVar25 = vblendvps_avx(auVar19,auVar395,auVar155);
        auVar26 = vblendvps_avx(auVar342,auVar26,auVar155);
        auVar28 = vblendvps_avx(auVar355,auVar28,auVar155);
        auVar237 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar19 = vblendvps_avx(auVar395,auVar19,auVar155);
        auVar26 = vsubps_avx(auVar26,auVar20);
        auVar191 = vsubps_avx(auVar28,auVar21);
        auVar19 = vsubps_avx(auVar19,auVar22);
        auVar192 = vsubps_avx(auVar21,auVar24);
        fVar234 = auVar191._0_4_;
        fVar184 = auVar22._0_4_;
        fVar272 = auVar191._4_4_;
        fVar215 = auVar22._4_4_;
        auVar49._4_4_ = fVar215 * fVar272;
        auVar49._0_4_ = fVar184 * fVar234;
        fVar278 = auVar191._8_4_;
        fVar248 = auVar22._8_4_;
        auVar49._8_4_ = fVar248 * fVar278;
        fVar297 = auVar191._12_4_;
        fVar250 = auVar22._12_4_;
        auVar49._12_4_ = fVar250 * fVar297;
        fVar258 = auVar191._16_4_;
        fVar252 = auVar22._16_4_;
        auVar49._16_4_ = fVar252 * fVar258;
        fVar371 = auVar191._20_4_;
        fVar255 = auVar22._20_4_;
        auVar49._20_4_ = fVar255 * fVar371;
        fVar172 = auVar191._24_4_;
        fVar257 = auVar22._24_4_;
        auVar49._24_4_ = fVar257 * fVar172;
        auVar49._28_4_ = auVar28._28_4_;
        fVar251 = auVar21._0_4_;
        fVar337 = auVar19._0_4_;
        fVar273 = auVar21._4_4_;
        fVar151 = auVar19._4_4_;
        auVar50._4_4_ = fVar151 * fVar273;
        auVar50._0_4_ = fVar337 * fVar251;
        fVar290 = auVar21._8_4_;
        fVar173 = auVar19._8_4_;
        auVar50._8_4_ = fVar173 * fVar290;
        fVar299 = auVar21._12_4_;
        fVar176 = auVar19._12_4_;
        auVar50._12_4_ = fVar176 * fVar299;
        fVar368 = auVar21._16_4_;
        fVar179 = auVar19._16_4_;
        auVar50._16_4_ = fVar179 * fVar368;
        fVar370 = auVar21._20_4_;
        fVar181 = auVar19._20_4_;
        auVar50._20_4_ = fVar181 * fVar370;
        fVar175 = auVar21._24_4_;
        fVar183 = auVar19._24_4_;
        uVar338 = auVar156._28_4_;
        auVar50._24_4_ = fVar183 * fVar175;
        auVar50._28_4_ = uVar338;
        auVar21 = vsubps_avx(auVar50,auVar49);
        fVar259 = auVar20._0_4_;
        fVar275 = auVar20._4_4_;
        auVar51._4_4_ = fVar151 * fVar275;
        auVar51._0_4_ = fVar337 * fVar259;
        fVar292 = auVar20._8_4_;
        auVar51._8_4_ = fVar173 * fVar292;
        fVar366 = auVar20._12_4_;
        auVar51._12_4_ = fVar176 * fVar366;
        fVar298 = auVar20._16_4_;
        auVar51._16_4_ = fVar179 * fVar298;
        fVar373 = auVar20._20_4_;
        auVar51._20_4_ = fVar181 * fVar373;
        fVar178 = auVar20._24_4_;
        auVar51._24_4_ = fVar183 * fVar178;
        auVar51._28_4_ = uVar338;
        fVar261 = auVar26._0_4_;
        fVar276 = auVar26._4_4_;
        auVar52._4_4_ = fVar215 * fVar276;
        auVar52._0_4_ = fVar184 * fVar261;
        fVar294 = auVar26._8_4_;
        auVar52._8_4_ = fVar248 * fVar294;
        fVar253 = auVar26._12_4_;
        auVar52._12_4_ = fVar250 * fVar253;
        fVar369 = auVar26._16_4_;
        auVar52._16_4_ = fVar252 * fVar369;
        fVar372 = auVar26._20_4_;
        auVar52._20_4_ = fVar255 * fVar372;
        fVar180 = auVar26._24_4_;
        auVar52._24_4_ = fVar257 * fVar180;
        auVar52._28_4_ = auVar395._28_4_;
        auVar28 = vsubps_avx(auVar52,auVar51);
        auVar53._4_4_ = fVar273 * fVar276;
        auVar53._0_4_ = fVar251 * fVar261;
        auVar53._8_4_ = fVar290 * fVar294;
        auVar53._12_4_ = fVar299 * fVar253;
        auVar53._16_4_ = fVar368 * fVar369;
        auVar53._20_4_ = fVar370 * fVar372;
        auVar53._24_4_ = fVar175 * fVar180;
        auVar53._28_4_ = uVar338;
        auVar401._0_4_ = fVar259 * fVar234;
        auVar401._4_4_ = fVar275 * fVar272;
        auVar401._8_4_ = fVar292 * fVar278;
        auVar401._12_4_ = fVar366 * fVar297;
        auVar401._16_4_ = fVar298 * fVar258;
        auVar401._20_4_ = fVar373 * fVar371;
        auVar401._24_4_ = fVar178 * fVar172;
        auVar401._28_4_ = 0;
        auVar156 = vsubps_avx(auVar401,auVar53);
        auVar193 = vsubps_avx(auVar22,auVar25);
        fVar271 = auVar156._28_4_ + auVar28._28_4_;
        auVar195._0_4_ = auVar156._0_4_ + auVar28._0_4_ * 0.0 + auVar21._0_4_ * 0.0;
        auVar195._4_4_ = auVar156._4_4_ + auVar28._4_4_ * 0.0 + auVar21._4_4_ * 0.0;
        auVar195._8_4_ = auVar156._8_4_ + auVar28._8_4_ * 0.0 + auVar21._8_4_ * 0.0;
        auVar195._12_4_ = auVar156._12_4_ + auVar28._12_4_ * 0.0 + auVar21._12_4_ * 0.0;
        auVar195._16_4_ = auVar156._16_4_ + auVar28._16_4_ * 0.0 + auVar21._16_4_ * 0.0;
        auVar195._20_4_ = auVar156._20_4_ + auVar28._20_4_ * 0.0 + auVar21._20_4_ * 0.0;
        auVar195._24_4_ = auVar156._24_4_ + auVar28._24_4_ * 0.0 + auVar21._24_4_ * 0.0;
        auVar195._28_4_ = fVar271 + auVar21._28_4_;
        fVar260 = auVar192._0_4_;
        fVar315 = auVar192._4_4_;
        auVar54._4_4_ = fVar315 * auVar25._4_4_;
        auVar54._0_4_ = fVar260 * auVar25._0_4_;
        fVar324 = auVar192._8_4_;
        auVar54._8_4_ = fVar324 * auVar25._8_4_;
        fVar325 = auVar192._12_4_;
        auVar54._12_4_ = fVar325 * auVar25._12_4_;
        fVar332 = auVar192._16_4_;
        auVar54._16_4_ = fVar332 * auVar25._16_4_;
        fVar333 = auVar192._20_4_;
        auVar54._20_4_ = fVar333 * auVar25._20_4_;
        fVar334 = auVar192._24_4_;
        auVar54._24_4_ = fVar334 * auVar25._24_4_;
        auVar54._28_4_ = fVar271;
        fVar271 = auVar193._0_4_;
        fVar277 = auVar193._4_4_;
        auVar55._4_4_ = auVar24._4_4_ * fVar277;
        auVar55._0_4_ = auVar24._0_4_ * fVar271;
        fVar296 = auVar193._8_4_;
        auVar55._8_4_ = auVar24._8_4_ * fVar296;
        fVar367 = auVar193._12_4_;
        auVar55._12_4_ = auVar24._12_4_ * fVar367;
        fVar361 = auVar193._16_4_;
        auVar55._16_4_ = auVar24._16_4_ * fVar361;
        fVar362 = auVar193._20_4_;
        auVar55._20_4_ = auVar24._20_4_ * fVar362;
        fVar182 = auVar193._24_4_;
        auVar55._24_4_ = auVar24._24_4_ * fVar182;
        auVar55._28_4_ = auVar156._28_4_;
        auVar28 = vsubps_avx(auVar55,auVar54);
        auVar156 = vsubps_avx(auVar20,auVar23);
        fVar185 = auVar156._0_4_;
        fVar186 = auVar156._4_4_;
        auVar56._4_4_ = fVar186 * auVar25._4_4_;
        auVar56._0_4_ = fVar185 * auVar25._0_4_;
        fVar217 = auVar156._8_4_;
        auVar56._8_4_ = fVar217 * auVar25._8_4_;
        fVar229 = auVar156._12_4_;
        auVar56._12_4_ = fVar229 * auVar25._12_4_;
        fVar230 = auVar156._16_4_;
        auVar56._16_4_ = fVar230 * auVar25._16_4_;
        fVar231 = auVar156._20_4_;
        auVar56._20_4_ = fVar231 * auVar25._20_4_;
        fVar232 = auVar156._24_4_;
        auVar56._24_4_ = fVar232 * auVar25._24_4_;
        auVar56._28_4_ = auVar25._28_4_;
        auVar57._4_4_ = auVar23._4_4_ * fVar277;
        auVar57._0_4_ = auVar23._0_4_ * fVar271;
        auVar57._8_4_ = auVar23._8_4_ * fVar296;
        auVar57._12_4_ = auVar23._12_4_ * fVar367;
        auVar57._16_4_ = auVar23._16_4_ * fVar361;
        auVar57._20_4_ = auVar23._20_4_ * fVar362;
        auVar57._24_4_ = auVar23._24_4_ * fVar182;
        auVar57._28_4_ = auVar21._28_4_;
        auVar21 = vsubps_avx(auVar56,auVar57);
        auVar58._4_4_ = auVar24._4_4_ * fVar186;
        auVar58._0_4_ = auVar24._0_4_ * fVar185;
        auVar58._8_4_ = auVar24._8_4_ * fVar217;
        auVar58._12_4_ = auVar24._12_4_ * fVar229;
        auVar58._16_4_ = auVar24._16_4_ * fVar230;
        auVar58._20_4_ = auVar24._20_4_ * fVar231;
        auVar58._24_4_ = auVar24._24_4_ * fVar232;
        auVar58._28_4_ = auVar25._28_4_;
        auVar59._4_4_ = auVar23._4_4_ * fVar315;
        auVar59._0_4_ = auVar23._0_4_ * fVar260;
        auVar59._8_4_ = auVar23._8_4_ * fVar324;
        auVar59._12_4_ = auVar23._12_4_ * fVar325;
        auVar59._16_4_ = auVar23._16_4_ * fVar332;
        auVar59._20_4_ = auVar23._20_4_ * fVar333;
        auVar59._24_4_ = auVar23._24_4_ * fVar334;
        auVar59._28_4_ = auVar23._28_4_;
        auVar23 = vsubps_avx(auVar59,auVar58);
        auVar365 = ZEXT864(0) << 0x20;
        auVar267._0_4_ = auVar28._0_4_ * 0.0 + auVar23._0_4_ + auVar21._0_4_ * 0.0;
        auVar267._4_4_ = auVar28._4_4_ * 0.0 + auVar23._4_4_ + auVar21._4_4_ * 0.0;
        auVar267._8_4_ = auVar28._8_4_ * 0.0 + auVar23._8_4_ + auVar21._8_4_ * 0.0;
        auVar267._12_4_ = auVar28._12_4_ * 0.0 + auVar23._12_4_ + auVar21._12_4_ * 0.0;
        auVar267._16_4_ = auVar28._16_4_ * 0.0 + auVar23._16_4_ + auVar21._16_4_ * 0.0;
        auVar267._20_4_ = auVar28._20_4_ * 0.0 + auVar23._20_4_ + auVar21._20_4_ * 0.0;
        auVar267._24_4_ = auVar28._24_4_ * 0.0 + auVar23._24_4_ + auVar21._24_4_ * 0.0;
        auVar267._28_4_ = auVar23._28_4_ + auVar23._28_4_ + auVar21._28_4_;
        auVar21 = vmaxps_avx(auVar195,auVar267);
        auVar21 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,2);
        auVar211 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
        auVar237 = vpand_avx(auVar211,auVar237);
        auVar211 = vpmovsxwd_avx(auVar237);
        auVar236 = vpunpckhwd_avx(auVar237,auVar237);
        auVar243._16_16_ = auVar236;
        auVar243._0_16_ = auVar211;
        if ((((((((auVar243 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar243 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar243 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar243 >> 0x7f,0) == '\0') &&
              (auVar243 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar236 >> 0x3f,0) == '\0') &&
            (auVar243 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar236[0xf]) {
LAB_01193abc:
          auVar345 = ZEXT3264(auVar340);
          auVar331 = ZEXT3264(auVar154);
          auVar270 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
          auVar246 = ZEXT3264(auVar243);
          auVar378._4_4_ = fVar207;
          auVar378._0_4_ = fVar187;
          auVar378._8_4_ = fVar208;
          auVar378._12_4_ = fVar209;
          auVar378._16_4_ = fVar210;
          auVar378._20_4_ = fVar212;
          auVar378._24_4_ = fVar213;
          auVar378._28_4_ = fVar214;
        }
        else {
          auVar60._4_4_ = fVar277 * fVar272;
          auVar60._0_4_ = fVar271 * fVar234;
          auVar60._8_4_ = fVar296 * fVar278;
          auVar60._12_4_ = fVar367 * fVar297;
          auVar60._16_4_ = fVar361 * fVar258;
          auVar60._20_4_ = fVar362 * fVar371;
          auVar60._24_4_ = fVar182 * fVar172;
          auVar60._28_4_ = auVar236._12_4_;
          auVar376._0_4_ = fVar260 * fVar337;
          auVar376._4_4_ = fVar315 * fVar151;
          auVar376._8_4_ = fVar324 * fVar173;
          auVar376._12_4_ = fVar325 * fVar176;
          auVar376._16_4_ = fVar332 * fVar179;
          auVar376._20_4_ = fVar333 * fVar181;
          auVar376._24_4_ = fVar334 * fVar183;
          auVar376._28_4_ = 0;
          auVar21 = vsubps_avx(auVar376,auVar60);
          auVar61._4_4_ = fVar186 * fVar151;
          auVar61._0_4_ = fVar185 * fVar337;
          auVar61._8_4_ = fVar217 * fVar173;
          auVar61._12_4_ = fVar229 * fVar176;
          auVar61._16_4_ = fVar230 * fVar179;
          auVar61._20_4_ = fVar231 * fVar181;
          auVar61._24_4_ = fVar232 * fVar183;
          auVar61._28_4_ = auVar19._28_4_;
          auVar62._4_4_ = fVar277 * fVar276;
          auVar62._0_4_ = fVar271 * fVar261;
          auVar62._8_4_ = fVar296 * fVar294;
          auVar62._12_4_ = fVar367 * fVar253;
          auVar62._16_4_ = fVar361 * fVar369;
          auVar62._20_4_ = fVar362 * fVar372;
          auVar62._24_4_ = fVar182 * fVar180;
          auVar62._28_4_ = auVar193._28_4_;
          auVar24 = vsubps_avx(auVar62,auVar61);
          auVar63._4_4_ = fVar315 * fVar276;
          auVar63._0_4_ = fVar260 * fVar261;
          auVar63._8_4_ = fVar324 * fVar294;
          auVar63._12_4_ = fVar325 * fVar253;
          auVar63._16_4_ = fVar332 * fVar369;
          auVar63._20_4_ = fVar333 * fVar372;
          auVar63._24_4_ = fVar334 * fVar180;
          auVar63._28_4_ = auVar195._28_4_;
          auVar64._4_4_ = fVar186 * fVar272;
          auVar64._0_4_ = fVar185 * fVar234;
          auVar64._8_4_ = fVar217 * fVar278;
          auVar64._12_4_ = fVar229 * fVar297;
          auVar64._16_4_ = fVar230 * fVar258;
          auVar64._20_4_ = fVar231 * fVar371;
          auVar64._24_4_ = fVar232 * fVar172;
          auVar64._28_4_ = auVar191._28_4_;
          auVar25 = vsubps_avx(auVar64,auVar63);
          auVar323._0_4_ = auVar21._0_4_ * 0.0 + auVar25._0_4_ + auVar24._0_4_ * 0.0;
          auVar323._4_4_ = auVar21._4_4_ * 0.0 + auVar25._4_4_ + auVar24._4_4_ * 0.0;
          auVar323._8_4_ = auVar21._8_4_ * 0.0 + auVar25._8_4_ + auVar24._8_4_ * 0.0;
          auVar323._12_4_ = auVar21._12_4_ * 0.0 + auVar25._12_4_ + auVar24._12_4_ * 0.0;
          auVar323._16_4_ = auVar21._16_4_ * 0.0 + auVar25._16_4_ + auVar24._16_4_ * 0.0;
          auVar323._20_4_ = auVar21._20_4_ * 0.0 + auVar25._20_4_ + auVar24._20_4_ * 0.0;
          auVar323._24_4_ = auVar21._24_4_ * 0.0 + auVar25._24_4_ + auVar24._24_4_ * 0.0;
          auVar323._28_4_ = auVar191._28_4_ + auVar25._28_4_ + auVar195._28_4_;
          auVar23 = vrcpps_avx(auVar323);
          fVar234 = auVar23._0_4_;
          fVar261 = auVar23._4_4_;
          auVar65._4_4_ = auVar323._4_4_ * fVar261;
          auVar65._0_4_ = auVar323._0_4_ * fVar234;
          fVar271 = auVar23._8_4_;
          auVar65._8_4_ = auVar323._8_4_ * fVar271;
          fVar272 = auVar23._12_4_;
          auVar65._12_4_ = auVar323._12_4_ * fVar272;
          fVar276 = auVar23._16_4_;
          auVar65._16_4_ = auVar323._16_4_ * fVar276;
          fVar277 = auVar23._20_4_;
          auVar65._20_4_ = auVar323._20_4_ * fVar277;
          fVar278 = auVar23._24_4_;
          auVar65._24_4_ = auVar323._24_4_ * fVar278;
          auVar65._28_4_ = auVar193._28_4_;
          auVar377._8_4_ = 0x3f800000;
          auVar377._0_8_ = &DAT_3f8000003f800000;
          auVar377._12_4_ = 0x3f800000;
          auVar377._16_4_ = 0x3f800000;
          auVar377._20_4_ = 0x3f800000;
          auVar377._24_4_ = 0x3f800000;
          auVar377._28_4_ = 0x3f800000;
          auVar28 = vsubps_avx(auVar377,auVar65);
          fVar234 = auVar28._0_4_ * fVar234 + fVar234;
          fVar261 = auVar28._4_4_ * fVar261 + fVar261;
          fVar271 = auVar28._8_4_ * fVar271 + fVar271;
          fVar272 = auVar28._12_4_ * fVar272 + fVar272;
          fVar276 = auVar28._16_4_ * fVar276 + fVar276;
          fVar277 = auVar28._20_4_ * fVar277 + fVar277;
          fVar278 = auVar28._24_4_ * fVar278 + fVar278;
          auVar66._4_4_ =
               (auVar21._4_4_ * fVar275 + auVar24._4_4_ * fVar273 + auVar25._4_4_ * fVar215) *
               fVar261;
          auVar66._0_4_ =
               (auVar21._0_4_ * fVar259 + auVar24._0_4_ * fVar251 + auVar25._0_4_ * fVar184) *
               fVar234;
          auVar66._8_4_ =
               (auVar21._8_4_ * fVar292 + auVar24._8_4_ * fVar290 + auVar25._8_4_ * fVar248) *
               fVar271;
          auVar66._12_4_ =
               (auVar21._12_4_ * fVar366 + auVar24._12_4_ * fVar299 + auVar25._12_4_ * fVar250) *
               fVar272;
          auVar66._16_4_ =
               (auVar21._16_4_ * fVar298 + auVar24._16_4_ * fVar368 + auVar25._16_4_ * fVar252) *
               fVar276;
          auVar66._20_4_ =
               (auVar21._20_4_ * fVar373 + auVar24._20_4_ * fVar370 + auVar25._20_4_ * fVar255) *
               fVar277;
          auVar66._24_4_ =
               (auVar21._24_4_ * fVar178 + auVar24._24_4_ * fVar175 + auVar25._24_4_ * fVar257) *
               fVar278;
          auVar66._28_4_ = auVar20._28_4_ + auVar26._28_4_ + auVar22._28_4_;
          auVar211 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
          auVar244._16_16_ = auVar211;
          auVar244._0_16_ = auVar211;
          auVar20 = vcmpps_avx(auVar244,auVar66,2);
          uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar286._4_4_ = uVar338;
          auVar286._0_4_ = uVar338;
          auVar286._8_4_ = uVar338;
          auVar286._12_4_ = uVar338;
          auVar286._16_4_ = uVar338;
          auVar286._20_4_ = uVar338;
          auVar286._24_4_ = uVar338;
          auVar286._28_4_ = uVar338;
          auVar21 = vcmpps_avx(auVar66,auVar286,2);
          auVar20 = vandps_avx(auVar21,auVar20);
          auVar211 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
          auVar237 = vpand_avx(auVar237,auVar211);
          auVar211 = vpmovsxwd_avx(auVar237);
          auVar236 = vpshufd_avx(auVar237,0xee);
          auVar236 = vpmovsxwd_avx(auVar236);
          auVar243._16_16_ = auVar236;
          auVar243._0_16_ = auVar211;
          auVar331 = ZEXT3264(auVar154);
          auVar345 = ZEXT3264(auVar340);
          if ((((((((auVar243 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar243 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar243 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar243 >> 0x7f,0) == '\0') &&
                (auVar243 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar236 >> 0x3f,0) == '\0') &&
              (auVar243 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar236[0xf]) goto LAB_01193abc;
          auVar154 = vcmpps_avx(ZEXT832(0) << 0x20,auVar323,4);
          auVar211 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
          auVar237 = vpand_avx(auVar237,auVar211);
          auVar211 = vpmovsxwd_avx(auVar237);
          auVar237 = vpunpckhwd_avx(auVar237,auVar237);
          auVar246 = ZEXT1664(auVar237);
          auVar308._16_16_ = auVar237;
          auVar308._0_16_ = auVar211;
          auVar270 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
          auVar378._4_4_ = fVar207;
          auVar378._0_4_ = fVar187;
          auVar378._8_4_ = fVar208;
          auVar378._12_4_ = fVar209;
          auVar378._16_4_ = fVar210;
          auVar378._20_4_ = fVar212;
          auVar378._24_4_ = fVar213;
          auVar378._28_4_ = fVar214;
          if ((((((((auVar308 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar308 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar308 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar308 >> 0x7f,0) != '\0') ||
                (auVar308 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar237 >> 0x3f,0) != '\0') ||
              (auVar308 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar237[0xf] < '\0') {
            auVar245._0_4_ = auVar195._0_4_ * fVar234;
            auVar245._4_4_ = auVar195._4_4_ * fVar261;
            auVar245._8_4_ = auVar195._8_4_ * fVar271;
            auVar245._12_4_ = auVar195._12_4_ * fVar272;
            auVar245._16_4_ = auVar195._16_4_ * fVar276;
            auVar245._20_4_ = auVar195._20_4_ * fVar277;
            auVar245._24_4_ = auVar195._24_4_ * fVar278;
            auVar245._28_4_ = 0;
            auVar67._4_4_ = auVar267._4_4_ * fVar261;
            auVar67._0_4_ = auVar267._0_4_ * fVar234;
            auVar67._8_4_ = auVar267._8_4_ * fVar271;
            auVar67._12_4_ = auVar267._12_4_ * fVar272;
            auVar67._16_4_ = auVar267._16_4_ * fVar276;
            auVar67._20_4_ = auVar267._20_4_ * fVar277;
            auVar67._24_4_ = auVar267._24_4_ * fVar278;
            auVar67._28_4_ = auVar28._28_4_ + auVar23._28_4_;
            auVar287._8_4_ = 0x3f800000;
            auVar287._0_8_ = &DAT_3f8000003f800000;
            auVar287._12_4_ = 0x3f800000;
            auVar287._16_4_ = 0x3f800000;
            auVar287._20_4_ = 0x3f800000;
            auVar287._24_4_ = 0x3f800000;
            auVar287._28_4_ = 0x3f800000;
            auVar154 = vsubps_avx(auVar287,auVar245);
            auVar154 = vblendvps_avx(auVar154,auVar245,auVar155);
            auVar331 = ZEXT3264(auVar154);
            auVar154 = vsubps_avx(auVar287,auVar67);
            auVar246 = ZEXT3264(auVar154);
            _local_3a0 = vblendvps_avx(auVar154,auVar67,auVar155);
            auVar270 = ZEXT3264(auVar308);
            auVar345 = ZEXT3264(auVar66);
          }
        }
        auVar154 = auVar270._0_32_;
        if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar154 >> 0x7f,0) != '\0') ||
              (auVar270 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar154 >> 0xbf,0) != '\0') ||
            (auVar270 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar270[0x1f] < '\0') {
          auVar340 = vsubps_avx(auVar285,auVar378);
          fVar251 = auVar378._0_4_ + auVar331._0_4_ * auVar340._0_4_;
          fVar259 = auVar378._4_4_ + auVar331._4_4_ * auVar340._4_4_;
          fVar261 = auVar378._8_4_ + auVar331._8_4_ * auVar340._8_4_;
          fVar271 = auVar378._12_4_ + auVar331._12_4_ * auVar340._12_4_;
          fVar272 = auVar378._16_4_ + auVar331._16_4_ * auVar340._16_4_;
          fVar273 = auVar378._20_4_ + auVar331._20_4_ * auVar340._20_4_;
          fVar275 = auVar378._24_4_ + auVar331._24_4_ * auVar340._24_4_;
          fVar276 = auVar378._28_4_ + auVar340._28_4_;
          fVar234 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar68._4_4_ = (fVar259 + fVar259) * fVar234;
          auVar68._0_4_ = (fVar251 + fVar251) * fVar234;
          auVar68._8_4_ = (fVar261 + fVar261) * fVar234;
          auVar68._12_4_ = (fVar271 + fVar271) * fVar234;
          auVar68._16_4_ = (fVar272 + fVar272) * fVar234;
          auVar68._20_4_ = (fVar273 + fVar273) * fVar234;
          auVar68._24_4_ = (fVar275 + fVar275) * fVar234;
          auVar68._28_4_ = fVar276 + fVar276;
          local_6c0 = auVar345._0_32_;
          auVar340 = vcmpps_avx(local_6c0,auVar68,6);
          auVar20 = auVar154 & auVar340;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            local_440 = vandps_avx(auVar340,auVar154);
            local_4e0 = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            fStack_4dc = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            fStack_4d8 = (float)uStack_398 + (float)uStack_398 + -1.0;
            fStack_4d4 = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
            fStack_4d0 = (float)uStack_390 + (float)uStack_390 + -1.0;
            fStack_4cc = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
            fStack_4c8 = (float)uStack_388 + (float)uStack_388 + -1.0;
            fStack_4c4 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
            local_6a0 = auVar331._0_32_;
            local_3a0._4_4_ = fStack_4dc;
            local_3a0._0_4_ = local_4e0;
            uStack_398._0_4_ = fStack_4d8;
            uStack_398._4_4_ = fStack_4d4;
            uStack_390._0_4_ = fStack_4d0;
            uStack_390._4_4_ = fStack_4cc;
            auVar140 = _local_3a0;
            uStack_388._0_4_ = fStack_4c8;
            uStack_388._4_4_ = fStack_4c4;
            auVar154 = _local_3a0;
            local_4a0 = 0;
            local_490 = local_900;
            uStack_488 = uStack_8f8;
            fStack_47c = fStack_8bc;
            fStack_478 = fStack_8b8;
            fStack_474 = fStack_8b4;
            local_470 = local_6f0;
            uStack_468 = local_6f0._8_8_;
            local_460 = local_700;
            uStack_458 = local_700._8_8_;
            auVar270 = ZEXT3264(_local_6e0);
            if ((pGVar144->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_0119285c;
            auVar219._0_4_ = 1.0 / (float)(int)uVar16;
            auVar219._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar237 = vshufps_avx(auVar219,auVar219,0);
            local_420[0] = auVar237._0_4_ * (auVar331._0_4_ + 0.0);
            local_420[1] = auVar237._4_4_ * (auVar331._4_4_ + 1.0);
            local_420[2] = auVar237._8_4_ * (auVar331._8_4_ + 2.0);
            local_420[3] = auVar237._12_4_ * (auVar331._12_4_ + 3.0);
            fStack_410 = auVar237._0_4_ * (auVar331._16_4_ + 4.0);
            fStack_40c = auVar237._4_4_ * (auVar331._20_4_ + 5.0);
            fStack_408 = auVar237._8_4_ * (auVar331._24_4_ + 6.0);
            fStack_404 = auVar331._28_4_ + 7.0;
            uStack_390 = auVar140._16_8_;
            uStack_388 = auVar154._24_8_;
            local_400 = local_3a0;
            uStack_3f8 = uStack_398;
            uStack_3f0 = uStack_390;
            uStack_3e8 = uStack_388;
            local_3e0 = local_6c0;
            auVar196._8_4_ = 0x7f800000;
            auVar196._0_8_ = 0x7f8000007f800000;
            auVar196._12_4_ = 0x7f800000;
            auVar196._16_4_ = 0x7f800000;
            auVar196._20_4_ = 0x7f800000;
            auVar196._24_4_ = 0x7f800000;
            auVar196._28_4_ = 0x7f800000;
            auVar340 = vblendvps_avx(auVar196,local_6c0,local_440);
            auVar20 = vshufps_avx(auVar340,auVar340,0xb1);
            auVar20 = vminps_avx(auVar340,auVar20);
            auVar21 = vshufpd_avx(auVar20,auVar20,5);
            auVar20 = vminps_avx(auVar20,auVar21);
            auVar21 = vperm2f128_avx(auVar20,auVar20,1);
            auVar20 = vminps_avx(auVar20,auVar21);
            auVar20 = vcmpps_avx(auVar340,auVar20,0);
            auVar21 = local_440 & auVar20;
            auVar340 = local_440;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              auVar340 = vandps_avx(auVar20,local_440);
            }
            uVar142 = vmovmskps_avx(auVar340);
            uVar143 = 0;
            if (uVar142 != 0) {
              for (; (uVar142 >> uVar143 & 1) == 0; uVar143 = uVar143 + 1) {
              }
            }
            uVar147 = (ulong)uVar143;
            _local_3a0 = auVar154;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar144->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar234 = local_420[uVar147];
              uVar338 = *(undefined4 *)((long)&local_400 + uVar147 * 4);
              fVar259 = 1.0 - fVar234;
              fVar251 = fVar234 * fVar259 + fVar234 * fVar259;
              auVar237 = ZEXT416((uint)(fVar234 * fVar234 * 3.0));
              auVar237 = vshufps_avx(auVar237,auVar237,0);
              auVar211 = ZEXT416((uint)((fVar251 - fVar234 * fVar234) * 3.0));
              auVar211 = vshufps_avx(auVar211,auVar211,0);
              auVar236 = ZEXT416((uint)((fVar259 * fVar259 - fVar251) * 3.0));
              auVar236 = vshufps_avx(auVar236,auVar236,0);
              auVar223 = ZEXT416((uint)(fVar259 * fVar259 * -3.0));
              auVar223 = vshufps_avx(auVar223,auVar223,0);
              auVar220._0_4_ =
                   auVar223._0_4_ * fVar247 +
                   local_8c0 * auVar236._0_4_ +
                   (float)local_700._0_4_ * auVar237._0_4_ + (float)local_6f0._0_4_ * auVar211._0_4_
              ;
              auVar220._4_4_ =
                   auVar223._4_4_ * fVar249 +
                   fStack_8bc * auVar236._4_4_ +
                   (float)local_700._4_4_ * auVar237._4_4_ + (float)local_6f0._4_4_ * auVar211._4_4_
              ;
              auVar220._8_4_ =
                   auVar223._8_4_ * fVar254 +
                   fStack_8b8 * auVar236._8_4_ +
                   (float)uStack_6f8 * auVar237._8_4_ + (float)uStack_6e8 * auVar211._8_4_;
              auVar220._12_4_ =
                   auVar223._12_4_ * fVar256 +
                   fStack_8b4 * auVar236._12_4_ +
                   uStack_6f8._4_4_ * auVar237._12_4_ + uStack_6e8._4_4_ * auVar211._12_4_;
              auVar246 = ZEXT464(*(uint *)(local_3e0 + uVar147 * 4));
              *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3e0 + uVar147 * 4);
              *(float *)(ray + k * 4 + 0x180) = auVar220._0_4_;
              uVar17 = vextractps_avx(auVar220,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar17;
              uVar17 = vextractps_avx(auVar220,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar17;
              *(float *)(ray + k * 4 + 0x1e0) = fVar234;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar338;
              *(uint *)(ray + k * 4 + 0x220) = uVar145;
              *(uint *)(ray + k * 4 + 0x240) = uVar141;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              auVar237 = vshufps_avx(ZEXT416(uVar141),ZEXT416(uVar141),0);
              auStack_730 = auVar237;
              _local_740 = auVar237;
              auVar237 = vshufps_avx(ZEXT416(uVar145),ZEXT416(uVar145),0);
              _uStack_830 = auVar237;
              _local_840 = auVar237;
              _auStack_850 = auVar241._16_16_;
              _local_860 = auVar27;
              local_760 = (float)local_6f0._0_4_;
              fStack_75c = (float)local_6f0._4_4_;
              fStack_758 = (float)uStack_6e8;
              fStack_754 = uStack_6e8._4_4_;
              local_780 = (float)local_700._0_4_;
              fStack_77c = (float)local_700._4_4_;
              fStack_778 = (float)uStack_6f8;
              fStack_774 = uStack_6f8._4_4_;
              uStack_790 = *local_7b8;
              _local_7a0 = *local_7b0;
              uStack_788 = local_7b8[1];
              local_5e0 = local_440;
              local_500 = local_6a0;
              local_4c0 = local_6c0;
              local_49c = uVar16;
              local_480 = local_8c0;
              _local_320 = auVar11;
              do {
                uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_1e0 = local_420[uVar147];
                local_1c0 = *(undefined4 *)((long)&local_400 + uVar147 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3e0 + uVar147 * 4);
                fVar251 = 1.0 - local_1e0;
                fVar234 = local_1e0 * fVar251 + local_1e0 * fVar251;
                auVar237 = ZEXT416((uint)(local_1e0 * local_1e0 * 3.0));
                auVar237 = vshufps_avx(auVar237,auVar237,0);
                auVar211 = ZEXT416((uint)((fVar234 - local_1e0 * local_1e0) * 3.0));
                auVar211 = vshufps_avx(auVar211,auVar211,0);
                auVar236 = ZEXT416((uint)((fVar251 * fVar251 - fVar234) * 3.0));
                auVar236 = vshufps_avx(auVar236,auVar236,0);
                local_8b0.context = context->user;
                auVar223 = ZEXT416((uint)(fVar251 * fVar251 * -3.0));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar224._0_4_ =
                     auVar223._0_4_ * fVar247 +
                     auVar236._0_4_ * (float)local_860._0_4_ +
                     auVar237._0_4_ * local_780 + auVar211._0_4_ * local_760;
                auVar224._4_4_ =
                     auVar223._4_4_ * fVar249 +
                     auVar236._4_4_ * (float)local_860._4_4_ +
                     auVar237._4_4_ * fStack_77c + auVar211._4_4_ * fStack_75c;
                auVar224._8_4_ =
                     auVar223._8_4_ * fVar254 +
                     auVar236._8_4_ * (float)uStack_858 +
                     auVar237._8_4_ * fStack_778 + auVar211._8_4_ * fStack_758;
                auVar224._12_4_ =
                     auVar223._12_4_ * fVar256 +
                     auVar236._12_4_ * uStack_858._4_4_ +
                     auVar237._12_4_ * fStack_774 + auVar211._12_4_ * fStack_754;
                auStack_230 = vshufps_avx(auVar224,auVar224,0);
                local_240[0] = (RTCHitN)auStack_230[0];
                local_240[1] = (RTCHitN)auStack_230[1];
                local_240[2] = (RTCHitN)auStack_230[2];
                local_240[3] = (RTCHitN)auStack_230[3];
                local_240[4] = (RTCHitN)auStack_230[4];
                local_240[5] = (RTCHitN)auStack_230[5];
                local_240[6] = (RTCHitN)auStack_230[6];
                local_240[7] = (RTCHitN)auStack_230[7];
                local_240[8] = (RTCHitN)auStack_230[8];
                local_240[9] = (RTCHitN)auStack_230[9];
                local_240[10] = (RTCHitN)auStack_230[10];
                local_240[0xb] = (RTCHitN)auStack_230[0xb];
                local_240[0xc] = (RTCHitN)auStack_230[0xc];
                local_240[0xd] = (RTCHitN)auStack_230[0xd];
                local_240[0xe] = (RTCHitN)auStack_230[0xe];
                local_240[0xf] = (RTCHitN)auStack_230[0xf];
                auStack_210 = vshufps_avx(auVar224,auVar224,0x55);
                auVar246 = ZEXT1664(auStack_210);
                local_220 = auStack_210;
                auStack_1f0 = vshufps_avx(auVar224,auVar224,0xaa);
                local_200 = auStack_1f0;
                fStack_1dc = local_1e0;
                fStack_1d8 = local_1e0;
                fStack_1d4 = local_1e0;
                fStack_1d0 = local_1e0;
                fStack_1cc = local_1e0;
                fStack_1c8 = local_1e0;
                fStack_1c4 = local_1e0;
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_1a0 = local_840;
                uStack_198 = uStack_838;
                uStack_190 = uStack_830;
                uStack_188 = uStack_828;
                local_180 = local_740;
                uStack_178 = uStack_738;
                uStack_170 = auStack_730._0_8_;
                uStack_168 = auStack_730._8_8_;
                _local_820 = vcmpps_avx(auVar365._0_32_,auVar365._0_32_,0xf);
                local_7a8[1] = _local_820;
                *local_7a8 = _local_820;
                local_160 = (local_8b0.context)->instID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_140 = (local_8b0.context)->instPrimID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_7e0 = local_7a0;
                uStack_7d8 = uStack_798;
                uStack_7d0 = uStack_790;
                uStack_7c8 = uStack_788;
                local_8b0.valid = (int *)&local_7e0;
                local_8b0.geometryUserPtr = pGVar144->userPtr;
                local_8b0.hit = local_240;
                local_8b0.N = 8;
                local_8b0.ray = (RTCRayN *)ray;
                if (pGVar144->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar246 = ZEXT1664(auStack_210);
                  (*pGVar144->intersectionFilterN)(&local_8b0);
                  auVar345 = ZEXT3264(local_6c0);
                  auVar331 = ZEXT3264(local_6a0);
                  auVar365 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar124._8_8_ = uStack_7d8;
                auVar124._0_8_ = local_7e0;
                auVar237 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar124);
                auVar128._8_8_ = uStack_7c8;
                auVar128._0_8_ = uStack_7d0;
                auVar211 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar128);
                auVar167._16_16_ = auVar211;
                auVar167._0_16_ = auVar237;
                auVar154 = _local_820 & ~auVar167;
                if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar154 >> 0x7f,0) == '\0') &&
                      (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar154 >> 0xbf,0) == '\0') &&
                    (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar154[0x1f]) {
                  auVar168._0_4_ = auVar237._0_4_ ^ local_820._0_4_;
                  auVar168._4_4_ = auVar237._4_4_ ^ local_820._4_4_;
                  auVar168._8_4_ = auVar237._8_4_ ^ local_820._8_4_;
                  auVar168._12_4_ = auVar237._12_4_ ^ local_820._12_4_;
                  auVar168._16_4_ = auVar211._0_4_ ^ local_820._16_4_;
                  auVar168._20_4_ = auVar211._4_4_ ^ local_820._20_4_;
                  auVar168._24_4_ = auVar211._8_4_ ^ local_820._24_4_;
                  auVar168._28_4_ = auVar211._12_4_ ^ local_820._28_4_;
                }
                else {
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar144->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar246 = ZEXT1664(auVar246._0_16_);
                    (*p_Var18)(&local_8b0);
                    auVar345 = ZEXT3264(local_6c0);
                    auVar331 = ZEXT3264(local_6a0);
                    auVar365 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar125._8_8_ = uStack_7d8;
                  auVar125._0_8_ = local_7e0;
                  auVar237 = vpcmpeqd_avx((undefined1  [16])0x0,auVar125);
                  auVar129._8_8_ = uStack_7c8;
                  auVar129._0_8_ = uStack_7d0;
                  auVar211 = vpcmpeqd_avx((undefined1  [16])0x0,auVar129);
                  auVar205._16_16_ = auVar211;
                  auVar205._0_16_ = auVar237;
                  auVar168._0_4_ = auVar237._0_4_ ^ local_820._0_4_;
                  auVar168._4_4_ = auVar237._4_4_ ^ local_820._4_4_;
                  auVar168._8_4_ = auVar237._8_4_ ^ local_820._8_4_;
                  auVar168._12_4_ = auVar237._12_4_ ^ local_820._12_4_;
                  auVar168._16_4_ = auVar211._0_4_ ^ local_820._16_4_;
                  auVar168._20_4_ = auVar211._4_4_ ^ local_820._20_4_;
                  auVar168._24_4_ = auVar211._8_4_ ^ local_820._24_4_;
                  auVar168._28_4_ = auVar211._12_4_ ^ local_820._28_4_;
                  _local_820 = _local_820 & ~auVar205;
                  if ((((((((_local_820 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (_local_820 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (_local_820 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(_local_820 >> 0x7f,0) != '\0') ||
                        (_local_820 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(_local_820 >> 0xbf,0) != '\0') ||
                      (_local_820 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      local_820[0x1f] < '\0') {
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])local_8b0.hit);
                    *(undefined1 (*) [32])(local_8b0.ray + 0x180) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_8b0.ray + 0x1a0) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_8b0.ray + 0x1c0) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_8b0.ray + 0x1e0) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_8b0.ray + 0x200) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_8b0.ray + 0x220) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_8b0.ray + 0x240) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_8b0.ray + 0x260) = auVar154;
                    auVar154 = vmaskmovps_avx(auVar168,*(undefined1 (*) [32])(local_8b0.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_8b0.ray + 0x280) = auVar154;
                  }
                }
                if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar168 >> 0x7f,0) == '\0') &&
                      (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar168 >> 0xbf,0) == '\0') &&
                    (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar168[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar338;
                }
                *(undefined4 *)(local_5e0 + uVar147 * 4) = 0;
                uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar169._4_4_ = uVar338;
                auVar169._0_4_ = uVar338;
                auVar169._8_4_ = uVar338;
                auVar169._12_4_ = uVar338;
                auVar169._16_4_ = uVar338;
                auVar169._20_4_ = uVar338;
                auVar169._24_4_ = uVar338;
                auVar169._28_4_ = uVar338;
                auVar340 = vcmpps_avx(auVar345._0_32_,auVar169,2);
                auVar154 = vandps_avx(auVar340,local_5e0);
                local_5e0 = local_5e0 & auVar340;
                bVar118 = (local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar119 = (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar117 = (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar116 = SUB321(local_5e0 >> 0x7f,0) != '\0';
                bVar115 = (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar114 = SUB321(local_5e0 >> 0xbf,0) != '\0';
                bVar113 = (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar112 = local_5e0[0x1f] < '\0';
                if (((((((bVar118 || bVar119) || bVar117) || bVar116) || bVar115) || bVar114) ||
                    bVar113) || bVar112) {
                  auVar206._8_4_ = 0x7f800000;
                  auVar206._0_8_ = 0x7f8000007f800000;
                  auVar206._12_4_ = 0x7f800000;
                  auVar206._16_4_ = 0x7f800000;
                  auVar206._20_4_ = 0x7f800000;
                  auVar206._24_4_ = 0x7f800000;
                  auVar206._28_4_ = 0x7f800000;
                  auVar340 = vblendvps_avx(auVar206,auVar345._0_32_,auVar154);
                  auVar20 = vshufps_avx(auVar340,auVar340,0xb1);
                  auVar20 = vminps_avx(auVar340,auVar20);
                  auVar21 = vshufpd_avx(auVar20,auVar20,5);
                  auVar20 = vminps_avx(auVar20,auVar21);
                  auVar21 = vperm2f128_avx(auVar20,auVar20,1);
                  auVar246 = ZEXT3264(auVar21);
                  auVar20 = vminps_avx(auVar20,auVar21);
                  auVar20 = vcmpps_avx(auVar340,auVar20,0);
                  auVar21 = auVar154 & auVar20;
                  auVar340 = auVar154;
                  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar21 >> 0x7f,0) != '\0') ||
                        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar21 >> 0xbf,0) != '\0') ||
                      (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar21[0x1f] < '\0') {
                    auVar340 = vandps_avx(auVar20,auVar154);
                  }
                  uVar142 = vmovmskps_avx(auVar340);
                  uVar143 = 0;
                  if (uVar142 != 0) {
                    for (; (uVar142 >> uVar143 & 1) == 0; uVar143 = uVar143 + 1) {
                    }
                  }
                  uVar147 = (ulong)uVar143;
                }
                local_5e0 = auVar154;
              } while (((((((bVar118 || bVar119) || bVar117) || bVar116) || bVar115) || bVar114) ||
                       bVar113) || bVar112);
            }
          }
        }
        auVar270 = ZEXT3264(_local_6e0);
      }
LAB_0119285c:
      auVar365 = ZEXT3264(local_660);
      if (8 < (int)uVar16) {
        _local_6e0 = auVar270._0_32_;
        _local_320 = vpshufd_avx(ZEXT416(uVar16),0);
        auVar237 = vshufps_avx(local_800._0_16_,local_800._0_16_,0);
        local_340._16_16_ = auVar237;
        local_340._0_16_ = auVar237;
        auVar237 = vpermilps_avx(local_880._0_16_,0);
        register0x00001210 = auVar237;
        _local_360 = auVar237;
        auVar153._0_4_ = 1.0 / (float)local_560._0_4_;
        auVar153._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar237 = vshufps_avx(auVar153,auVar153,0);
        register0x00001210 = auVar237;
        _local_380 = auVar237;
        auVar237 = vshufps_avx(ZEXT416(uVar141),ZEXT416(uVar141),0);
        local_100._16_16_ = auVar237;
        local_100._0_16_ = auVar237;
        auVar237 = vshufps_avx(ZEXT416(uVar145),ZEXT416(uVar145),0);
        local_120._16_16_ = auVar237;
        local_120._0_16_ = auVar237;
        auVar170 = ZEXT3264(local_120);
        lVar148 = 8;
        local_6a0 = auVar331._0_32_;
        local_6c0 = auVar345._0_32_;
        fVar234 = (float)local_680._0_4_;
        fVar251 = (float)local_680._4_4_;
        fVar259 = fStack_678;
        fVar261 = fStack_674;
        fVar271 = fStack_670;
        fVar272 = fStack_66c;
        fVar273 = fStack_668;
        fVar275 = fStack_664;
        fVar276 = (float)local_720._0_4_;
        fVar277 = (float)local_720._4_4_;
        fVar278 = fStack_718;
        fVar290 = fStack_714;
        fVar292 = fStack_710;
        fVar294 = fStack_70c;
        fVar296 = fStack_708;
        do {
          pauVar2 = (undefined1 (*) [28])(bezier_basis0 + lVar148 * 4 + lVar146);
          fVar297 = *(float *)*pauVar2;
          fVar299 = *(float *)(*pauVar2 + 4);
          fVar366 = *(float *)(*pauVar2 + 8);
          fVar253 = *(float *)(*pauVar2 + 0xc);
          fVar367 = *(float *)(*pauVar2 + 0x10);
          fVar258 = *(float *)(*pauVar2 + 0x14);
          fVar368 = *(float *)(*pauVar2 + 0x18);
          auVar138 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar146 + 0x2227768 + lVar148 * 4);
          fVar298 = *(float *)*pauVar2;
          fVar369 = *(float *)(*pauVar2 + 4);
          fVar361 = *(float *)(*pauVar2 + 8);
          fVar371 = *(float *)(*pauVar2 + 0xc);
          fVar370 = *(float *)(*pauVar2 + 0x10);
          fVar373 = *(float *)(*pauVar2 + 0x14);
          fVar372 = *(float *)(*pauVar2 + 0x18);
          auVar137 = *pauVar2;
          pfVar3 = (float *)(lVar146 + 0x2227bec + lVar148 * 4);
          fVar362 = *pfVar3;
          fVar172 = pfVar3[1];
          fVar175 = pfVar3[2];
          fVar178 = pfVar3[3];
          fVar180 = pfVar3[4];
          fVar182 = pfVar3[5];
          fVar184 = pfVar3[6];
          pfVar3 = (float *)(lVar146 + 0x2228070 + lVar148 * 4);
          local_780 = *pfVar3;
          fStack_77c = pfVar3[1];
          fStack_778 = pfVar3[2];
          fStack_774 = pfVar3[3];
          fStack_770 = pfVar3[4];
          fStack_76c = pfVar3[5];
          fStack_768 = pfVar3[6];
          fStack_764 = pfVar3[7];
          fVar208 = auVar365._0_4_;
          fVar209 = auVar365._4_4_;
          fVar210 = auVar365._8_4_;
          fVar212 = auVar365._12_4_;
          fVar213 = auVar365._16_4_;
          fVar214 = auVar365._20_4_;
          fVar262 = auVar365._24_4_;
          fVar215 = auVar246._28_4_;
          fVar186 = fVar215 + fVar215 + auVar170._28_4_;
          fVar207 = fVar215 + fVar215 + fStack_764;
          auVar402._0_4_ =
               (float)local_2a0._0_4_ * fVar297 +
               (float)local_2e0._0_4_ * fVar298 +
               fVar208 * fVar362 + (float)local_540._0_4_ * local_780;
          auVar402._4_4_ =
               (float)local_2a0._4_4_ * fVar299 +
               (float)local_2e0._4_4_ * fVar369 +
               fVar209 * fVar172 + (float)local_540._4_4_ * fStack_77c;
          auVar402._8_4_ =
               fStack_298 * fVar366 +
               fStack_2d8 * fVar361 + fVar210 * fVar175 + fStack_538 * fStack_778;
          auVar402._12_4_ =
               fStack_294 * fVar253 +
               fStack_2d4 * fVar371 + fVar212 * fVar178 + fStack_534 * fStack_774;
          auVar402._16_4_ =
               fStack_290 * fVar367 +
               fStack_2d0 * fVar370 + fVar213 * fVar180 + fStack_530 * fStack_770;
          auVar402._20_4_ =
               fStack_28c * fVar258 +
               fStack_2cc * fVar373 + fVar214 * fVar182 + fStack_52c * fStack_76c;
          auVar402._24_4_ =
               fStack_288 * fVar368 +
               fStack_2c8 * fVar372 + fVar262 * fVar184 + fStack_528 * fStack_768;
          auVar402._28_4_ = fVar215 + fStack_764 + fVar186;
          fVar217 = local_300._0_4_;
          fVar229 = local_300._4_4_;
          fVar230 = local_300._8_4_;
          fVar231 = local_300._12_4_;
          fVar232 = local_300._16_4_;
          fVar233 = local_300._20_4_;
          fVar187 = local_300._24_4_;
          local_880._0_4_ =
               (float)local_640._0_4_ * fVar298 + fVar276 * fVar362 + fVar234 * local_780 +
               fVar217 * fVar297;
          local_880._4_4_ =
               (float)local_640._4_4_ * fVar369 + fVar277 * fVar172 + fVar251 * fStack_77c +
               fVar229 * fVar299;
          local_880._8_4_ =
               fStack_638 * fVar361 + fVar278 * fVar175 + fVar259 * fStack_778 + fVar230 * fVar366;
          local_880._12_4_ =
               fStack_634 * fVar371 + fVar290 * fVar178 + fVar261 * fStack_774 + fVar231 * fVar253;
          local_880._16_4_ =
               fStack_630 * fVar370 + fVar292 * fVar180 + fVar271 * fStack_770 + fVar232 * fVar367;
          local_880._20_4_ =
               fStack_62c * fVar373 + fVar294 * fVar182 + fVar272 * fStack_76c + fVar233 * fVar258;
          local_880._24_4_ =
               fStack_628 * fVar372 + fVar296 * fVar184 + fVar273 * fStack_768 + fVar187 * fVar368;
          local_880._28_4_ = fVar215 + fVar215 + auVar270._28_4_ + fVar186;
          fVar151 = fVar297 * (float)local_280._0_4_ +
                    fVar298 * (float)local_260._0_4_ +
                    fVar362 * (float)local_2c0._0_4_ + (float)local_a0._0_4_ * local_780;
          fVar173 = fVar299 * (float)local_280._4_4_ +
                    fVar369 * (float)local_260._4_4_ +
                    fVar172 * (float)local_2c0._4_4_ + (float)local_a0._4_4_ * fStack_77c;
          fVar176 = fVar366 * fStack_278 +
                    fVar361 * fStack_258 + fVar175 * fStack_2b8 + fStack_98 * fStack_778;
          fVar179 = fVar253 * fStack_274 +
                    fVar371 * fStack_254 + fVar178 * fStack_2b4 + fStack_94 * fStack_774;
          fVar181 = fVar367 * fStack_270 +
                    fVar370 * fStack_250 + fVar180 * fStack_2b0 + fStack_90 * fStack_770;
          fVar183 = fVar258 * fStack_26c +
                    fVar373 * fStack_24c + fVar182 * fStack_2ac + fStack_8c * fStack_76c;
          fVar185 = fVar368 * fStack_268 +
                    fVar372 * fStack_248 + fVar184 * fStack_2a8 + fStack_88 * fStack_768;
          fVar186 = fVar186 + fVar207;
          pfVar3 = (float *)(bezier_basis1 + lVar148 * 4 + lVar146);
          fVar297 = *pfVar3;
          fVar299 = pfVar3[1];
          fVar366 = pfVar3[2];
          fVar253 = pfVar3[3];
          fVar367 = pfVar3[4];
          fVar258 = pfVar3[5];
          fVar368 = pfVar3[6];
          pauVar2 = (undefined1 (*) [28])(lVar146 + 0x2229b88 + lVar148 * 4);
          fVar298 = *(float *)*pauVar2;
          fVar369 = *(float *)(*pauVar2 + 4);
          fVar361 = *(float *)(*pauVar2 + 8);
          fVar371 = *(float *)(*pauVar2 + 0xc);
          fVar370 = *(float *)(*pauVar2 + 0x10);
          fVar373 = *(float *)(*pauVar2 + 0x14);
          fVar372 = *(float *)(*pauVar2 + 0x18);
          auVar139 = *pauVar2;
          pfVar4 = (float *)(lVar146 + 0x222a00c + lVar148 * 4);
          fVar215 = *pfVar4;
          fVar248 = pfVar4[1];
          fVar250 = pfVar4[2];
          fVar252 = pfVar4[3];
          fVar255 = pfVar4[4];
          fVar257 = pfVar4[5];
          fVar260 = pfVar4[6];
          pfVar5 = (float *)(lVar146 + 0x222a490 + lVar148 * 4);
          fVar315 = *pfVar5;
          fVar324 = pfVar5[1];
          fVar325 = pfVar5[2];
          fVar332 = pfVar5[3];
          fVar333 = pfVar5[4];
          fVar334 = pfVar5[5];
          fVar337 = pfVar5[6];
          auVar170 = ZEXT3264(local_300);
          fVar207 = fVar275 + fVar275 + fVar207;
          auVar121._4_4_ = fVar173;
          auVar121._0_4_ = fVar151;
          auVar121._8_4_ = fVar176;
          auVar121._12_4_ = fVar179;
          auVar121._16_4_ = fVar181;
          auVar121._20_4_ = fVar183;
          auVar121._24_4_ = fVar185;
          auVar121._28_4_ = fVar186;
          auVar309._0_4_ =
               fVar297 * (float)local_2a0._0_4_ +
               (float)local_2e0._0_4_ * fVar298 +
               fVar208 * fVar215 + (float)local_540._0_4_ * fVar315;
          auVar309._4_4_ =
               fVar299 * (float)local_2a0._4_4_ +
               (float)local_2e0._4_4_ * fVar369 +
               fVar209 * fVar248 + (float)local_540._4_4_ * fVar324;
          auVar309._8_4_ =
               fVar366 * fStack_298 +
               fStack_2d8 * fVar361 + fVar210 * fVar250 + fStack_538 * fVar325;
          auVar309._12_4_ =
               fVar253 * fStack_294 +
               fStack_2d4 * fVar371 + fVar212 * fVar252 + fStack_534 * fVar332;
          auVar309._16_4_ =
               fVar367 * fStack_290 +
               fStack_2d0 * fVar370 + fVar213 * fVar255 + fStack_530 * fVar333;
          auVar309._20_4_ =
               fVar258 * fStack_28c +
               fStack_2cc * fVar373 + fVar214 * fVar257 + fStack_52c * fVar334;
          auVar309._24_4_ =
               fVar368 * fStack_288 +
               fStack_2c8 * fVar372 + fVar262 * fVar260 + fStack_528 * fVar337;
          auVar309._28_4_ = fStack_284 + fVar207;
          auVar288._0_4_ =
               fVar297 * fVar217 +
               (float)local_640._0_4_ * fVar298 + fVar276 * fVar215 + fVar234 * fVar315;
          auVar288._4_4_ =
               fVar299 * fVar229 +
               (float)local_640._4_4_ * fVar369 + fVar277 * fVar248 + fVar251 * fVar324;
          auVar288._8_4_ =
               fVar366 * fVar230 + fStack_638 * fVar361 + fVar278 * fVar250 + fVar259 * fVar325;
          auVar288._12_4_ =
               fVar253 * fVar231 + fStack_634 * fVar371 + fVar290 * fVar252 + fVar261 * fVar332;
          auVar288._16_4_ =
               fVar367 * fVar232 + fStack_630 * fVar370 + fVar292 * fVar255 + fVar271 * fVar333;
          auVar288._20_4_ =
               fVar258 * fVar233 + fStack_62c * fVar373 + fVar294 * fVar257 + fVar272 * fVar334;
          auVar288._24_4_ =
               fVar368 * fVar187 + fStack_628 * fVar372 + fVar296 * fVar260 + fVar273 * fVar337;
          auVar288._28_4_ = fVar207 + fVar275 + fVar275 + fStack_524;
          local_800._0_4_ =
               fVar298 * (float)local_260._0_4_ +
               fVar215 * (float)local_2c0._0_4_ + (float)local_a0._0_4_ * fVar315 +
               fVar297 * (float)local_280._0_4_;
          local_800._4_4_ =
               fVar369 * (float)local_260._4_4_ +
               fVar248 * (float)local_2c0._4_4_ + (float)local_a0._4_4_ * fVar324 +
               fVar299 * (float)local_280._4_4_;
          local_800._8_4_ =
               fVar361 * fStack_258 + fVar250 * fStack_2b8 + fStack_98 * fVar325 +
               fVar366 * fStack_278;
          local_800._12_4_ =
               fVar371 * fStack_254 + fVar252 * fStack_2b4 + fStack_94 * fVar332 +
               fVar253 * fStack_274;
          local_800._16_4_ =
               fVar370 * fStack_250 + fVar255 * fStack_2b0 + fStack_90 * fVar333 +
               fVar367 * fStack_270;
          local_800._20_4_ =
               fVar373 * fStack_24c + fVar257 * fStack_2ac + fStack_8c * fVar334 +
               fVar258 * fStack_26c;
          local_800._24_4_ =
               fVar372 * fStack_248 + fVar260 * fStack_2a8 + fStack_88 * fVar337 +
               fVar368 * fStack_268;
          local_800._28_4_ = fVar275 + fVar275 + pfVar5[7] + fVar207;
          auVar340 = vsubps_avx(auVar309,auVar402);
          auVar20 = vsubps_avx(auVar288,local_880);
          fVar275 = auVar340._0_4_;
          fVar276 = auVar340._4_4_;
          auVar69._4_4_ = fVar276 * local_880._4_4_;
          auVar69._0_4_ = fVar275 * (float)local_880._0_4_;
          fVar277 = auVar340._8_4_;
          auVar69._8_4_ = fVar277 * local_880._8_4_;
          fVar278 = auVar340._12_4_;
          auVar69._12_4_ = fVar278 * local_880._12_4_;
          fVar290 = auVar340._16_4_;
          auVar69._16_4_ = fVar290 * local_880._16_4_;
          fVar292 = auVar340._20_4_;
          auVar69._20_4_ = fVar292 * local_880._20_4_;
          fVar294 = auVar340._24_4_;
          auVar69._24_4_ = fVar294 * local_880._24_4_;
          auVar69._28_4_ = fVar207;
          fVar234 = auVar20._0_4_;
          fVar251 = auVar20._4_4_;
          auVar70._4_4_ = auVar402._4_4_ * fVar251;
          auVar70._0_4_ = auVar402._0_4_ * fVar234;
          fVar259 = auVar20._8_4_;
          auVar70._8_4_ = auVar402._8_4_ * fVar259;
          fVar261 = auVar20._12_4_;
          auVar70._12_4_ = auVar402._12_4_ * fVar261;
          fVar271 = auVar20._16_4_;
          auVar70._16_4_ = auVar402._16_4_ * fVar271;
          fVar272 = auVar20._20_4_;
          auVar70._20_4_ = auVar402._20_4_ * fVar272;
          fVar273 = auVar20._24_4_;
          auVar70._24_4_ = auVar402._24_4_ * fVar273;
          auVar70._28_4_ = auVar288._28_4_;
          auVar21 = vsubps_avx(auVar69,auVar70);
          auVar154 = vmaxps_avx(auVar121,local_800);
          auVar71._4_4_ = auVar154._4_4_ * auVar154._4_4_ * (fVar276 * fVar276 + fVar251 * fVar251);
          auVar71._0_4_ = auVar154._0_4_ * auVar154._0_4_ * (fVar275 * fVar275 + fVar234 * fVar234);
          auVar71._8_4_ = auVar154._8_4_ * auVar154._8_4_ * (fVar277 * fVar277 + fVar259 * fVar259);
          auVar71._12_4_ =
               auVar154._12_4_ * auVar154._12_4_ * (fVar278 * fVar278 + fVar261 * fVar261);
          auVar71._16_4_ =
               auVar154._16_4_ * auVar154._16_4_ * (fVar290 * fVar290 + fVar271 * fVar271);
          auVar71._20_4_ =
               auVar154._20_4_ * auVar154._20_4_ * (fVar292 * fVar292 + fVar272 * fVar272);
          auVar71._24_4_ =
               auVar154._24_4_ * auVar154._24_4_ * (fVar294 * fVar294 + fVar273 * fVar273);
          auVar71._28_4_ = auVar309._28_4_ + auVar288._28_4_;
          auVar72._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar72._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar72._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar72._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar72._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar72._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar72._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar72._28_4_ = auVar21._28_4_;
          auVar270 = ZEXT3264(auVar72);
          auVar154 = vcmpps_avx(auVar72,auVar71,2);
          auVar246 = ZEXT3264(auVar154);
          local_4a0 = (uint)lVar148;
          auVar211 = vpshufd_avx(ZEXT416(local_4a0),0);
          auVar237 = vpor_avx(auVar211,_DAT_01ff0cf0);
          auVar211 = vpor_avx(auVar211,_DAT_02020ea0);
          auVar237 = vpcmpgtd_avx(_local_320,auVar237);
          auVar211 = vpcmpgtd_avx(_local_320,auVar211);
          auVar197._16_16_ = auVar211;
          auVar197._0_16_ = auVar237;
          auVar21 = auVar197 & auVar154;
          fVar234 = (float)local_680._0_4_;
          fVar251 = (float)local_680._4_4_;
          fVar259 = fStack_678;
          fVar261 = fStack_674;
          fVar271 = fStack_670;
          fVar272 = fStack_66c;
          fVar273 = fStack_668;
          fVar275 = fStack_664;
          fVar276 = (float)local_720._0_4_;
          fVar277 = (float)local_720._4_4_;
          fVar278 = fStack_718;
          fVar290 = fStack_714;
          fVar292 = fStack_710;
          fVar294 = fStack_70c;
          fVar296 = fStack_708;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
            auVar365 = ZEXT3264(auVar365._0_32_);
          }
          else {
            local_7a0._0_4_ = auVar139._0_4_;
            local_7a0._4_4_ = auVar139._4_4_;
            uStack_798._0_4_ = auVar139._8_4_;
            uStack_798._4_4_ = auVar139._12_4_;
            uStack_790._0_4_ = auVar139._16_4_;
            uStack_790._4_4_ = auVar139._20_4_;
            uStack_788._0_4_ = auVar139._24_4_;
            local_620 = fVar297 * (float)local_600._0_4_ +
                        (float)local_520._0_4_ * (float)local_7a0._0_4_ +
                        fVar215 * (float)local_c0._0_4_ + (float)local_6e0._0_4_ * fVar315;
            fStack_61c = fVar299 * (float)local_600._4_4_ +
                         (float)local_520._4_4_ * (float)local_7a0._4_4_ +
                         fVar248 * (float)local_c0._4_4_ + (float)local_6e0._4_4_ * fVar324;
            fStack_618 = fVar366 * fStack_5f8 +
                         fStack_518 * (float)uStack_798 + fVar250 * fStack_b8 + fStack_6d8 * fVar325
            ;
            fStack_614 = fVar253 * fStack_5f4 +
                         fStack_514 * uStack_798._4_4_ + fVar252 * fStack_b4 + fStack_6d4 * fVar332;
            fStack_610 = fVar367 * fStack_5f0 +
                         fStack_510 * (float)uStack_790 + fVar255 * fStack_b0 + fStack_6d0 * fVar333
            ;
            fStack_60c = fVar258 * fStack_5ec +
                         fStack_50c * uStack_790._4_4_ + fVar257 * fStack_ac + fStack_6cc * fVar334;
            fStack_608 = fVar368 * fStack_5e8 +
                         fStack_508 * (float)uStack_788 + fVar260 * fStack_a8 + fStack_6c8 * fVar337
            ;
            fStack_604 = fStack_2c4 + local_300._28_4_ + auVar211._12_4_ + 0.0;
            local_860._0_4_ = auVar137._0_4_;
            local_860._4_4_ = auVar137._4_4_;
            uStack_858._0_4_ = auVar137._8_4_;
            uStack_858._4_4_ = auVar137._12_4_;
            auStack_850._0_4_ = auVar137._16_4_;
            auStack_850._4_4_ = auVar137._20_4_;
            uStack_848._0_4_ = auVar137._24_4_;
            pfVar5 = (float *)(lVar146 + 0x2228dfc + lVar148 * 4);
            fVar297 = *pfVar5;
            fVar299 = pfVar5[1];
            fVar366 = pfVar5[2];
            fVar253 = pfVar5[3];
            fVar367 = pfVar5[4];
            fVar258 = pfVar5[5];
            fVar368 = pfVar5[6];
            pfVar6 = (float *)(lVar146 + 0x2229280 + lVar148 * 4);
            fVar298 = *pfVar6;
            fVar369 = pfVar6[1];
            fVar361 = pfVar6[2];
            fVar371 = pfVar6[3];
            fVar370 = pfVar6[4];
            fVar373 = pfVar6[5];
            fVar372 = pfVar6[6];
            fVar314 = pfVar4[7] + 0.0;
            pfVar7 = (float *)(lVar146 + 0x2228978 + lVar148 * 4);
            fVar215 = *pfVar7;
            fVar248 = pfVar7[1];
            fVar250 = pfVar7[2];
            fVar252 = pfVar7[3];
            fVar255 = pfVar7[4];
            fVar257 = pfVar7[5];
            fVar260 = pfVar7[6];
            fVar207 = pfVar5[7] + pfVar6[7];
            fVar216 = pfVar6[7] + fVar314;
            fVar314 = pfVar4[7] + pfVar3[7] + fVar314;
            pfVar3 = (float *)(lVar146 + 0x22284f4 + lVar148 * 4);
            fVar315 = *pfVar3;
            fVar324 = pfVar3[1];
            fVar325 = pfVar3[2];
            fVar332 = pfVar3[3];
            fVar333 = pfVar3[4];
            fVar334 = pfVar3[5];
            fVar337 = pfVar3[6];
            local_760 = fVar315 * (float)local_2a0._0_4_ +
                        (float)local_2e0._0_4_ * fVar215 +
                        fVar208 * fVar297 + (float)local_540._0_4_ * fVar298;
            fStack_75c = fVar324 * (float)local_2a0._4_4_ +
                         (float)local_2e0._4_4_ * fVar248 +
                         fVar209 * fVar299 + (float)local_540._4_4_ * fVar369;
            fStack_758 = fVar325 * fStack_298 +
                         fStack_2d8 * fVar250 + fVar210 * fVar366 + fStack_538 * fVar361;
            fStack_754 = fVar332 * fStack_294 +
                         fStack_2d4 * fVar252 + fVar212 * fVar253 + fStack_534 * fVar371;
            fStack_750 = fVar333 * fStack_290 +
                         fStack_2d0 * fVar255 + fVar213 * fVar367 + fStack_530 * fVar370;
            fStack_74c = fVar334 * fStack_28c +
                         fStack_2cc * fVar257 + fVar214 * fVar258 + fStack_52c * fVar373;
            fStack_748 = fVar337 * fStack_288 +
                         fStack_2c8 * fVar260 + fVar262 * fVar368 + fStack_528 * fVar372;
            fStack_744 = fVar207 + fVar216;
            auVar198._0_4_ =
                 fVar315 * fVar217 +
                 fVar297 * (float)local_720._0_4_ + (float)local_680._0_4_ * fVar298 +
                 (float)local_640._0_4_ * fVar215;
            auVar198._4_4_ =
                 fVar324 * fVar229 +
                 fVar299 * (float)local_720._4_4_ + (float)local_680._4_4_ * fVar369 +
                 (float)local_640._4_4_ * fVar248;
            auVar198._8_4_ =
                 fVar325 * fVar230 +
                 fVar366 * fStack_718 + fStack_678 * fVar361 + fStack_638 * fVar250;
            auVar198._12_4_ =
                 fVar332 * fVar231 +
                 fVar253 * fStack_714 + fStack_674 * fVar371 + fStack_634 * fVar252;
            auVar198._16_4_ =
                 fVar333 * fVar232 +
                 fVar367 * fStack_710 + fStack_670 * fVar370 + fStack_630 * fVar255;
            auVar198._20_4_ =
                 fVar334 * fVar233 +
                 fVar258 * fStack_70c + fStack_66c * fVar373 + fStack_62c * fVar257;
            auVar198._24_4_ =
                 fVar337 * fVar187 +
                 fVar368 * fStack_708 + fStack_668 * fVar372 + fStack_628 * fVar260;
            auVar198._28_4_ = fVar216 + fVar314;
            auVar385._0_4_ =
                 fVar215 * (float)local_520._0_4_ +
                 (float)local_c0._0_4_ * fVar297 + (float)local_6e0._0_4_ * fVar298 +
                 fVar315 * (float)local_600._0_4_;
            auVar385._4_4_ =
                 fVar248 * (float)local_520._4_4_ +
                 (float)local_c0._4_4_ * fVar299 + (float)local_6e0._4_4_ * fVar369 +
                 fVar324 * (float)local_600._4_4_;
            auVar385._8_4_ =
                 fVar250 * fStack_518 + fStack_b8 * fVar366 + fStack_6d8 * fVar361 +
                 fVar325 * fStack_5f8;
            auVar385._12_4_ =
                 fVar252 * fStack_514 + fStack_b4 * fVar253 + fStack_6d4 * fVar371 +
                 fVar332 * fStack_5f4;
            auVar385._16_4_ =
                 fVar255 * fStack_510 + fStack_b0 * fVar367 + fStack_6d0 * fVar370 +
                 fVar333 * fStack_5f0;
            auVar385._20_4_ =
                 fVar257 * fStack_50c + fStack_ac * fVar258 + fStack_6cc * fVar373 +
                 fVar334 * fStack_5ec;
            auVar385._24_4_ =
                 fVar260 * fStack_508 + fStack_a8 * fVar368 + fStack_6c8 * fVar372 +
                 fVar337 * fStack_5e8;
            auVar385._28_4_ = pfVar7[7] + fVar207 + fVar314;
            pfVar3 = (float *)(lVar146 + 0x222b21c + lVar148 * 4);
            fVar297 = *pfVar3;
            fVar299 = pfVar3[1];
            fVar366 = pfVar3[2];
            fVar253 = pfVar3[3];
            fVar367 = pfVar3[4];
            fVar258 = pfVar3[5];
            fVar368 = pfVar3[6];
            pfVar4 = (float *)(lVar146 + 0x222b6a0 + lVar148 * 4);
            fVar298 = *pfVar4;
            fVar369 = pfVar4[1];
            fVar361 = pfVar4[2];
            fVar371 = pfVar4[3];
            fVar370 = pfVar4[4];
            fVar373 = pfVar4[5];
            fVar372 = pfVar4[6];
            pfVar5 = (float *)(lVar146 + 0x222ad98 + lVar148 * 4);
            fVar215 = *pfVar5;
            fVar248 = pfVar5[1];
            fVar250 = pfVar5[2];
            fVar252 = pfVar5[3];
            fVar255 = pfVar5[4];
            fVar257 = pfVar5[5];
            fVar260 = pfVar5[6];
            pfVar6 = (float *)(lVar146 + 0x222a914 + lVar148 * 4);
            fVar315 = *pfVar6;
            fVar324 = pfVar6[1];
            fVar325 = pfVar6[2];
            fVar332 = pfVar6[3];
            fVar333 = pfVar6[4];
            fVar334 = pfVar6[5];
            fVar337 = pfVar6[6];
            auVar343._0_4_ =
                 fVar315 * (float)local_2a0._0_4_ +
                 (float)local_2e0._0_4_ * fVar215 +
                 fVar208 * fVar297 + (float)local_540._0_4_ * fVar298;
            auVar343._4_4_ =
                 fVar324 * (float)local_2a0._4_4_ +
                 (float)local_2e0._4_4_ * fVar248 +
                 fVar209 * fVar299 + (float)local_540._4_4_ * fVar369;
            auVar343._8_4_ =
                 fVar325 * fStack_298 +
                 fStack_2d8 * fVar250 + fVar210 * fVar366 + fStack_538 * fVar361;
            auVar343._12_4_ =
                 fVar332 * fStack_294 +
                 fStack_2d4 * fVar252 + fVar212 * fVar253 + fStack_534 * fVar371;
            auVar343._16_4_ =
                 fVar333 * fStack_290 +
                 fStack_2d0 * fVar255 + fVar213 * fVar367 + fStack_530 * fVar370;
            auVar343._20_4_ =
                 fVar334 * fStack_28c +
                 fStack_2cc * fVar257 + fVar214 * fVar258 + fStack_52c * fVar373;
            auVar343._24_4_ =
                 fVar337 * fStack_288 +
                 fStack_2c8 * fVar260 + fVar262 * fVar368 + fStack_528 * fVar372;
            auVar343._28_4_ = fStack_624 + fStack_624 + fStack_524 + fStack_624;
            auVar379._0_4_ =
                 fVar315 * fVar217 +
                 fVar215 * (float)local_640._0_4_ +
                 fVar297 * (float)local_720._0_4_ + fVar298 * (float)local_680._0_4_;
            auVar379._4_4_ =
                 fVar324 * fVar229 +
                 fVar248 * (float)local_640._4_4_ +
                 fVar299 * (float)local_720._4_4_ + fVar369 * (float)local_680._4_4_;
            auVar379._8_4_ =
                 fVar325 * fVar230 +
                 fVar250 * fStack_638 + fVar366 * fStack_718 + fVar361 * fStack_678;
            auVar379._12_4_ =
                 fVar332 * fVar231 +
                 fVar252 * fStack_634 + fVar253 * fStack_714 + fVar371 * fStack_674;
            auVar379._16_4_ =
                 fVar333 * fVar232 +
                 fVar255 * fStack_630 + fVar367 * fStack_710 + fVar370 * fStack_670;
            auVar379._20_4_ =
                 fVar334 * fVar233 +
                 fVar257 * fStack_62c + fVar258 * fStack_70c + fVar373 * fStack_66c;
            auVar379._24_4_ =
                 fVar337 * fVar187 +
                 fVar260 * fStack_628 + fVar368 * fStack_708 + fVar372 * fStack_668;
            auVar379._28_4_ = fStack_624 + fStack_624 + auVar365._28_4_ + fStack_624;
            auVar289._8_4_ = 0x7fffffff;
            auVar289._0_8_ = 0x7fffffff7fffffff;
            auVar289._12_4_ = 0x7fffffff;
            auVar289._16_4_ = 0x7fffffff;
            auVar289._20_4_ = 0x7fffffff;
            auVar289._24_4_ = 0x7fffffff;
            auVar289._28_4_ = 0x7fffffff;
            auVar133._4_4_ = fStack_75c;
            auVar133._0_4_ = local_760;
            auVar133._8_4_ = fStack_758;
            auVar133._12_4_ = fStack_754;
            auVar133._16_4_ = fStack_750;
            auVar133._20_4_ = fStack_74c;
            auVar133._24_4_ = fStack_748;
            auVar133._28_4_ = fStack_744;
            auVar21 = vandps_avx(auVar133,auVar289);
            auVar22 = vandps_avx(auVar198,auVar289);
            auVar22 = vmaxps_avx(auVar21,auVar22);
            auVar21 = vandps_avx(auVar385,auVar289);
            auVar22 = vmaxps_avx(auVar22,auVar21);
            auVar22 = vcmpps_avx(auVar22,local_340,1);
            auVar23 = vblendvps_avx(auVar133,auVar340,auVar22);
            auVar161._0_4_ =
                 fVar315 * (float)local_600._0_4_ +
                 fVar215 * (float)local_520._0_4_ +
                 fVar298 * (float)local_6e0._0_4_ + (float)local_c0._0_4_ * fVar297;
            auVar161._4_4_ =
                 fVar324 * (float)local_600._4_4_ +
                 fVar248 * (float)local_520._4_4_ +
                 fVar369 * (float)local_6e0._4_4_ + (float)local_c0._4_4_ * fVar299;
            auVar161._8_4_ =
                 fVar325 * fStack_5f8 +
                 fVar250 * fStack_518 + fVar361 * fStack_6d8 + fStack_b8 * fVar366;
            auVar161._12_4_ =
                 fVar332 * fStack_5f4 +
                 fVar252 * fStack_514 + fVar371 * fStack_6d4 + fStack_b4 * fVar253;
            auVar161._16_4_ =
                 fVar333 * fStack_5f0 +
                 fVar255 * fStack_510 + fVar370 * fStack_6d0 + fStack_b0 * fVar367;
            auVar161._20_4_ =
                 fVar334 * fStack_5ec +
                 fVar257 * fStack_50c + fVar373 * fStack_6cc + fStack_ac * fVar258;
            auVar161._24_4_ =
                 fVar337 * fStack_5e8 +
                 fVar260 * fStack_508 + fVar372 * fStack_6c8 + fStack_a8 * fVar368;
            auVar161._28_4_ = auVar21._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
            auVar24 = vblendvps_avx(auVar198,auVar20,auVar22);
            auVar21 = vandps_avx(auVar343,auVar289);
            auVar22 = vandps_avx(auVar379,auVar289);
            auVar25 = vmaxps_avx(auVar21,auVar22);
            auVar21 = vandps_avx(auVar161,auVar289);
            auVar21 = vmaxps_avx(auVar25,auVar21);
            local_840._0_4_ = auVar138._0_4_;
            local_840._4_4_ = auVar138._4_4_;
            uStack_838._0_4_ = auVar138._8_4_;
            uStack_838._4_4_ = auVar138._12_4_;
            uStack_830._0_4_ = auVar138._16_4_;
            uStack_830._4_4_ = auVar138._20_4_;
            uStack_828._0_4_ = auVar138._24_4_;
            auVar22 = vcmpps_avx(auVar21,local_340,1);
            auVar21 = vblendvps_avx(auVar343,auVar340,auVar22);
            auVar162._0_4_ =
                 (float)local_600._0_4_ * (float)local_840._0_4_ +
                 (float)local_520._0_4_ * (float)local_860._0_4_ +
                 (float)local_c0._0_4_ * fVar362 + (float)local_6e0._0_4_ * local_780;
            auVar162._4_4_ =
                 (float)local_600._4_4_ * (float)local_840._4_4_ +
                 (float)local_520._4_4_ * (float)local_860._4_4_ +
                 (float)local_c0._4_4_ * fVar172 + (float)local_6e0._4_4_ * fStack_77c;
            auVar162._8_4_ =
                 fStack_5f8 * (float)uStack_838 +
                 fStack_518 * (float)uStack_858 + fStack_b8 * fVar175 + fStack_6d8 * fStack_778;
            auVar162._12_4_ =
                 fStack_5f4 * uStack_838._4_4_ +
                 fStack_514 * uStack_858._4_4_ + fStack_b4 * fVar178 + fStack_6d4 * fStack_774;
            auVar162._16_4_ =
                 fStack_5f0 * (float)uStack_830 +
                 fStack_510 * (float)auStack_850._0_4_ +
                 fStack_b0 * fVar180 + fStack_6d0 * fStack_770;
            auVar162._20_4_ =
                 fStack_5ec * uStack_830._4_4_ +
                 fStack_50c * (float)auStack_850._4_4_ +
                 fStack_ac * fVar182 + fStack_6cc * fStack_76c;
            auVar162._24_4_ =
                 fStack_5e8 * (float)uStack_828 +
                 fStack_508 * (float)uStack_848 + fStack_a8 * fVar184 + fStack_6c8 * fStack_768;
            auVar162._28_4_ = auVar25._28_4_ + fStack_604 + auVar211._12_4_ + 0.0;
            auVar22 = vblendvps_avx(auVar379,auVar20,auVar22);
            fVar217 = auVar23._0_4_;
            fVar229 = auVar23._4_4_;
            fVar230 = auVar23._8_4_;
            fVar231 = auVar23._12_4_;
            fVar232 = auVar23._16_4_;
            fVar233 = auVar23._20_4_;
            fVar187 = auVar23._24_4_;
            fVar207 = auVar23._28_4_;
            fVar362 = auVar21._0_4_;
            fVar175 = auVar21._4_4_;
            fVar180 = auVar21._8_4_;
            fVar184 = auVar21._12_4_;
            fVar248 = auVar21._16_4_;
            fVar252 = auVar21._20_4_;
            fVar257 = auVar21._24_4_;
            fVar297 = auVar24._0_4_;
            fVar366 = auVar24._4_4_;
            fVar367 = auVar24._8_4_;
            fVar368 = auVar24._12_4_;
            fVar369 = auVar24._16_4_;
            fVar371 = auVar24._20_4_;
            fVar373 = auVar24._24_4_;
            auVar356._0_4_ = fVar297 * fVar297 + fVar217 * fVar217;
            auVar356._4_4_ = fVar366 * fVar366 + fVar229 * fVar229;
            auVar356._8_4_ = fVar367 * fVar367 + fVar230 * fVar230;
            auVar356._12_4_ = fVar368 * fVar368 + fVar231 * fVar231;
            auVar356._16_4_ = fVar369 * fVar369 + fVar232 * fVar232;
            auVar356._20_4_ = fVar371 * fVar371 + fVar233 * fVar233;
            auVar356._24_4_ = fVar373 * fVar373 + fVar187 * fVar187;
            auVar356._28_4_ = auVar340._28_4_ + auVar20._28_4_;
            auVar340 = vrsqrtps_avx(auVar356);
            fVar299 = auVar340._0_4_;
            fVar253 = auVar340._4_4_;
            auVar73._4_4_ = fVar253 * 1.5;
            auVar73._0_4_ = fVar299 * 1.5;
            fVar258 = auVar340._8_4_;
            auVar73._8_4_ = fVar258 * 1.5;
            fVar298 = auVar340._12_4_;
            auVar73._12_4_ = fVar298 * 1.5;
            fVar361 = auVar340._16_4_;
            auVar73._16_4_ = fVar361 * 1.5;
            fVar370 = auVar340._20_4_;
            auVar73._20_4_ = fVar370 * 1.5;
            fVar372 = auVar340._24_4_;
            auVar73._24_4_ = fVar372 * 1.5;
            auVar73._28_4_ = auVar379._28_4_;
            auVar74._4_4_ = fVar253 * fVar253 * fVar253 * auVar356._4_4_ * 0.5;
            auVar74._0_4_ = fVar299 * fVar299 * fVar299 * auVar356._0_4_ * 0.5;
            auVar74._8_4_ = fVar258 * fVar258 * fVar258 * auVar356._8_4_ * 0.5;
            auVar74._12_4_ = fVar298 * fVar298 * fVar298 * auVar356._12_4_ * 0.5;
            auVar74._16_4_ = fVar361 * fVar361 * fVar361 * auVar356._16_4_ * 0.5;
            auVar74._20_4_ = fVar370 * fVar370 * fVar370 * auVar356._20_4_ * 0.5;
            auVar74._24_4_ = fVar372 * fVar372 * fVar372 * auVar356._24_4_ * 0.5;
            auVar74._28_4_ = auVar356._28_4_;
            auVar20 = vsubps_avx(auVar73,auVar74);
            fVar315 = auVar20._0_4_;
            fVar324 = auVar20._4_4_;
            fVar325 = auVar20._8_4_;
            fVar332 = auVar20._12_4_;
            fVar333 = auVar20._16_4_;
            fVar334 = auVar20._20_4_;
            fVar337 = auVar20._24_4_;
            fVar299 = auVar22._0_4_;
            fVar253 = auVar22._4_4_;
            fVar258 = auVar22._8_4_;
            fVar298 = auVar22._12_4_;
            fVar361 = auVar22._16_4_;
            fVar370 = auVar22._20_4_;
            fVar372 = auVar22._24_4_;
            auVar330._0_4_ = fVar299 * fVar299 + fVar362 * fVar362;
            auVar330._4_4_ = fVar253 * fVar253 + fVar175 * fVar175;
            auVar330._8_4_ = fVar258 * fVar258 + fVar180 * fVar180;
            auVar330._12_4_ = fVar298 * fVar298 + fVar184 * fVar184;
            auVar330._16_4_ = fVar361 * fVar361 + fVar248 * fVar248;
            auVar330._20_4_ = fVar370 * fVar370 + fVar252 * fVar252;
            auVar330._24_4_ = fVar372 * fVar372 + fVar257 * fVar257;
            auVar330._28_4_ = auVar340._28_4_ + auVar21._28_4_;
            auVar340 = vrsqrtps_avx(auVar330);
            fVar172 = auVar340._0_4_;
            fVar178 = auVar340._4_4_;
            auVar75._4_4_ = fVar178 * 1.5;
            auVar75._0_4_ = fVar172 * 1.5;
            fVar182 = auVar340._8_4_;
            auVar75._8_4_ = fVar182 * 1.5;
            fVar215 = auVar340._12_4_;
            auVar75._12_4_ = fVar215 * 1.5;
            fVar250 = auVar340._16_4_;
            auVar75._16_4_ = fVar250 * 1.5;
            fVar255 = auVar340._20_4_;
            auVar75._20_4_ = fVar255 * 1.5;
            fVar260 = auVar340._24_4_;
            auVar75._24_4_ = fVar260 * 1.5;
            auVar75._28_4_ = auVar379._28_4_;
            auVar76._4_4_ = fVar178 * fVar178 * fVar178 * auVar330._4_4_ * 0.5;
            auVar76._0_4_ = fVar172 * fVar172 * fVar172 * auVar330._0_4_ * 0.5;
            auVar76._8_4_ = fVar182 * fVar182 * fVar182 * auVar330._8_4_ * 0.5;
            auVar76._12_4_ = fVar215 * fVar215 * fVar215 * auVar330._12_4_ * 0.5;
            auVar76._16_4_ = fVar250 * fVar250 * fVar250 * auVar330._16_4_ * 0.5;
            auVar76._20_4_ = fVar255 * fVar255 * fVar255 * auVar330._20_4_ * 0.5;
            auVar76._24_4_ = fVar260 * fVar260 * fVar260 * auVar330._24_4_ * 0.5;
            auVar76._28_4_ = auVar330._28_4_;
            auVar20 = vsubps_avx(auVar75,auVar76);
            fVar172 = auVar20._0_4_;
            fVar178 = auVar20._4_4_;
            fVar182 = auVar20._8_4_;
            fVar215 = auVar20._12_4_;
            fVar250 = auVar20._16_4_;
            fVar255 = auVar20._20_4_;
            fVar260 = auVar20._24_4_;
            fVar297 = fVar151 * fVar315 * fVar297;
            fVar366 = fVar173 * fVar324 * fVar366;
            auVar77._4_4_ = fVar366;
            auVar77._0_4_ = fVar297;
            fVar367 = fVar176 * fVar325 * fVar367;
            auVar77._8_4_ = fVar367;
            fVar368 = fVar179 * fVar332 * fVar368;
            auVar77._12_4_ = fVar368;
            fVar369 = fVar181 * fVar333 * fVar369;
            auVar77._16_4_ = fVar369;
            fVar371 = fVar183 * fVar334 * fVar371;
            auVar77._20_4_ = fVar371;
            fVar373 = fVar185 * fVar337 * fVar373;
            auVar77._24_4_ = fVar373;
            auVar77._28_4_ = auVar340._28_4_;
            local_840._4_4_ = fVar366 + auVar402._4_4_;
            local_840._0_4_ = fVar297 + auVar402._0_4_;
            uStack_838._0_4_ = fVar367 + auVar402._8_4_;
            uStack_838._4_4_ = fVar368 + auVar402._12_4_;
            uStack_830._0_4_ = fVar369 + auVar402._16_4_;
            uStack_830._4_4_ = fVar371 + auVar402._20_4_;
            uStack_828._0_4_ = fVar373 + auVar402._24_4_;
            uStack_828._4_4_ = auVar340._28_4_ + auVar402._28_4_;
            fVar297 = fVar151 * fVar315 * -fVar217;
            fVar366 = fVar173 * fVar324 * -fVar229;
            auVar78._4_4_ = fVar366;
            auVar78._0_4_ = fVar297;
            fVar367 = fVar176 * fVar325 * -fVar230;
            auVar78._8_4_ = fVar367;
            fVar368 = fVar179 * fVar332 * -fVar231;
            auVar78._12_4_ = fVar368;
            fVar369 = fVar181 * fVar333 * -fVar232;
            auVar78._16_4_ = fVar369;
            fVar371 = fVar183 * fVar334 * -fVar233;
            auVar78._20_4_ = fVar371;
            fVar373 = fVar185 * fVar337 * -fVar187;
            auVar78._24_4_ = fVar373;
            auVar78._28_4_ = -fVar207;
            local_860._4_4_ = local_880._4_4_ + fVar366;
            local_860._0_4_ = (float)local_880._0_4_ + fVar297;
            uStack_858._0_4_ = local_880._8_4_ + fVar367;
            uStack_858._4_4_ = local_880._12_4_ + fVar368;
            auStack_850._0_4_ = local_880._16_4_ + fVar369;
            auStack_850._4_4_ = local_880._20_4_ + fVar371;
            uStack_848._0_4_ = local_880._24_4_ + fVar373;
            uStack_848._4_4_ = local_880._28_4_ + -fVar207;
            fVar297 = fVar315 * 0.0 * fVar151;
            fVar366 = fVar324 * 0.0 * fVar173;
            auVar79._4_4_ = fVar366;
            auVar79._0_4_ = fVar297;
            fVar367 = fVar325 * 0.0 * fVar176;
            auVar79._8_4_ = fVar367;
            fVar368 = fVar332 * 0.0 * fVar179;
            auVar79._12_4_ = fVar368;
            fVar369 = fVar333 * 0.0 * fVar181;
            auVar79._16_4_ = fVar369;
            fVar371 = fVar334 * 0.0 * fVar183;
            auVar79._20_4_ = fVar371;
            fVar373 = fVar337 * 0.0 * fVar185;
            auVar79._24_4_ = fVar373;
            auVar79._28_4_ = fVar207;
            auVar25 = vsubps_avx(auVar402,auVar77);
            auVar403._0_4_ = fVar297 + auVar162._0_4_;
            auVar403._4_4_ = fVar366 + auVar162._4_4_;
            auVar403._8_4_ = fVar367 + auVar162._8_4_;
            auVar403._12_4_ = fVar368 + auVar162._12_4_;
            auVar403._16_4_ = fVar369 + auVar162._16_4_;
            auVar403._20_4_ = fVar371 + auVar162._20_4_;
            auVar403._24_4_ = fVar373 + auVar162._24_4_;
            auVar403._28_4_ = fVar207 + auVar162._28_4_;
            fVar297 = local_800._0_4_ * fVar172 * fVar299;
            fVar299 = local_800._4_4_ * fVar178 * fVar253;
            auVar80._4_4_ = fVar299;
            auVar80._0_4_ = fVar297;
            fVar366 = local_800._8_4_ * fVar182 * fVar258;
            auVar80._8_4_ = fVar366;
            fVar253 = local_800._12_4_ * fVar215 * fVar298;
            auVar80._12_4_ = fVar253;
            fVar367 = local_800._16_4_ * fVar250 * fVar361;
            auVar80._16_4_ = fVar367;
            fVar258 = local_800._20_4_ * fVar255 * fVar370;
            auVar80._20_4_ = fVar258;
            fVar368 = local_800._24_4_ * fVar260 * fVar372;
            auVar80._24_4_ = fVar368;
            auVar80._28_4_ = fVar186;
            auVar155 = vsubps_avx(local_880,auVar78);
            auVar386._0_4_ = auVar309._0_4_ + fVar297;
            auVar386._4_4_ = auVar309._4_4_ + fVar299;
            auVar386._8_4_ = auVar309._8_4_ + fVar366;
            auVar386._12_4_ = auVar309._12_4_ + fVar253;
            auVar386._16_4_ = auVar309._16_4_ + fVar367;
            auVar386._20_4_ = auVar309._20_4_ + fVar258;
            auVar386._24_4_ = auVar309._24_4_ + fVar368;
            auVar386._28_4_ = auVar309._28_4_ + fVar186;
            fVar297 = fVar172 * -fVar362 * local_800._0_4_;
            fVar299 = fVar178 * -fVar175 * local_800._4_4_;
            auVar81._4_4_ = fVar299;
            auVar81._0_4_ = fVar297;
            fVar366 = fVar182 * -fVar180 * local_800._8_4_;
            auVar81._8_4_ = fVar366;
            fVar253 = fVar215 * -fVar184 * local_800._12_4_;
            auVar81._12_4_ = fVar253;
            fVar367 = fVar250 * -fVar248 * local_800._16_4_;
            auVar81._16_4_ = fVar367;
            fVar258 = fVar255 * -fVar252 * local_800._20_4_;
            auVar81._20_4_ = fVar258;
            fVar368 = fVar260 * -fVar257 * local_800._24_4_;
            auVar81._24_4_ = fVar368;
            auVar81._28_4_ = auVar402._28_4_;
            auVar156 = vsubps_avx(auVar162,auVar79);
            auVar268._0_4_ = auVar288._0_4_ + fVar297;
            auVar268._4_4_ = auVar288._4_4_ + fVar299;
            auVar268._8_4_ = auVar288._8_4_ + fVar366;
            auVar268._12_4_ = auVar288._12_4_ + fVar253;
            auVar268._16_4_ = auVar288._16_4_ + fVar367;
            auVar268._20_4_ = auVar288._20_4_ + fVar258;
            auVar268._24_4_ = auVar288._24_4_ + fVar368;
            auVar268._28_4_ = auVar288._28_4_ + auVar402._28_4_;
            fVar297 = fVar172 * 0.0 * local_800._0_4_;
            fVar299 = fVar178 * 0.0 * local_800._4_4_;
            auVar82._4_4_ = fVar299;
            auVar82._0_4_ = fVar297;
            fVar366 = fVar182 * 0.0 * local_800._8_4_;
            auVar82._8_4_ = fVar366;
            fVar253 = fVar215 * 0.0 * local_800._12_4_;
            auVar82._12_4_ = fVar253;
            fVar367 = fVar250 * 0.0 * local_800._16_4_;
            auVar82._16_4_ = fVar367;
            fVar258 = fVar255 * 0.0 * local_800._20_4_;
            auVar82._20_4_ = fVar258;
            fVar368 = fVar260 * 0.0 * local_800._24_4_;
            auVar82._24_4_ = fVar368;
            auVar82._28_4_ = auVar162._28_4_;
            auVar340 = vsubps_avx(auVar309,auVar80);
            auVar135._4_4_ = fStack_61c;
            auVar135._0_4_ = local_620;
            auVar135._8_4_ = fStack_618;
            auVar135._12_4_ = fStack_614;
            auVar135._16_4_ = fStack_610;
            auVar135._20_4_ = fStack_60c;
            auVar135._24_4_ = fStack_608;
            auVar135._28_4_ = fStack_604;
            auVar344._0_4_ = local_620 + fVar297;
            auVar344._4_4_ = fStack_61c + fVar299;
            auVar344._8_4_ = fStack_618 + fVar366;
            auVar344._12_4_ = fStack_614 + fVar253;
            auVar344._16_4_ = fStack_610 + fVar367;
            auVar344._20_4_ = fStack_60c + fVar258;
            auVar344._24_4_ = fStack_608 + fVar368;
            auVar344._28_4_ = fStack_604 + auVar162._28_4_;
            auVar21 = vsubps_avx(auVar288,auVar81);
            auVar22 = vsubps_avx(auVar135,auVar82);
            auVar23 = vsubps_avx(auVar268,auVar155);
            auVar24 = vsubps_avx(auVar344,auVar156);
            auVar83._4_4_ = auVar156._4_4_ * auVar23._4_4_;
            auVar83._0_4_ = auVar156._0_4_ * auVar23._0_4_;
            auVar83._8_4_ = auVar156._8_4_ * auVar23._8_4_;
            auVar83._12_4_ = auVar156._12_4_ * auVar23._12_4_;
            auVar83._16_4_ = auVar156._16_4_ * auVar23._16_4_;
            auVar83._20_4_ = auVar156._20_4_ * auVar23._20_4_;
            auVar83._24_4_ = auVar156._24_4_ * auVar23._24_4_;
            auVar83._28_4_ = auVar379._28_4_;
            auVar84._4_4_ = auVar155._4_4_ * auVar24._4_4_;
            auVar84._0_4_ = auVar155._0_4_ * auVar24._0_4_;
            auVar84._8_4_ = auVar155._8_4_ * auVar24._8_4_;
            auVar84._12_4_ = auVar155._12_4_ * auVar24._12_4_;
            auVar84._16_4_ = auVar155._16_4_ * auVar24._16_4_;
            auVar84._20_4_ = auVar155._20_4_ * auVar24._20_4_;
            auVar84._24_4_ = auVar155._24_4_ * auVar24._24_4_;
            auVar84._28_4_ = fStack_604;
            auVar26 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar25._4_4_ * auVar24._4_4_;
            auVar85._0_4_ = auVar25._0_4_ * auVar24._0_4_;
            auVar85._8_4_ = auVar25._8_4_ * auVar24._8_4_;
            auVar85._12_4_ = auVar25._12_4_ * auVar24._12_4_;
            auVar85._16_4_ = auVar25._16_4_ * auVar24._16_4_;
            auVar85._20_4_ = auVar25._20_4_ * auVar24._20_4_;
            auVar85._24_4_ = auVar25._24_4_ * auVar24._24_4_;
            auVar85._28_4_ = auVar24._28_4_;
            auVar24 = vsubps_avx(auVar386,auVar25);
            auVar86._4_4_ = auVar156._4_4_ * auVar24._4_4_;
            auVar86._0_4_ = auVar156._0_4_ * auVar24._0_4_;
            auVar86._8_4_ = auVar156._8_4_ * auVar24._8_4_;
            auVar86._12_4_ = auVar156._12_4_ * auVar24._12_4_;
            auVar86._16_4_ = auVar156._16_4_ * auVar24._16_4_;
            auVar86._20_4_ = auVar156._20_4_ * auVar24._20_4_;
            auVar86._24_4_ = auVar156._24_4_ * auVar24._24_4_;
            auVar86._28_4_ = auVar20._28_4_;
            auVar28 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar155._4_4_ * auVar24._4_4_;
            auVar87._0_4_ = auVar155._0_4_ * auVar24._0_4_;
            auVar87._8_4_ = auVar155._8_4_ * auVar24._8_4_;
            auVar87._12_4_ = auVar155._12_4_ * auVar24._12_4_;
            auVar87._16_4_ = auVar155._16_4_ * auVar24._16_4_;
            auVar87._20_4_ = auVar155._20_4_ * auVar24._20_4_;
            auVar87._24_4_ = auVar155._24_4_ * auVar24._24_4_;
            auVar87._28_4_ = auVar20._28_4_;
            auVar88._4_4_ = auVar25._4_4_ * auVar23._4_4_;
            auVar88._0_4_ = auVar25._0_4_ * auVar23._0_4_;
            auVar88._8_4_ = auVar25._8_4_ * auVar23._8_4_;
            auVar88._12_4_ = auVar25._12_4_ * auVar23._12_4_;
            auVar88._16_4_ = auVar25._16_4_ * auVar23._16_4_;
            auVar88._20_4_ = auVar25._20_4_ * auVar23._20_4_;
            auVar88._24_4_ = auVar25._24_4_ * auVar23._24_4_;
            auVar88._28_4_ = auVar23._28_4_;
            auVar20 = vsubps_avx(auVar88,auVar87);
            auVar199._0_4_ = auVar26._0_4_ * 0.0 + auVar20._0_4_ + auVar28._0_4_ * 0.0;
            auVar199._4_4_ = auVar26._4_4_ * 0.0 + auVar20._4_4_ + auVar28._4_4_ * 0.0;
            auVar199._8_4_ = auVar26._8_4_ * 0.0 + auVar20._8_4_ + auVar28._8_4_ * 0.0;
            auVar199._12_4_ = auVar26._12_4_ * 0.0 + auVar20._12_4_ + auVar28._12_4_ * 0.0;
            auVar199._16_4_ = auVar26._16_4_ * 0.0 + auVar20._16_4_ + auVar28._16_4_ * 0.0;
            auVar199._20_4_ = auVar26._20_4_ * 0.0 + auVar20._20_4_ + auVar28._20_4_ * 0.0;
            auVar199._24_4_ = auVar26._24_4_ * 0.0 + auVar20._24_4_ + auVar28._24_4_ * 0.0;
            auVar199._28_4_ = auVar26._28_4_ + auVar20._28_4_ + auVar28._28_4_;
            auVar19 = vcmpps_avx(auVar199,ZEXT832(0) << 0x20,2);
            auVar340 = vblendvps_avx(auVar340,_local_840,auVar19);
            auVar246 = ZEXT3264(auVar340);
            auVar20 = vblendvps_avx(auVar21,_local_860,auVar19);
            auVar21 = vblendvps_avx(auVar22,auVar403,auVar19);
            auVar22 = vblendvps_avx(auVar25,auVar386,auVar19);
            auVar23 = vblendvps_avx(auVar155,auVar268,auVar19);
            auVar24 = vblendvps_avx(auVar156,auVar344,auVar19);
            auVar25 = vblendvps_avx(auVar386,auVar25,auVar19);
            auVar26 = vblendvps_avx(auVar268,auVar155,auVar19);
            auVar28 = vblendvps_avx(auVar344,auVar156,auVar19);
            local_880 = vandps_avx(auVar197,auVar154);
            auVar25 = vsubps_avx(auVar25,auVar340);
            auVar191 = vsubps_avx(auVar26,auVar20);
            auVar28 = vsubps_avx(auVar28,auVar21);
            auVar192 = vsubps_avx(auVar20,auVar23);
            fVar297 = auVar191._0_4_;
            fVar262 = auVar21._0_4_;
            fVar298 = auVar191._4_4_;
            fVar216 = auVar21._4_4_;
            auVar89._4_4_ = fVar216 * fVar298;
            auVar89._0_4_ = fVar262 * fVar297;
            fVar362 = auVar191._8_4_;
            fVar314 = auVar21._8_4_;
            auVar89._8_4_ = fVar314 * fVar362;
            fVar215 = auVar191._12_4_;
            fVar274 = auVar21._12_4_;
            auVar89._12_4_ = fVar274 * fVar215;
            fVar315 = auVar191._16_4_;
            fVar279 = auVar21._16_4_;
            auVar89._16_4_ = fVar279 * fVar315;
            fVar217 = auVar191._20_4_;
            fVar291 = auVar21._20_4_;
            auVar89._20_4_ = fVar291 * fVar217;
            fVar207 = auVar191._24_4_;
            fVar293 = auVar21._24_4_;
            auVar89._24_4_ = fVar293 * fVar207;
            auVar89._28_4_ = auVar26._28_4_;
            fVar299 = auVar20._0_4_;
            fVar295 = auVar28._0_4_;
            fVar369 = auVar20._4_4_;
            fVar300 = auVar28._4_4_;
            auVar90._4_4_ = fVar300 * fVar369;
            auVar90._0_4_ = fVar295 * fVar299;
            fVar172 = auVar20._8_4_;
            fVar311 = auVar28._8_4_;
            auVar90._8_4_ = fVar311 * fVar172;
            fVar248 = auVar20._12_4_;
            fVar312 = auVar28._12_4_;
            auVar90._12_4_ = fVar312 * fVar248;
            fVar324 = auVar20._16_4_;
            fVar313 = auVar28._16_4_;
            auVar90._16_4_ = fVar313 * fVar324;
            fVar229 = auVar20._20_4_;
            fVar335 = auVar28._20_4_;
            auVar90._20_4_ = fVar335 * fVar229;
            fVar208 = auVar20._24_4_;
            fVar346 = auVar28._24_4_;
            uVar338 = auVar155._28_4_;
            auVar90._24_4_ = fVar346 * fVar208;
            auVar90._28_4_ = uVar338;
            auVar26 = vsubps_avx(auVar90,auVar89);
            fVar366 = auVar340._0_4_;
            fVar361 = auVar340._4_4_;
            auVar91._4_4_ = fVar300 * fVar361;
            auVar91._0_4_ = fVar295 * fVar366;
            fVar175 = auVar340._8_4_;
            auVar91._8_4_ = fVar311 * fVar175;
            fVar250 = auVar340._12_4_;
            auVar91._12_4_ = fVar312 * fVar250;
            fVar325 = auVar340._16_4_;
            auVar91._16_4_ = fVar313 * fVar325;
            fVar230 = auVar340._20_4_;
            auVar91._20_4_ = fVar335 * fVar230;
            fVar209 = auVar340._24_4_;
            auVar91._24_4_ = fVar346 * fVar209;
            auVar91._28_4_ = uVar338;
            fVar253 = auVar25._0_4_;
            fVar371 = auVar25._4_4_;
            auVar92._4_4_ = fVar216 * fVar371;
            auVar92._0_4_ = fVar262 * fVar253;
            fVar178 = auVar25._8_4_;
            auVar92._8_4_ = fVar314 * fVar178;
            fVar252 = auVar25._12_4_;
            auVar92._12_4_ = fVar274 * fVar252;
            fVar332 = auVar25._16_4_;
            auVar92._16_4_ = fVar279 * fVar332;
            fVar231 = auVar25._20_4_;
            auVar92._20_4_ = fVar291 * fVar231;
            fVar210 = auVar25._24_4_;
            auVar92._24_4_ = fVar293 * fVar210;
            auVar92._28_4_ = auVar386._28_4_;
            auVar155 = vsubps_avx(auVar92,auVar91);
            auVar93._4_4_ = fVar369 * fVar371;
            auVar93._0_4_ = fVar299 * fVar253;
            auVar93._8_4_ = fVar172 * fVar178;
            auVar93._12_4_ = fVar248 * fVar252;
            auVar93._16_4_ = fVar324 * fVar332;
            auVar93._20_4_ = fVar229 * fVar231;
            auVar93._24_4_ = fVar208 * fVar210;
            auVar93._28_4_ = uVar338;
            auVar94._4_4_ = fVar361 * fVar298;
            auVar94._0_4_ = fVar366 * fVar297;
            auVar94._8_4_ = fVar175 * fVar362;
            auVar94._12_4_ = fVar250 * fVar215;
            auVar94._16_4_ = fVar325 * fVar315;
            auVar94._20_4_ = fVar230 * fVar217;
            auVar94._24_4_ = fVar209 * fVar207;
            auVar94._28_4_ = auVar156._28_4_;
            auVar156 = vsubps_avx(auVar94,auVar93);
            auVar193 = vsubps_avx(auVar21,auVar24);
            fVar258 = auVar156._28_4_ + auVar155._28_4_;
            auVar357._0_4_ = auVar156._0_4_ + auVar155._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
            auVar357._4_4_ = auVar156._4_4_ + auVar155._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
            auVar357._8_4_ = auVar156._8_4_ + auVar155._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
            auVar357._12_4_ = auVar156._12_4_ + auVar155._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
            auVar357._16_4_ = auVar156._16_4_ + auVar155._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
            auVar357._20_4_ = auVar156._20_4_ + auVar155._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
            auVar357._24_4_ = auVar156._24_4_ + auVar155._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
            auVar357._28_4_ = fVar258 + auVar26._28_4_;
            fVar367 = auVar192._0_4_;
            fVar370 = auVar192._4_4_;
            auVar95._4_4_ = auVar24._4_4_ * fVar370;
            auVar95._0_4_ = auVar24._0_4_ * fVar367;
            fVar180 = auVar192._8_4_;
            auVar95._8_4_ = auVar24._8_4_ * fVar180;
            fVar255 = auVar192._12_4_;
            auVar95._12_4_ = auVar24._12_4_ * fVar255;
            fVar333 = auVar192._16_4_;
            auVar95._16_4_ = auVar24._16_4_ * fVar333;
            fVar232 = auVar192._20_4_;
            auVar95._20_4_ = auVar24._20_4_ * fVar232;
            fVar212 = auVar192._24_4_;
            auVar95._24_4_ = auVar24._24_4_ * fVar212;
            auVar95._28_4_ = fVar258;
            fVar258 = auVar193._0_4_;
            fVar373 = auVar193._4_4_;
            auVar96._4_4_ = auVar23._4_4_ * fVar373;
            auVar96._0_4_ = auVar23._0_4_ * fVar258;
            fVar182 = auVar193._8_4_;
            auVar96._8_4_ = auVar23._8_4_ * fVar182;
            fVar257 = auVar193._12_4_;
            auVar96._12_4_ = auVar23._12_4_ * fVar257;
            fVar334 = auVar193._16_4_;
            auVar96._16_4_ = auVar23._16_4_ * fVar334;
            fVar233 = auVar193._20_4_;
            auVar96._20_4_ = auVar23._20_4_ * fVar233;
            fVar213 = auVar193._24_4_;
            auVar96._24_4_ = auVar23._24_4_ * fVar213;
            auVar96._28_4_ = auVar156._28_4_;
            auVar155 = vsubps_avx(auVar96,auVar95);
            auVar156 = vsubps_avx(auVar340,auVar22);
            fVar368 = auVar156._0_4_;
            fVar372 = auVar156._4_4_;
            auVar97._4_4_ = auVar24._4_4_ * fVar372;
            auVar97._0_4_ = auVar24._0_4_ * fVar368;
            fVar184 = auVar156._8_4_;
            auVar97._8_4_ = auVar24._8_4_ * fVar184;
            fVar260 = auVar156._12_4_;
            auVar97._12_4_ = auVar24._12_4_ * fVar260;
            fVar337 = auVar156._16_4_;
            auVar97._16_4_ = auVar24._16_4_ * fVar337;
            fVar187 = auVar156._20_4_;
            auVar97._20_4_ = auVar24._20_4_ * fVar187;
            fVar214 = auVar156._24_4_;
            auVar97._24_4_ = auVar24._24_4_ * fVar214;
            auVar97._28_4_ = auVar24._28_4_;
            auVar98._4_4_ = fVar373 * auVar22._4_4_;
            auVar98._0_4_ = fVar258 * auVar22._0_4_;
            auVar98._8_4_ = fVar182 * auVar22._8_4_;
            auVar98._12_4_ = fVar257 * auVar22._12_4_;
            auVar98._16_4_ = fVar334 * auVar22._16_4_;
            auVar98._20_4_ = fVar233 * auVar22._20_4_;
            auVar98._24_4_ = fVar213 * auVar22._24_4_;
            auVar98._28_4_ = auVar26._28_4_;
            auVar24 = vsubps_avx(auVar97,auVar98);
            auVar99._4_4_ = auVar23._4_4_ * fVar372;
            auVar99._0_4_ = auVar23._0_4_ * fVar368;
            auVar99._8_4_ = auVar23._8_4_ * fVar184;
            auVar99._12_4_ = auVar23._12_4_ * fVar260;
            auVar99._16_4_ = auVar23._16_4_ * fVar337;
            auVar99._20_4_ = auVar23._20_4_ * fVar187;
            auVar99._24_4_ = auVar23._24_4_ * fVar214;
            auVar99._28_4_ = auVar23._28_4_;
            auVar100._4_4_ = fVar370 * auVar22._4_4_;
            auVar100._0_4_ = fVar367 * auVar22._0_4_;
            auVar100._8_4_ = fVar180 * auVar22._8_4_;
            auVar100._12_4_ = fVar255 * auVar22._12_4_;
            auVar100._16_4_ = fVar333 * auVar22._16_4_;
            auVar100._20_4_ = fVar232 * auVar22._20_4_;
            auVar100._24_4_ = fVar212 * auVar22._24_4_;
            auVar100._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar100,auVar99);
            auVar163._0_4_ = auVar155._0_4_ * 0.0 + auVar22._0_4_ + auVar24._0_4_ * 0.0;
            auVar163._4_4_ = auVar155._4_4_ * 0.0 + auVar22._4_4_ + auVar24._4_4_ * 0.0;
            auVar163._8_4_ = auVar155._8_4_ * 0.0 + auVar22._8_4_ + auVar24._8_4_ * 0.0;
            auVar163._12_4_ = auVar155._12_4_ * 0.0 + auVar22._12_4_ + auVar24._12_4_ * 0.0;
            auVar163._16_4_ = auVar155._16_4_ * 0.0 + auVar22._16_4_ + auVar24._16_4_ * 0.0;
            auVar163._20_4_ = auVar155._20_4_ * 0.0 + auVar22._20_4_ + auVar24._20_4_ * 0.0;
            auVar163._24_4_ = auVar155._24_4_ * 0.0 + auVar22._24_4_ + auVar24._24_4_ * 0.0;
            auVar163._28_4_ = auVar24._28_4_ + auVar22._28_4_ + auVar24._28_4_;
            auVar170 = ZEXT3264(auVar163);
            auVar22 = vmaxps_avx(auVar357,auVar163);
            auVar22 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,2);
            auVar270 = ZEXT3264(local_880);
            auVar23 = local_880 & auVar22;
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar23 >> 0x7f,0) == '\0') &&
                  (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0xbf,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar23[0x1f]) {
LAB_01193505:
              auVar201._8_8_ = uStack_598;
              auVar201._0_8_ = local_5a0;
              auVar201._16_8_ = uStack_590;
              auVar201._24_8_ = uStack_588;
              auVar396._4_4_ = fVar173;
              auVar396._0_4_ = fVar151;
              auVar396._8_4_ = fVar176;
              auVar396._12_4_ = fVar179;
              auVar396._16_4_ = fVar181;
              auVar396._20_4_ = fVar183;
              auVar396._24_4_ = fVar185;
              auVar396._28_4_ = fVar186;
            }
            else {
              auVar23 = vandps_avx(auVar22,local_880);
              auVar101._4_4_ = fVar373 * fVar298;
              auVar101._0_4_ = fVar258 * fVar297;
              auVar101._8_4_ = fVar182 * fVar362;
              auVar101._12_4_ = fVar257 * fVar215;
              auVar101._16_4_ = fVar334 * fVar315;
              auVar101._20_4_ = fVar233 * fVar217;
              auVar101._24_4_ = fVar213 * fVar207;
              auVar101._28_4_ = local_880._28_4_;
              auVar102._4_4_ = fVar370 * fVar300;
              auVar102._0_4_ = fVar367 * fVar295;
              auVar102._8_4_ = fVar180 * fVar311;
              auVar102._12_4_ = fVar255 * fVar312;
              auVar102._16_4_ = fVar333 * fVar313;
              auVar102._20_4_ = fVar232 * fVar335;
              auVar102._24_4_ = fVar212 * fVar346;
              auVar102._28_4_ = auVar22._28_4_;
              auVar24 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar372 * fVar300;
              auVar103._0_4_ = fVar368 * fVar295;
              auVar103._8_4_ = fVar184 * fVar311;
              auVar103._12_4_ = fVar260 * fVar312;
              auVar103._16_4_ = fVar337 * fVar313;
              auVar103._20_4_ = fVar187 * fVar335;
              auVar103._24_4_ = fVar214 * fVar346;
              auVar103._28_4_ = auVar28._28_4_;
              auVar104._4_4_ = fVar373 * fVar371;
              auVar104._0_4_ = fVar258 * fVar253;
              auVar104._8_4_ = fVar182 * fVar178;
              auVar104._12_4_ = fVar257 * fVar252;
              auVar104._16_4_ = fVar334 * fVar332;
              auVar104._20_4_ = fVar233 * fVar231;
              auVar104._24_4_ = fVar213 * fVar210;
              auVar104._28_4_ = auVar193._28_4_;
              auVar26 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar370 * fVar371;
              auVar105._0_4_ = fVar367 * fVar253;
              auVar105._8_4_ = fVar180 * fVar178;
              auVar105._12_4_ = fVar255 * fVar252;
              auVar105._16_4_ = fVar333 * fVar332;
              auVar105._20_4_ = fVar232 * fVar231;
              auVar105._24_4_ = fVar212 * fVar210;
              auVar105._28_4_ = auVar25._28_4_;
              auVar106._4_4_ = fVar372 * fVar298;
              auVar106._0_4_ = fVar368 * fVar297;
              auVar106._8_4_ = fVar184 * fVar362;
              auVar106._12_4_ = fVar260 * fVar215;
              auVar106._16_4_ = fVar337 * fVar315;
              auVar106._20_4_ = fVar187 * fVar217;
              auVar106._24_4_ = fVar214 * fVar207;
              auVar106._28_4_ = auVar191._28_4_;
              auVar28 = vsubps_avx(auVar106,auVar105);
              auVar200._0_4_ = auVar24._0_4_ * 0.0 + auVar28._0_4_ + auVar26._0_4_ * 0.0;
              auVar200._4_4_ = auVar24._4_4_ * 0.0 + auVar28._4_4_ + auVar26._4_4_ * 0.0;
              auVar200._8_4_ = auVar24._8_4_ * 0.0 + auVar28._8_4_ + auVar26._8_4_ * 0.0;
              auVar200._12_4_ = auVar24._12_4_ * 0.0 + auVar28._12_4_ + auVar26._12_4_ * 0.0;
              auVar200._16_4_ = auVar24._16_4_ * 0.0 + auVar28._16_4_ + auVar26._16_4_ * 0.0;
              auVar200._20_4_ = auVar24._20_4_ * 0.0 + auVar28._20_4_ + auVar26._20_4_ * 0.0;
              auVar200._24_4_ = auVar24._24_4_ * 0.0 + auVar28._24_4_ + auVar26._24_4_ * 0.0;
              auVar200._28_4_ = auVar191._28_4_ + auVar28._28_4_ + auVar25._28_4_;
              auVar22 = vrcpps_avx(auVar200);
              fVar297 = auVar22._0_4_;
              fVar253 = auVar22._4_4_;
              auVar107._4_4_ = auVar200._4_4_ * fVar253;
              auVar107._0_4_ = auVar200._0_4_ * fVar297;
              fVar367 = auVar22._8_4_;
              auVar107._8_4_ = auVar200._8_4_ * fVar367;
              fVar258 = auVar22._12_4_;
              auVar107._12_4_ = auVar200._12_4_ * fVar258;
              fVar368 = auVar22._16_4_;
              auVar107._16_4_ = auVar200._16_4_ * fVar368;
              fVar298 = auVar22._20_4_;
              auVar107._20_4_ = auVar200._20_4_ * fVar298;
              fVar371 = auVar22._24_4_;
              auVar107._24_4_ = auVar200._24_4_ * fVar371;
              auVar107._28_4_ = auVar193._28_4_;
              auVar380._8_4_ = 0x3f800000;
              auVar380._0_8_ = &DAT_3f8000003f800000;
              auVar380._12_4_ = 0x3f800000;
              auVar380._16_4_ = 0x3f800000;
              auVar380._20_4_ = 0x3f800000;
              auVar380._24_4_ = 0x3f800000;
              auVar380._28_4_ = 0x3f800000;
              auVar22 = vsubps_avx(auVar380,auVar107);
              fVar297 = auVar22._0_4_ * fVar297 + fVar297;
              fVar253 = auVar22._4_4_ * fVar253 + fVar253;
              fVar367 = auVar22._8_4_ * fVar367 + fVar367;
              fVar258 = auVar22._12_4_ * fVar258 + fVar258;
              fVar368 = auVar22._16_4_ * fVar368 + fVar368;
              fVar298 = auVar22._20_4_ * fVar298 + fVar298;
              fVar371 = auVar22._24_4_ * fVar371 + fVar371;
              auVar108._4_4_ =
                   (fVar361 * auVar24._4_4_ + auVar26._4_4_ * fVar369 + auVar28._4_4_ * fVar216) *
                   fVar253;
              auVar108._0_4_ =
                   (fVar366 * auVar24._0_4_ + auVar26._0_4_ * fVar299 + auVar28._0_4_ * fVar262) *
                   fVar297;
              auVar108._8_4_ =
                   (fVar175 * auVar24._8_4_ + auVar26._8_4_ * fVar172 + auVar28._8_4_ * fVar314) *
                   fVar367;
              auVar108._12_4_ =
                   (fVar250 * auVar24._12_4_ + auVar26._12_4_ * fVar248 + auVar28._12_4_ * fVar274)
                   * fVar258;
              auVar108._16_4_ =
                   (fVar325 * auVar24._16_4_ + auVar26._16_4_ * fVar324 + auVar28._16_4_ * fVar279)
                   * fVar368;
              auVar108._20_4_ =
                   (fVar230 * auVar24._20_4_ + auVar26._20_4_ * fVar229 + auVar28._20_4_ * fVar291)
                   * fVar298;
              auVar108._24_4_ =
                   (fVar209 * auVar24._24_4_ + auVar26._24_4_ * fVar208 + auVar28._24_4_ * fVar293)
                   * fVar371;
              auVar108._28_4_ = auVar340._28_4_ + auVar20._28_4_ + auVar21._28_4_;
              auVar246 = ZEXT3264(auVar108);
              uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar269._4_4_ = uVar338;
              auVar269._0_4_ = uVar338;
              auVar269._8_4_ = uVar338;
              auVar269._12_4_ = uVar338;
              auVar269._16_4_ = uVar338;
              auVar269._20_4_ = uVar338;
              auVar269._24_4_ = uVar338;
              auVar269._28_4_ = uVar338;
              auVar340 = vcmpps_avx(_local_360,auVar108,2);
              auVar20 = vcmpps_avx(auVar108,auVar269,2);
              auVar270 = ZEXT3264(auVar20);
              auVar340 = vandps_avx(auVar340,auVar20);
              auVar21 = auVar23 & auVar340;
              if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar21 >> 0x7f,0) == '\0') &&
                    (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar21 >> 0xbf,0) == '\0') &&
                  (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar21[0x1f]) goto LAB_01193505;
              auVar340 = vandps_avx(auVar23,auVar340);
              auVar21 = vcmpps_avx(ZEXT832(0) << 0x20,auVar200,4);
              auVar22 = auVar340 & auVar21;
              auVar201._8_8_ = uStack_598;
              auVar201._0_8_ = local_5a0;
              auVar201._16_8_ = uStack_590;
              auVar201._24_8_ = uStack_588;
              auVar396._4_4_ = fVar173;
              auVar396._0_4_ = fVar151;
              auVar396._8_4_ = fVar176;
              auVar396._12_4_ = fVar179;
              auVar396._16_4_ = fVar181;
              auVar396._20_4_ = fVar183;
              auVar396._24_4_ = fVar185;
              auVar396._28_4_ = fVar186;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar201 = vandps_avx(auVar21,auVar340);
                auVar109._4_4_ = auVar357._4_4_ * fVar253;
                auVar109._0_4_ = auVar357._0_4_ * fVar297;
                auVar109._8_4_ = auVar357._8_4_ * fVar367;
                auVar109._12_4_ = auVar357._12_4_ * fVar258;
                auVar109._16_4_ = auVar357._16_4_ * fVar368;
                auVar109._20_4_ = auVar357._20_4_ * fVar298;
                auVar109._24_4_ = auVar357._24_4_ * fVar371;
                auVar109._28_4_ = auVar20._28_4_;
                auVar110._4_4_ = auVar163._4_4_ * fVar253;
                auVar110._0_4_ = auVar163._0_4_ * fVar297;
                auVar110._8_4_ = auVar163._8_4_ * fVar367;
                auVar110._12_4_ = auVar163._12_4_ * fVar258;
                auVar110._16_4_ = auVar163._16_4_ * fVar368;
                auVar110._20_4_ = auVar163._20_4_ * fVar298;
                auVar110._24_4_ = auVar163._24_4_ * fVar371;
                auVar110._28_4_ = auVar163._28_4_;
                auVar310._8_4_ = 0x3f800000;
                auVar310._0_8_ = &DAT_3f8000003f800000;
                auVar310._12_4_ = 0x3f800000;
                auVar310._16_4_ = 0x3f800000;
                auVar310._20_4_ = 0x3f800000;
                auVar310._24_4_ = 0x3f800000;
                auVar310._28_4_ = 0x3f800000;
                auVar340 = vsubps_avx(auVar310,auVar109);
                local_e0 = vblendvps_avx(auVar340,auVar109,auVar19);
                auVar340 = vsubps_avx(auVar310,auVar110);
                auVar270 = ZEXT3264(auVar340);
                _local_3c0 = vblendvps_avx(auVar340,auVar110,auVar19);
                auVar170 = ZEXT3264(_local_3c0);
                local_580 = auVar108;
              }
            }
            auVar365 = ZEXT3264(local_660);
            local_560 = auVar197;
            if ((((((((auVar201 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar201 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar201 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar201 >> 0x7f,0) != '\0') ||
                  (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar201 >> 0xbf,0) != '\0') ||
                (auVar201 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar201[0x1f] < '\0') {
              auVar340 = vsubps_avx(local_800,auVar396);
              auVar246 = ZEXT3264(local_e0);
              fVar299 = auVar396._0_4_ + auVar340._0_4_ * local_e0._0_4_;
              fVar366 = auVar396._4_4_ + auVar340._4_4_ * local_e0._4_4_;
              fVar253 = auVar396._8_4_ + auVar340._8_4_ * local_e0._8_4_;
              fVar367 = auVar396._12_4_ + auVar340._12_4_ * local_e0._12_4_;
              fVar258 = auVar396._16_4_ + auVar340._16_4_ * local_e0._16_4_;
              fVar368 = auVar396._20_4_ + auVar340._20_4_ * local_e0._20_4_;
              fVar298 = auVar396._24_4_ + auVar340._24_4_ * local_e0._24_4_;
              fVar369 = auVar396._28_4_ + auVar340._28_4_;
              fVar297 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar111._4_4_ = (fVar366 + fVar366) * fVar297;
              auVar111._0_4_ = (fVar299 + fVar299) * fVar297;
              auVar111._8_4_ = (fVar253 + fVar253) * fVar297;
              auVar111._12_4_ = (fVar367 + fVar367) * fVar297;
              auVar111._16_4_ = (fVar258 + fVar258) * fVar297;
              auVar111._20_4_ = (fVar368 + fVar368) * fVar297;
              auVar111._24_4_ = (fVar298 + fVar298) * fVar297;
              auVar111._28_4_ = fVar369 + fVar369;
              auVar270 = ZEXT3264(local_580);
              auVar340 = vcmpps_avx(local_580,auVar111,6);
              auVar170 = ZEXT3264(auVar340);
              auVar20 = auVar201 & auVar340;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                local_440 = vandps_avx(auVar340,auVar201);
                auVar170 = ZEXT3264(local_440);
                local_4e0 = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
                fStack_4dc = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
                fStack_4d8 = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
                fStack_4d4 = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
                fStack_4d0 = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
                fStack_4cc = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
                fStack_4c8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
                fStack_4c4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
                local_500 = local_e0;
                local_3c0._4_4_ = fStack_4dc;
                local_3c0._0_4_ = local_4e0;
                uStack_3b8._0_4_ = fStack_4d8;
                uStack_3b8._4_4_ = fStack_4d4;
                uStack_3b0._0_4_ = fStack_4d0;
                uStack_3b0._4_4_ = fStack_4cc;
                auVar140 = _local_3c0;
                uStack_3a8._0_4_ = fStack_4c8;
                uStack_3a8._4_4_ = fStack_4c4;
                auVar340 = _local_3c0;
                local_4c0 = local_580;
                local_480 = local_8c0;
                fStack_47c = fStack_8bc;
                fStack_478 = fStack_8b8;
                fStack_474 = fStack_8b4;
                local_470 = local_6f0;
                uStack_468 = uStack_6e8;
                local_460 = local_700;
                uStack_458 = uStack_6f8;
                pGVar144 = (context->scene->geometries).items[uVar141].ptr;
                _local_3c0 = auVar340;
                if ((pGVar144->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar237 = vshufps_avx(ZEXT416((uint)(float)(int)local_4a0),
                                         ZEXT416((uint)(float)(int)local_4a0),0);
                  local_420[0] = (auVar237._0_4_ + local_e0._0_4_ + 0.0) * (float)local_380._0_4_;
                  local_420[1] = (auVar237._4_4_ + local_e0._4_4_ + 1.0) * (float)local_380._4_4_;
                  local_420[2] = (auVar237._8_4_ + local_e0._8_4_ + 2.0) * fStack_378;
                  local_420[3] = (auVar237._12_4_ + local_e0._12_4_ + 3.0) * fStack_374;
                  fStack_410 = (auVar237._0_4_ + local_e0._16_4_ + 4.0) * fStack_370;
                  fStack_40c = (auVar237._4_4_ + local_e0._20_4_ + 5.0) * fStack_36c;
                  fStack_408 = (auVar237._8_4_ + local_e0._24_4_ + 6.0) * fStack_368;
                  fStack_404 = auVar237._12_4_ + local_e0._28_4_ + 7.0;
                  uStack_3b0 = auVar140._16_8_;
                  uStack_3a8 = auVar340._24_8_;
                  local_400 = local_3c0;
                  uStack_3f8 = uStack_3b8;
                  uStack_3f0 = uStack_3b0;
                  uStack_3e8 = uStack_3a8;
                  local_3e0 = local_580;
                  auVar202._8_4_ = 0x7f800000;
                  auVar202._0_8_ = 0x7f8000007f800000;
                  auVar202._12_4_ = 0x7f800000;
                  auVar202._16_4_ = 0x7f800000;
                  auVar202._20_4_ = 0x7f800000;
                  auVar202._24_4_ = 0x7f800000;
                  auVar202._28_4_ = 0x7f800000;
                  auVar340 = vblendvps_avx(auVar202,local_580,local_440);
                  auVar20 = vshufps_avx(auVar340,auVar340,0xb1);
                  auVar20 = vminps_avx(auVar340,auVar20);
                  auVar21 = vshufpd_avx(auVar20,auVar20,5);
                  auVar20 = vminps_avx(auVar20,auVar21);
                  auVar21 = vperm2f128_avx(auVar20,auVar20,1);
                  auVar20 = vminps_avx(auVar20,auVar21);
                  auVar20 = vcmpps_avx(auVar340,auVar20,0);
                  auVar21 = local_440 & auVar20;
                  auVar340 = local_440;
                  if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar21 >> 0x7f,0) != '\0') ||
                        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar21 >> 0xbf,0) != '\0') ||
                      (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar21[0x1f] < '\0') {
                    auVar340 = vandps_avx(auVar20,local_440);
                  }
                  uVar143 = vmovmskps_avx(auVar340);
                  local_920 = 0;
                  if (uVar143 != 0) {
                    for (; (uVar143 >> local_920 & 1) == 0; local_920 = local_920 + 1) {
                    }
                  }
                  uVar147 = (ulong)local_920;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar144->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar297 = local_420[uVar147];
                    auVar170 = ZEXT464((uint)fVar297);
                    uVar338 = *(undefined4 *)((long)&local_400 + uVar147 * 4);
                    fVar366 = 1.0 - fVar297;
                    fVar299 = fVar297 * fVar366 + fVar297 * fVar366;
                    auVar237 = ZEXT416((uint)(fVar297 * fVar297 * 3.0));
                    auVar237 = vshufps_avx(auVar237,auVar237,0);
                    auVar211 = ZEXT416((uint)((fVar299 - fVar297 * fVar297) * 3.0));
                    auVar211 = vshufps_avx(auVar211,auVar211,0);
                    auVar236 = ZEXT416((uint)((fVar366 * fVar366 - fVar299) * 3.0));
                    auVar236 = vshufps_avx(auVar236,auVar236,0);
                    fVar299 = local_8c0 * auVar236._0_4_;
                    fVar253 = fStack_8bc * auVar236._4_4_;
                    fVar367 = fStack_8b8 * auVar236._8_4_;
                    fVar258 = fStack_8b4 * auVar236._12_4_;
                    auVar270 = ZEXT1664(CONCAT412(fVar258,CONCAT48(fVar367,CONCAT44(fVar253,fVar299)
                                                                  )));
                    auVar236 = ZEXT416((uint)(fVar366 * fVar366 * -3.0));
                    auVar236 = vshufps_avx(auVar236,auVar236,0);
                    auVar221._0_4_ =
                         fVar247 * auVar236._0_4_ +
                         fVar299 + auVar237._0_4_ * (float)local_700._0_4_ +
                                   auVar211._0_4_ * (float)local_6f0._0_4_;
                    auVar221._4_4_ =
                         fVar249 * auVar236._4_4_ +
                         fVar253 + auVar237._4_4_ * (float)local_700._4_4_ +
                                   auVar211._4_4_ * (float)local_6f0._4_4_;
                    auVar221._8_4_ =
                         fVar254 * auVar236._8_4_ +
                         fVar367 + auVar237._8_4_ * (float)uStack_6f8 +
                                   auVar211._8_4_ * (float)uStack_6e8;
                    auVar221._12_4_ =
                         fVar256 * auVar236._12_4_ +
                         fVar258 + auVar237._12_4_ * uStack_6f8._4_4_ +
                                   auVar211._12_4_ * uStack_6e8._4_4_;
                    auVar246 = ZEXT464(*(uint *)(local_3e0 + uVar147 * 4));
                    *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3e0 + uVar147 * 4);
                    *(float *)(ray + k * 4 + 0x180) = auVar221._0_4_;
                    uVar17 = vextractps_avx(auVar221,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar17;
                    uVar17 = vextractps_avx(auVar221,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar17;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar297;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar338;
                    *(uint *)(ray + k * 4 + 0x220) = uVar145;
                    *(uint *)(ray + k * 4 + 0x240) = uVar141;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_810 = auVar309._16_16_;
                    _local_820 = auVar27;
                    auStack_730 = auVar288._16_16_;
                    _local_740 = _local_6f0;
                    _local_840 = _local_700;
                    auStack_850 = (undefined1  [8])*local_7b8;
                    _local_860 = *local_7b0;
                    uStack_848 = local_7b8[1];
                    local_800._0_8_ = pGVar144;
                    auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_7a0 = auVar154;
                    local_5e0 = local_440;
                    local_49c = uVar16;
                    local_490 = local_900;
                    uStack_488 = uStack_8f8;
                    do {
                      uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
                      uVar147 = (ulong)local_920;
                      local_1e0 = local_420[uVar147];
                      local_1c0 = *(undefined4 *)((long)&local_400 + uVar147 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_3e0 + uVar147 * 4);
                      fVar299 = 1.0 - local_1e0;
                      fVar297 = local_1e0 * fVar299 + local_1e0 * fVar299;
                      auVar237 = ZEXT416((uint)(local_1e0 * local_1e0 * 3.0));
                      auVar237 = vshufps_avx(auVar237,auVar237,0);
                      auVar211 = ZEXT416((uint)((fVar297 - local_1e0 * local_1e0) * 3.0));
                      auVar211 = vshufps_avx(auVar211,auVar211,0);
                      auVar264._0_4_ =
                           auVar237._0_4_ * (float)local_840._0_4_ +
                           auVar211._0_4_ * (float)local_740._0_4_;
                      auVar264._4_4_ =
                           auVar237._4_4_ * (float)local_840._4_4_ +
                           auVar211._4_4_ * (float)local_740._4_4_;
                      auVar264._8_4_ =
                           auVar237._8_4_ * (float)uStack_838 + auVar211._8_4_ * (float)uStack_738;
                      auVar264._12_4_ =
                           auVar237._12_4_ * uStack_838._4_4_ + auVar211._12_4_ * uStack_738._4_4_;
                      auVar270 = ZEXT1664(auVar264);
                      auVar237 = ZEXT416((uint)((fVar299 * fVar299 - fVar297) * 3.0));
                      auVar237 = vshufps_avx(auVar237,auVar237,0);
                      local_8b0.context = context->user;
                      auVar211 = ZEXT416((uint)(fVar299 * fVar299 * -3.0));
                      auVar211 = vshufps_avx(auVar211,auVar211,0);
                      auVar222._0_4_ =
                           fVar247 * auVar211._0_4_ +
                           auVar237._0_4_ * (float)local_820._0_4_ + auVar264._0_4_;
                      auVar222._4_4_ =
                           fVar249 * auVar211._4_4_ +
                           auVar237._4_4_ * (float)local_820._4_4_ + auVar264._4_4_;
                      auVar222._8_4_ =
                           fVar254 * auVar211._8_4_ + auVar237._8_4_ * fStack_818 + auVar264._8_4_;
                      auVar222._12_4_ =
                           fVar256 * auVar211._12_4_ +
                           auVar237._12_4_ * fStack_814 + auVar264._12_4_;
                      auStack_230 = vshufps_avx(auVar222,auVar222,0);
                      local_240[0] = (RTCHitN)auStack_230[0];
                      local_240[1] = (RTCHitN)auStack_230[1];
                      local_240[2] = (RTCHitN)auStack_230[2];
                      local_240[3] = (RTCHitN)auStack_230[3];
                      local_240[4] = (RTCHitN)auStack_230[4];
                      local_240[5] = (RTCHitN)auStack_230[5];
                      local_240[6] = (RTCHitN)auStack_230[6];
                      local_240[7] = (RTCHitN)auStack_230[7];
                      local_240[8] = (RTCHitN)auStack_230[8];
                      local_240[9] = (RTCHitN)auStack_230[9];
                      local_240[10] = (RTCHitN)auStack_230[10];
                      local_240[0xb] = (RTCHitN)auStack_230[0xb];
                      local_240[0xc] = (RTCHitN)auStack_230[0xc];
                      local_240[0xd] = (RTCHitN)auStack_230[0xd];
                      local_240[0xe] = (RTCHitN)auStack_230[0xe];
                      local_240[0xf] = (RTCHitN)auStack_230[0xf];
                      auStack_210 = vshufps_avx(auVar222,auVar222,0x55);
                      local_220 = auStack_210;
                      auStack_1f0 = vshufps_avx(auVar222,auVar222,0xaa);
                      local_200 = auStack_1f0;
                      fStack_1dc = local_1e0;
                      fStack_1d8 = local_1e0;
                      fStack_1d4 = local_1e0;
                      fStack_1d0 = local_1e0;
                      fStack_1cc = local_1e0;
                      fStack_1c8 = local_1e0;
                      fStack_1c4 = local_1e0;
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_1a0 = local_120._0_8_;
                      uStack_198 = local_120._8_8_;
                      uStack_190 = local_120._16_8_;
                      uStack_188 = local_120._24_8_;
                      local_180 = local_100._0_8_;
                      uStack_178 = local_100._8_8_;
                      uStack_170 = local_100._16_8_;
                      uStack_168 = local_100._24_8_;
                      auVar154 = vcmpps_avx(auVar331._0_32_,auVar331._0_32_,0xf);
                      local_7a8[1] = auVar154;
                      *local_7a8 = auVar154;
                      local_160 = (local_8b0.context)->instID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_140 = (local_8b0.context)->instPrimID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_7e0 = local_860;
                      uStack_7d8 = uStack_858;
                      uStack_7d0 = auStack_850;
                      uStack_7c8 = uStack_848;
                      local_8b0.valid = (int *)&local_7e0;
                      local_8b0.geometryUserPtr = pGVar144->userPtr;
                      local_8b0.hit = local_240;
                      local_8b0.N = 8;
                      local_8b0.ray = (RTCRayN *)ray;
                      if (pGVar144->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        local_880._0_4_ = uVar338;
                        auVar270 = ZEXT1664(auVar264);
                        (*pGVar144->intersectionFilterN)(&local_8b0);
                        auVar365 = ZEXT3264(local_660);
                        auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar144 = (Geometry *)local_800._0_8_;
                        uVar338 = local_880._0_4_;
                        fVar234 = (float)local_680._0_4_;
                        fVar251 = (float)local_680._4_4_;
                        fVar259 = fStack_678;
                        fVar261 = fStack_674;
                        fVar271 = fStack_670;
                        fVar272 = fStack_66c;
                        fVar273 = fStack_668;
                        fVar275 = fStack_664;
                        fVar276 = (float)local_720._0_4_;
                        fVar277 = (float)local_720._4_4_;
                        fVar278 = fStack_718;
                        fVar290 = fStack_714;
                        fVar292 = fStack_710;
                        fVar294 = fStack_70c;
                        fVar296 = fStack_708;
                      }
                      auVar122._8_8_ = uStack_7d8;
                      auVar122._0_8_ = local_7e0;
                      auVar237 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar122);
                      auVar126._8_8_ = uStack_7c8;
                      auVar126._0_8_ = uStack_7d0;
                      auVar211 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar126);
                      auVar164._16_16_ = auVar211;
                      auVar164._0_16_ = auVar237;
                      auVar340 = auVar154 & ~auVar164;
                      if ((((((((auVar340 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar340 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar340 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar340 >> 0x7f,0) == '\0') &&
                            (auVar340 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar340 >> 0xbf,0) == '\0') &&
                          (auVar340 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar340[0x1f]) {
                        auVar165._0_4_ = auVar237._0_4_ ^ auVar154._0_4_;
                        auVar165._4_4_ = auVar237._4_4_ ^ auVar154._4_4_;
                        auVar165._8_4_ = auVar237._8_4_ ^ auVar154._8_4_;
                        auVar165._12_4_ = auVar237._12_4_ ^ auVar154._12_4_;
                        auVar165._16_4_ = auVar211._0_4_ ^ auVar154._16_4_;
                        auVar165._20_4_ = auVar211._4_4_ ^ auVar154._20_4_;
                        auVar165._24_4_ = auVar211._8_4_ ^ auVar154._24_4_;
                        auVar165._28_4_ = auVar211._12_4_ ^ auVar154._28_4_;
                        auVar246 = ZEXT3264(local_580);
                      }
                      else {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar144->field_8).field_0x2 & 0x40) != 0)))) {
                          local_880._0_4_ = uVar338;
                          auVar270 = ZEXT1664(auVar270._0_16_);
                          (*p_Var18)(&local_8b0);
                          auVar365 = ZEXT3264(local_660);
                          auVar331 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar144 = (Geometry *)local_800._0_8_;
                          uVar338 = local_880._0_4_;
                          fVar234 = (float)local_680._0_4_;
                          fVar251 = (float)local_680._4_4_;
                          fVar259 = fStack_678;
                          fVar261 = fStack_674;
                          fVar271 = fStack_670;
                          fVar272 = fStack_66c;
                          fVar273 = fStack_668;
                          fVar275 = fStack_664;
                          fVar276 = (float)local_720._0_4_;
                          fVar277 = (float)local_720._4_4_;
                          fVar278 = fStack_718;
                          fVar290 = fStack_714;
                          fVar292 = fStack_710;
                          fVar294 = fStack_70c;
                          fVar296 = fStack_708;
                        }
                        auVar123._8_8_ = uStack_7d8;
                        auVar123._0_8_ = local_7e0;
                        auVar237 = vpcmpeqd_avx((undefined1  [16])0x0,auVar123);
                        auVar127._8_8_ = uStack_7c8;
                        auVar127._0_8_ = uStack_7d0;
                        auVar211 = vpcmpeqd_avx((undefined1  [16])0x0,auVar127);
                        auVar203._16_16_ = auVar211;
                        auVar203._0_16_ = auVar237;
                        auVar165._0_4_ = auVar237._0_4_ ^ auVar154._0_4_;
                        auVar165._4_4_ = auVar237._4_4_ ^ auVar154._4_4_;
                        auVar165._8_4_ = auVar237._8_4_ ^ auVar154._8_4_;
                        auVar165._12_4_ = auVar237._12_4_ ^ auVar154._12_4_;
                        auVar165._16_4_ = auVar211._0_4_ ^ auVar154._16_4_;
                        auVar165._20_4_ = auVar211._4_4_ ^ auVar154._20_4_;
                        auVar165._24_4_ = auVar211._8_4_ ^ auVar154._24_4_;
                        auVar165._28_4_ = auVar211._12_4_ ^ auVar154._28_4_;
                        auVar154 = auVar154 & ~auVar203;
                        auVar246 = ZEXT3264(local_580);
                        if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar154 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar154 >> 0x7f,0) != '\0')
                              || (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar154 >> 0xbf,0) != '\0') ||
                            (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar154[0x1f] < '\0') {
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])local_8b0.hit);
                          *(undefined1 (*) [32])(local_8b0.ray + 0x180) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x20));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x1a0) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x40));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x1c0) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x60));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x1e0) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x80));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x200) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x220) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x240) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x260) = auVar154;
                          auVar154 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x100));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x280) = auVar154;
                        }
                      }
                      if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar165 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar165 >> 0x7f,0) == '\0') &&
                            (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar165 >> 0xbf,0) == '\0') &&
                          (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar165[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar338;
                      }
                      *(undefined4 *)(local_5e0 + (ulong)local_920 * 4) = 0;
                      uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar166._4_4_ = uVar338;
                      auVar166._0_4_ = uVar338;
                      auVar166._8_4_ = uVar338;
                      auVar166._12_4_ = uVar338;
                      auVar166._16_4_ = uVar338;
                      auVar166._20_4_ = uVar338;
                      auVar166._24_4_ = uVar338;
                      auVar166._28_4_ = uVar338;
                      auVar340 = vcmpps_avx(auVar246._0_32_,auVar166,2);
                      auVar154 = vandps_avx(auVar340,local_5e0);
                      auVar170 = ZEXT3264(auVar154);
                      local_5e0 = local_5e0 & auVar340;
                      bVar118 = (local_5e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar119 = (local_5e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar117 = (local_5e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar116 = SUB321(local_5e0 >> 0x7f,0) != '\0';
                      bVar115 = (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar114 = SUB321(local_5e0 >> 0xbf,0) != '\0';
                      bVar113 = (local_5e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar112 = local_5e0[0x1f] < '\0';
                      if (((((((bVar118 || bVar119) || bVar117) || bVar116) || bVar115) || bVar114)
                          || bVar113) || bVar112) {
                        auVar204._8_4_ = 0x7f800000;
                        auVar204._0_8_ = 0x7f8000007f800000;
                        auVar204._12_4_ = 0x7f800000;
                        auVar204._16_4_ = 0x7f800000;
                        auVar204._20_4_ = 0x7f800000;
                        auVar204._24_4_ = 0x7f800000;
                        auVar204._28_4_ = 0x7f800000;
                        auVar340 = vblendvps_avx(auVar204,auVar246._0_32_,auVar154);
                        auVar20 = vshufps_avx(auVar340,auVar340,0xb1);
                        auVar20 = vminps_avx(auVar340,auVar20);
                        auVar21 = vshufpd_avx(auVar20,auVar20,5);
                        auVar20 = vminps_avx(auVar20,auVar21);
                        auVar21 = vperm2f128_avx(auVar20,auVar20,1);
                        auVar246 = ZEXT3264(auVar21);
                        auVar20 = vminps_avx(auVar20,auVar21);
                        auVar340 = vcmpps_avx(auVar340,auVar20,0);
                        auVar20 = auVar154 & auVar340;
                        if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar20 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar20 >> 0x7f,0) != '\0') ||
                              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar20 >> 0xbf,0) != '\0') ||
                            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar20[0x1f] < '\0') {
                          auVar340 = vandps_avx(auVar340,auVar154);
                          auVar170 = ZEXT3264(auVar340);
                        }
                        uVar143 = vmovmskps_avx(auVar170._0_32_);
                        local_920 = 0;
                        if (uVar143 != 0) {
                          for (; (uVar143 >> local_920 & 1) == 0; local_920 = local_920 + 1) {
                          }
                        }
                        pGVar144 = (Geometry *)local_800._0_8_;
                      }
                      local_5e0 = auVar154;
                    } while (((((((bVar118 || bVar119) || bVar117) || bVar116) || bVar115) ||
                              bVar114) || bVar113) || bVar112);
                  }
                }
              }
            }
          }
          lVar148 = lVar148 + 8;
          auVar331 = ZEXT3264(local_6a0);
          auVar345 = ZEXT3264(local_6c0);
        } while ((int)lVar148 < (int)uVar16);
      }
      uVar338 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar160._4_4_ = uVar338;
      auVar160._0_4_ = uVar338;
      auVar160._8_4_ = uVar338;
      auVar160._12_4_ = uVar338;
      auVar160._16_4_ = uVar338;
      auVar160._20_4_ = uVar338;
      auVar160._24_4_ = uVar338;
      auVar160._28_4_ = uVar338;
      auVar154 = vcmpps_avx(local_80,auVar160,2);
      uVar141 = vmovmskps_avx(auVar154);
      uVar141 = (uint)uVar149 & uVar141;
    } while (uVar141 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }